

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersector1<8>::
     intersect_n<embree::avx::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  long lVar23;
  RTCFilterFunctionN p_Var24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  uint uVar84;
  uint uVar85;
  ulong uVar86;
  ulong uVar87;
  byte bVar88;
  uint uVar89;
  long lVar90;
  long lVar91;
  long lVar92;
  undefined1 auVar93 [8];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar132;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar167;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar139 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar140 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  vfloat4 a0_1;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  float fVar201;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float t1;
  float fVar202;
  float fVar203;
  float fVar225;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar226;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar223;
  float fVar224;
  float fVar227;
  float fVar228;
  float fVar229;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [64];
  float fVar230;
  float fVar252;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar251;
  float fVar253;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar249;
  float fVar250;
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  float fVar257;
  float fVar269;
  float fVar270;
  vfloat4 b0;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  float fVar272;
  float fVar273;
  float fVar274;
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  float fVar271;
  undefined1 auVar268 [64];
  float fVar275;
  undefined1 auVar276 [16];
  float fVar288;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar286;
  float fVar287;
  undefined1 auVar283 [32];
  undefined1 auVar289 [16];
  undefined1 auVar285 [64];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  float fVar321;
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  float fVar320;
  undefined1 auVar319 [32];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [64];
  __m128 a;
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar336 [16];
  undefined1 auVar344 [32];
  undefined1 auVar345 [64];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [64];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  float fVar372;
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  float fVar370;
  float fVar371;
  float fVar373;
  float fVar374;
  float fVar375;
  float in_register_0000151c;
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  float fVar376;
  undefined1 auVar369 [64];
  undefined1 auVar377 [16];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  float fVar381;
  undefined1 auVar380 [64];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  float in_register_0000159c;
  undefined1 auVar388 [32];
  float fVar396;
  vfloat4 a0;
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  float in_register_000015dc;
  undefined1 auVar395 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p02;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  int local_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 auStack_438 [16];
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  ulong local_418;
  ulong local_410;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  float fStack_3a0;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  float fStack_380;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 auStack_2f8 [16];
  undefined1 local_2e8 [16];
  RTCFilterFunctionNArguments local_2d8;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  uint auStack_298 [4];
  undefined8 local_288;
  float local_280;
  undefined8 local_27c;
  uint local_274;
  uint local_270;
  uint local_26c;
  uint local_268;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  float afStack_198 [8];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar284 [32];
  undefined1 auVar389 [32];
  
  PVar18 = prim[1];
  uVar86 = (ulong)(byte)PVar18;
  lVar90 = uVar86 * 0x25;
  fVar202 = *(float *)(prim + lVar90 + 0x12);
  auVar110 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar90 + 6));
  auVar258._0_4_ = fVar202 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar258._4_4_ = fVar202 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar258._8_4_ = fVar202 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar258._12_4_ = fVar202 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 4 + 6)));
  auVar133._0_4_ = fVar202 * auVar110._0_4_;
  auVar133._4_4_ = fVar202 * auVar110._4_4_;
  auVar133._8_4_ = fVar202 * auVar110._8_4_;
  auVar133._12_4_ = fVar202 * auVar110._12_4_;
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 4 + 10)));
  auVar122._16_16_ = auVar110;
  auVar122._0_16_ = auVar174;
  auVar122 = vcvtdq2ps_avx(auVar122);
  lVar1 = uVar86 * 5;
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar1 + 6)));
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar1 + 10)));
  auVar196._16_16_ = auVar110;
  auVar196._0_16_ = auVar174;
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 6 + 6)));
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 6 + 10)));
  auVar25 = vcvtdq2ps_avx(auVar196);
  auVar217._16_16_ = auVar110;
  auVar217._0_16_ = auVar174;
  auVar26 = vcvtdq2ps_avx(auVar217);
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0xf + 6)));
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0xf + 10)));
  auVar218._16_16_ = auVar110;
  auVar218._0_16_ = auVar174;
  auVar27 = vcvtdq2ps_avx(auVar218);
  lVar91 = (ulong)(byte)PVar18 * 0x10;
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar91 + 6)));
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar91 + 10)));
  auVar283._16_16_ = auVar110;
  auVar283._0_16_ = auVar174;
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar91 + uVar86 + 6)));
  auVar28 = vcvtdq2ps_avx(auVar283);
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar91 + uVar86 + 10)));
  auVar299._16_16_ = auVar110;
  auVar299._0_16_ = auVar174;
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1a + 6)));
  auVar29 = vcvtdq2ps_avx(auVar299);
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1a + 10)));
  auVar300._16_16_ = auVar110;
  auVar300._0_16_ = auVar174;
  auVar30 = vcvtdq2ps_avx(auVar300);
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1b + 6)));
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1b + 10)));
  auVar325._16_16_ = auVar110;
  auVar325._0_16_ = auVar174;
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1c + 6)));
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1c + 10)));
  auVar31 = vcvtdq2ps_avx(auVar325);
  auVar340._16_16_ = auVar110;
  auVar340._0_16_ = auVar174;
  auVar32 = vcvtdq2ps_avx(auVar340);
  auVar174 = vshufps_avx(auVar258,auVar258,0);
  auVar110 = vshufps_avx(auVar258,auVar258,0x55);
  auVar33 = vshufps_avx(auVar258,auVar258,0xaa);
  fVar202 = auVar33._0_4_;
  fVar230 = auVar33._4_4_;
  fVar167 = auVar33._8_4_;
  fVar223 = auVar33._12_4_;
  fVar201 = auVar110._0_4_;
  fVar203 = auVar110._4_4_;
  fVar224 = auVar110._8_4_;
  fVar250 = auVar110._12_4_;
  fVar226 = auVar174._0_4_;
  fVar225 = auVar174._4_4_;
  fVar252 = auVar174._8_4_;
  fVar132 = auVar174._12_4_;
  auVar365._0_4_ = fVar226 * auVar122._0_4_ + fVar201 * auVar25._0_4_ + fVar202 * auVar26._0_4_;
  auVar365._4_4_ = fVar225 * auVar122._4_4_ + fVar203 * auVar25._4_4_ + fVar230 * auVar26._4_4_;
  auVar365._8_4_ = fVar252 * auVar122._8_4_ + fVar224 * auVar25._8_4_ + fVar167 * auVar26._8_4_;
  auVar365._12_4_ = fVar132 * auVar122._12_4_ + fVar250 * auVar25._12_4_ + fVar223 * auVar26._12_4_;
  auVar365._16_4_ = fVar226 * auVar122._16_4_ + fVar201 * auVar25._16_4_ + fVar202 * auVar26._16_4_;
  auVar365._20_4_ = fVar225 * auVar122._20_4_ + fVar203 * auVar25._20_4_ + fVar230 * auVar26._20_4_;
  auVar365._24_4_ = fVar252 * auVar122._24_4_ + fVar224 * auVar25._24_4_ + fVar167 * auVar26._24_4_;
  auVar365._28_4_ = fVar250 + in_register_000015dc + in_register_0000151c;
  auVar351._0_4_ = fVar226 * auVar27._0_4_ + fVar201 * auVar28._0_4_ + auVar29._0_4_ * fVar202;
  auVar351._4_4_ = fVar225 * auVar27._4_4_ + fVar203 * auVar28._4_4_ + auVar29._4_4_ * fVar230;
  auVar351._8_4_ = fVar252 * auVar27._8_4_ + fVar224 * auVar28._8_4_ + auVar29._8_4_ * fVar167;
  auVar351._12_4_ = fVar132 * auVar27._12_4_ + fVar250 * auVar28._12_4_ + auVar29._12_4_ * fVar223;
  auVar351._16_4_ = fVar226 * auVar27._16_4_ + fVar201 * auVar28._16_4_ + auVar29._16_4_ * fVar202;
  auVar351._20_4_ = fVar225 * auVar27._20_4_ + fVar203 * auVar28._20_4_ + auVar29._20_4_ * fVar230;
  auVar351._24_4_ = fVar252 * auVar27._24_4_ + fVar224 * auVar28._24_4_ + auVar29._24_4_ * fVar167;
  auVar351._28_4_ = fVar250 + in_register_000015dc + in_register_0000159c;
  auVar265._0_4_ = fVar226 * auVar30._0_4_ + fVar201 * auVar31._0_4_ + auVar32._0_4_ * fVar202;
  auVar265._4_4_ = fVar225 * auVar30._4_4_ + fVar203 * auVar31._4_4_ + auVar32._4_4_ * fVar230;
  auVar265._8_4_ = fVar252 * auVar30._8_4_ + fVar224 * auVar31._8_4_ + auVar32._8_4_ * fVar167;
  auVar265._12_4_ = fVar132 * auVar30._12_4_ + fVar250 * auVar31._12_4_ + auVar32._12_4_ * fVar223;
  auVar265._16_4_ = fVar226 * auVar30._16_4_ + fVar201 * auVar31._16_4_ + auVar32._16_4_ * fVar202;
  auVar265._20_4_ = fVar225 * auVar30._20_4_ + fVar203 * auVar31._20_4_ + auVar32._20_4_ * fVar230;
  auVar265._24_4_ = fVar252 * auVar30._24_4_ + fVar224 * auVar31._24_4_ + auVar32._24_4_ * fVar167;
  auVar265._28_4_ = fVar132 + fVar250 + fVar223;
  auVar174 = vshufps_avx(auVar133,auVar133,0);
  auVar110 = vshufps_avx(auVar133,auVar133,0x55);
  auVar33 = vshufps_avx(auVar133,auVar133,0xaa);
  fVar202 = auVar33._0_4_;
  fVar230 = auVar33._4_4_;
  fVar167 = auVar33._8_4_;
  fVar223 = auVar33._12_4_;
  fVar225 = auVar110._0_4_;
  fVar252 = auVar110._4_4_;
  fVar132 = auVar110._8_4_;
  fVar227 = auVar110._12_4_;
  fVar201 = auVar25._28_4_ + auVar26._28_4_;
  fVar203 = auVar174._0_4_;
  fVar224 = auVar174._4_4_;
  fVar250 = auVar174._8_4_;
  fVar226 = auVar174._12_4_;
  auVar160._0_4_ = fVar203 * auVar122._0_4_ + fVar225 * auVar25._0_4_ + fVar202 * auVar26._0_4_;
  auVar160._4_4_ = fVar224 * auVar122._4_4_ + fVar252 * auVar25._4_4_ + fVar230 * auVar26._4_4_;
  auVar160._8_4_ = fVar250 * auVar122._8_4_ + fVar132 * auVar25._8_4_ + fVar167 * auVar26._8_4_;
  auVar160._12_4_ = fVar226 * auVar122._12_4_ + fVar227 * auVar25._12_4_ + fVar223 * auVar26._12_4_;
  auVar160._16_4_ = fVar203 * auVar122._16_4_ + fVar225 * auVar25._16_4_ + fVar202 * auVar26._16_4_;
  auVar160._20_4_ = fVar224 * auVar122._20_4_ + fVar252 * auVar25._20_4_ + fVar230 * auVar26._20_4_;
  auVar160._24_4_ = fVar250 * auVar122._24_4_ + fVar132 * auVar25._24_4_ + fVar167 * auVar26._24_4_;
  auVar160._28_4_ = auVar122._28_4_ + fVar201;
  auVar123._0_4_ = fVar203 * auVar27._0_4_ + auVar29._0_4_ * fVar202 + fVar225 * auVar28._0_4_;
  auVar123._4_4_ = fVar224 * auVar27._4_4_ + auVar29._4_4_ * fVar230 + fVar252 * auVar28._4_4_;
  auVar123._8_4_ = fVar250 * auVar27._8_4_ + auVar29._8_4_ * fVar167 + fVar132 * auVar28._8_4_;
  auVar123._12_4_ = fVar226 * auVar27._12_4_ + auVar29._12_4_ * fVar223 + fVar227 * auVar28._12_4_;
  auVar123._16_4_ = fVar203 * auVar27._16_4_ + auVar29._16_4_ * fVar202 + fVar225 * auVar28._16_4_;
  auVar123._20_4_ = fVar224 * auVar27._20_4_ + auVar29._20_4_ * fVar230 + fVar252 * auVar28._20_4_;
  auVar123._24_4_ = fVar250 * auVar27._24_4_ + auVar29._24_4_ * fVar167 + fVar132 * auVar28._24_4_;
  auVar123._28_4_ = auVar122._28_4_ + auVar29._28_4_ + auVar26._28_4_;
  auVar219._8_4_ = 0x7fffffff;
  auVar219._0_8_ = 0x7fffffff7fffffff;
  auVar219._12_4_ = 0x7fffffff;
  auVar219._16_4_ = 0x7fffffff;
  auVar219._20_4_ = 0x7fffffff;
  auVar219._24_4_ = 0x7fffffff;
  auVar219._28_4_ = 0x7fffffff;
  auVar246._8_4_ = 0x219392ef;
  auVar246._0_8_ = 0x219392ef219392ef;
  auVar246._12_4_ = 0x219392ef;
  auVar246._16_4_ = 0x219392ef;
  auVar246._20_4_ = 0x219392ef;
  auVar246._24_4_ = 0x219392ef;
  auVar246._28_4_ = 0x219392ef;
  auVar122 = vandps_avx(auVar365,auVar219);
  auVar122 = vcmpps_avx(auVar122,auVar246,1);
  auVar25 = vblendvps_avx(auVar365,auVar246,auVar122);
  auVar122 = vandps_avx(auVar351,auVar219);
  auVar122 = vcmpps_avx(auVar122,auVar246,1);
  auVar26 = vblendvps_avx(auVar351,auVar246,auVar122);
  auVar122 = vandps_avx(auVar265,auVar219);
  auVar122 = vcmpps_avx(auVar122,auVar246,1);
  auVar122 = vblendvps_avx(auVar265,auVar246,auVar122);
  auVar197._0_4_ = fVar203 * auVar30._0_4_ + fVar225 * auVar31._0_4_ + auVar32._0_4_ * fVar202;
  auVar197._4_4_ = fVar224 * auVar30._4_4_ + fVar252 * auVar31._4_4_ + auVar32._4_4_ * fVar230;
  auVar197._8_4_ = fVar250 * auVar30._8_4_ + fVar132 * auVar31._8_4_ + auVar32._8_4_ * fVar167;
  auVar197._12_4_ = fVar226 * auVar30._12_4_ + fVar227 * auVar31._12_4_ + auVar32._12_4_ * fVar223;
  auVar197._16_4_ = fVar203 * auVar30._16_4_ + fVar225 * auVar31._16_4_ + auVar32._16_4_ * fVar202;
  auVar197._20_4_ = fVar224 * auVar30._20_4_ + fVar252 * auVar31._20_4_ + auVar32._20_4_ * fVar230;
  auVar197._24_4_ = fVar250 * auVar30._24_4_ + fVar132 * auVar31._24_4_ + auVar32._24_4_ * fVar167;
  auVar197._28_4_ = fVar201 + auVar28._28_4_ + fVar223;
  auVar27 = vrcpps_avx(auVar25);
  fVar202 = auVar27._0_4_;
  fVar223 = auVar27._4_4_;
  auVar28._4_4_ = auVar25._4_4_ * fVar223;
  auVar28._0_4_ = auVar25._0_4_ * fVar202;
  fVar224 = auVar27._8_4_;
  auVar28._8_4_ = auVar25._8_4_ * fVar224;
  fVar225 = auVar27._12_4_;
  auVar28._12_4_ = auVar25._12_4_ * fVar225;
  fVar227 = auVar27._16_4_;
  auVar28._16_4_ = auVar25._16_4_ * fVar227;
  fVar228 = auVar27._20_4_;
  auVar28._20_4_ = auVar25._20_4_ * fVar228;
  fVar229 = auVar27._24_4_;
  auVar28._24_4_ = auVar25._24_4_ * fVar229;
  auVar28._28_4_ = 0x219392ef;
  auVar301._8_4_ = 0x3f800000;
  auVar301._0_8_ = 0x3f8000003f800000;
  auVar301._12_4_ = 0x3f800000;
  auVar301._16_4_ = 0x3f800000;
  auVar301._20_4_ = 0x3f800000;
  auVar301._24_4_ = 0x3f800000;
  auVar301._28_4_ = 0x3f800000;
  auVar29 = vsubps_avx(auVar301,auVar28);
  auVar28 = vrcpps_avx(auVar26);
  fVar202 = fVar202 + fVar202 * auVar29._0_4_;
  fVar223 = fVar223 + fVar223 * auVar29._4_4_;
  fVar224 = fVar224 + fVar224 * auVar29._8_4_;
  fVar225 = fVar225 + fVar225 * auVar29._12_4_;
  fVar227 = fVar227 + fVar227 * auVar29._16_4_;
  fVar228 = fVar228 + fVar228 * auVar29._20_4_;
  fVar229 = fVar229 + fVar229 * auVar29._24_4_;
  fVar230 = auVar28._0_4_;
  fVar201 = auVar28._4_4_;
  auVar25._4_4_ = auVar26._4_4_ * fVar201;
  auVar25._0_4_ = auVar26._0_4_ * fVar230;
  fVar250 = auVar28._8_4_;
  auVar25._8_4_ = auVar26._8_4_ * fVar250;
  fVar252 = auVar28._12_4_;
  auVar25._12_4_ = auVar26._12_4_ * fVar252;
  fVar254 = auVar28._16_4_;
  auVar25._16_4_ = auVar26._16_4_ * fVar254;
  fVar255 = auVar28._20_4_;
  auVar25._20_4_ = auVar26._20_4_ * fVar255;
  fVar256 = auVar28._24_4_;
  auVar25._24_4_ = auVar26._24_4_ * fVar256;
  auVar25._28_4_ = auVar29._28_4_;
  auVar26 = vsubps_avx(auVar301,auVar25);
  fVar230 = fVar230 + fVar230 * auVar26._0_4_;
  fVar201 = fVar201 + fVar201 * auVar26._4_4_;
  fVar250 = fVar250 + fVar250 * auVar26._8_4_;
  fVar252 = fVar252 + fVar252 * auVar26._12_4_;
  fVar254 = fVar254 + fVar254 * auVar26._16_4_;
  fVar255 = fVar255 + fVar255 * auVar26._20_4_;
  fVar256 = fVar256 + fVar256 * auVar26._24_4_;
  auVar25 = vrcpps_avx(auVar122);
  fVar257 = auVar25._0_4_;
  fVar269 = auVar25._4_4_;
  auVar30._4_4_ = fVar269 * auVar122._4_4_;
  auVar30._0_4_ = fVar257 * auVar122._0_4_;
  fVar270 = auVar25._8_4_;
  auVar30._8_4_ = fVar270 * auVar122._8_4_;
  fVar271 = auVar25._12_4_;
  auVar30._12_4_ = fVar271 * auVar122._12_4_;
  fVar272 = auVar25._16_4_;
  auVar30._16_4_ = fVar272 * auVar122._16_4_;
  fVar273 = auVar25._20_4_;
  auVar30._20_4_ = fVar273 * auVar122._20_4_;
  fVar274 = auVar25._24_4_;
  auVar30._24_4_ = fVar274 * auVar122._24_4_;
  auVar30._28_4_ = auVar122._28_4_;
  auVar122 = vsubps_avx(auVar301,auVar30);
  fVar257 = fVar257 + fVar257 * auVar122._0_4_;
  fVar269 = fVar269 + fVar269 * auVar122._4_4_;
  fVar270 = fVar270 + fVar270 * auVar122._8_4_;
  fVar271 = fVar271 + fVar271 * auVar122._12_4_;
  fVar272 = fVar272 + fVar272 * auVar122._16_4_;
  fVar273 = fVar273 + fVar273 * auVar122._20_4_;
  fVar274 = fVar274 + fVar274 * auVar122._24_4_;
  auVar174 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar90 + 0x16)) * *(float *)(prim + lVar90 + 0x1a)));
  auVar34 = vshufps_avx(auVar174,auVar174,0);
  auVar174._8_8_ = 0;
  auVar174._0_8_ = *(ulong *)(prim + uVar86 * 7 + 6);
  auVar174 = vpmovsxwd_avx(auVar174);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + uVar86 * 7 + 0xe);
  auVar110 = vpmovsxwd_avx(auVar110);
  auVar302._16_16_ = auVar110;
  auVar302._0_16_ = auVar174;
  auVar122 = vcvtdq2ps_avx(auVar302);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar86 * 0xb + 6);
  auVar174 = vpmovsxwd_avx(auVar33);
  auVar154._8_8_ = 0;
  auVar154._0_8_ = *(ulong *)(prim + uVar86 * 0xb + 0xe);
  auVar110 = vpmovsxwd_avx(auVar154);
  auVar315._16_16_ = auVar110;
  auVar315._0_16_ = auVar174;
  auVar25 = vcvtdq2ps_avx(auVar315);
  auVar25 = vsubps_avx(auVar25,auVar122);
  fVar167 = auVar34._0_4_;
  fVar203 = auVar34._4_4_;
  fVar226 = auVar34._8_4_;
  fVar132 = auVar34._12_4_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar86 * 9 + 6);
  auVar174 = vpmovsxwd_avx(auVar34);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *(ulong *)(prim + uVar86 * 9 + 0xe);
  auVar110 = vpmovsxwd_avx(auVar119);
  auVar303._0_4_ = auVar25._0_4_ * fVar167 + auVar122._0_4_;
  auVar303._4_4_ = auVar25._4_4_ * fVar203 + auVar122._4_4_;
  auVar303._8_4_ = auVar25._8_4_ * fVar226 + auVar122._8_4_;
  auVar303._12_4_ = auVar25._12_4_ * fVar132 + auVar122._12_4_;
  auVar303._16_4_ = auVar25._16_4_ * fVar167 + auVar122._16_4_;
  auVar303._20_4_ = auVar25._20_4_ * fVar203 + auVar122._20_4_;
  auVar303._24_4_ = auVar25._24_4_ * fVar226 + auVar122._24_4_;
  auVar303._28_4_ = auVar25._28_4_ + auVar122._28_4_;
  auVar316._16_16_ = auVar110;
  auVar316._0_16_ = auVar174;
  auVar122 = vcvtdq2ps_avx(auVar316);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + uVar86 * 0xd + 6);
  auVar174 = vpmovsxwd_avx(auVar142);
  auVar181._8_8_ = 0;
  auVar181._0_8_ = *(ulong *)(prim + uVar86 * 0xd + 0xe);
  auVar110 = vpmovsxwd_avx(auVar181);
  auVar326._16_16_ = auVar110;
  auVar326._0_16_ = auVar174;
  auVar25 = vcvtdq2ps_avx(auVar326);
  auVar25 = vsubps_avx(auVar25,auVar122);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = *(ulong *)(prim + uVar86 * 0x12 + 6);
  auVar174 = vpmovsxwd_avx(auVar143);
  auVar289._8_8_ = 0;
  auVar289._0_8_ = *(ulong *)(prim + uVar86 * 0x12 + 0xe);
  auVar110 = vpmovsxwd_avx(auVar289);
  auVar317._0_4_ = auVar122._0_4_ + auVar25._0_4_ * fVar167;
  auVar317._4_4_ = auVar122._4_4_ + auVar25._4_4_ * fVar203;
  auVar317._8_4_ = auVar122._8_4_ + auVar25._8_4_ * fVar226;
  auVar317._12_4_ = auVar122._12_4_ + auVar25._12_4_ * fVar132;
  auVar317._16_4_ = auVar122._16_4_ + auVar25._16_4_ * fVar167;
  auVar317._20_4_ = auVar122._20_4_ + auVar25._20_4_ * fVar203;
  auVar317._24_4_ = auVar122._24_4_ + auVar25._24_4_ * fVar226;
  auVar317._28_4_ = auVar122._28_4_ + auVar25._28_4_;
  auVar327._16_16_ = auVar110;
  auVar327._0_16_ = auVar174;
  auVar122 = vcvtdq2ps_avx(auVar327);
  uVar87 = (ulong)(uint)((int)lVar1 << 2);
  lVar90 = uVar86 * 2 + uVar87;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + lVar90 + 6);
  auVar174 = vpmovsxwd_avx(auVar6);
  auVar362._8_8_ = 0;
  auVar362._0_8_ = *(ulong *)(prim + lVar90 + 0xe);
  auVar110 = vpmovsxwd_avx(auVar362);
  auVar341._16_16_ = auVar110;
  auVar341._0_16_ = auVar174;
  auVar25 = vcvtdq2ps_avx(auVar341);
  auVar25 = vsubps_avx(auVar25,auVar122);
  auVar392._8_8_ = 0;
  auVar392._0_8_ = *(ulong *)(prim + uVar87 + 6);
  auVar174 = vpmovsxwd_avx(auVar392);
  auVar328._0_4_ = auVar122._0_4_ + auVar25._0_4_ * fVar167;
  auVar328._4_4_ = auVar122._4_4_ + auVar25._4_4_ * fVar203;
  auVar328._8_4_ = auVar122._8_4_ + auVar25._8_4_ * fVar226;
  auVar328._12_4_ = auVar122._12_4_ + auVar25._12_4_ * fVar132;
  auVar328._16_4_ = auVar122._16_4_ + auVar25._16_4_ * fVar167;
  auVar328._20_4_ = auVar122._20_4_ + auVar25._20_4_ * fVar203;
  auVar328._24_4_ = auVar122._24_4_ + auVar25._24_4_ * fVar226;
  auVar328._28_4_ = auVar122._28_4_ + auVar25._28_4_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar87 + 0xe);
  auVar110 = vpmovsxwd_avx(auVar7);
  auVar342._16_16_ = auVar110;
  auVar342._0_16_ = auVar174;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar86 * 0x18 + 6);
  auVar174 = vpmovsxwd_avx(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar86 * 0x18 + 0xe);
  auVar110 = vpmovsxwd_avx(auVar9);
  auVar122 = vcvtdq2ps_avx(auVar342);
  auVar352._16_16_ = auVar110;
  auVar352._0_16_ = auVar174;
  auVar25 = vcvtdq2ps_avx(auVar352);
  auVar25 = vsubps_avx(auVar25,auVar122);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar86 * 0x1d + 6);
  auVar174 = vpmovsxwd_avx(auVar10);
  auVar343._0_4_ = auVar122._0_4_ + auVar25._0_4_ * fVar167;
  auVar343._4_4_ = auVar122._4_4_ + auVar25._4_4_ * fVar203;
  auVar343._8_4_ = auVar122._8_4_ + auVar25._8_4_ * fVar226;
  auVar343._12_4_ = auVar122._12_4_ + auVar25._12_4_ * fVar132;
  auVar343._16_4_ = auVar122._16_4_ + auVar25._16_4_ * fVar167;
  auVar343._20_4_ = auVar122._20_4_ + auVar25._20_4_ * fVar203;
  auVar343._24_4_ = auVar122._24_4_ + auVar25._24_4_ * fVar226;
  auVar343._28_4_ = auVar122._28_4_ + auVar25._28_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar86 * 0x1d + 0xe);
  auVar110 = vpmovsxwd_avx(auVar11);
  auVar353._16_16_ = auVar110;
  auVar353._0_16_ = auVar174;
  auVar122 = vcvtdq2ps_avx(auVar353);
  lVar90 = uVar86 + (ulong)(byte)PVar18 * 0x20;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar90 + 6);
  auVar174 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + lVar90 + 0xe);
  auVar110 = vpmovsxwd_avx(auVar13);
  auVar366._16_16_ = auVar110;
  auVar366._0_16_ = auVar174;
  auVar25 = vcvtdq2ps_avx(auVar366);
  auVar25 = vsubps_avx(auVar25,auVar122);
  auVar354._0_4_ = auVar122._0_4_ + auVar25._0_4_ * fVar167;
  auVar354._4_4_ = auVar122._4_4_ + auVar25._4_4_ * fVar203;
  auVar354._8_4_ = auVar122._8_4_ + auVar25._8_4_ * fVar226;
  auVar354._12_4_ = auVar122._12_4_ + auVar25._12_4_ * fVar132;
  auVar354._16_4_ = auVar122._16_4_ + auVar25._16_4_ * fVar167;
  auVar354._20_4_ = auVar122._20_4_ + auVar25._20_4_ * fVar203;
  auVar354._24_4_ = auVar122._24_4_ + auVar25._24_4_ * fVar226;
  auVar354._28_4_ = auVar122._28_4_ + auVar25._28_4_;
  lVar90 = (ulong)(byte)PVar18 * 0x20 - uVar86;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + lVar90 + 6);
  auVar174 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + lVar90 + 0xe);
  auVar110 = vpmovsxwd_avx(auVar15);
  auVar367._16_16_ = auVar110;
  auVar367._0_16_ = auVar174;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar86 * 0x23 + 6);
  auVar174 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar86 * 0x23 + 0xe);
  auVar110 = vpmovsxwd_avx(auVar17);
  auVar122 = vcvtdq2ps_avx(auVar367);
  auVar378._16_16_ = auVar110;
  auVar378._0_16_ = auVar174;
  auVar25 = vcvtdq2ps_avx(auVar378);
  auVar25 = vsubps_avx(auVar25,auVar122);
  auVar368._0_4_ = auVar122._0_4_ + auVar25._0_4_ * fVar167;
  auVar368._4_4_ = auVar122._4_4_ + auVar25._4_4_ * fVar203;
  auVar368._8_4_ = auVar122._8_4_ + auVar25._8_4_ * fVar226;
  auVar368._12_4_ = auVar122._12_4_ + auVar25._12_4_ * fVar132;
  auVar368._16_4_ = auVar122._16_4_ + auVar25._16_4_ * fVar167;
  auVar368._20_4_ = auVar122._20_4_ + auVar25._20_4_ * fVar203;
  auVar368._24_4_ = auVar122._24_4_ + auVar25._24_4_ * fVar226;
  auVar368._28_4_ = auVar122._28_4_ + fVar132;
  auVar122 = vsubps_avx(auVar303,auVar160);
  auVar276._0_4_ = fVar202 * auVar122._0_4_;
  auVar276._4_4_ = fVar223 * auVar122._4_4_;
  auVar276._8_4_ = fVar224 * auVar122._8_4_;
  auVar276._12_4_ = fVar225 * auVar122._12_4_;
  auVar31._16_4_ = fVar227 * auVar122._16_4_;
  auVar31._0_16_ = auVar276;
  auVar31._20_4_ = fVar228 * auVar122._20_4_;
  auVar31._24_4_ = fVar229 * auVar122._24_4_;
  auVar31._28_4_ = auVar122._28_4_;
  auVar122 = vsubps_avx(auVar317,auVar160);
  auVar204._0_4_ = fVar202 * auVar122._0_4_;
  auVar204._4_4_ = fVar223 * auVar122._4_4_;
  auVar204._8_4_ = fVar224 * auVar122._8_4_;
  auVar204._12_4_ = fVar225 * auVar122._12_4_;
  auVar32._16_4_ = fVar227 * auVar122._16_4_;
  auVar32._0_16_ = auVar204;
  auVar32._20_4_ = fVar228 * auVar122._20_4_;
  auVar32._24_4_ = fVar229 * auVar122._24_4_;
  auVar32._28_4_ = auVar27._28_4_ + auVar29._28_4_;
  auVar122 = vsubps_avx(auVar328,auVar123);
  auVar134._0_4_ = fVar230 * auVar122._0_4_;
  auVar134._4_4_ = fVar201 * auVar122._4_4_;
  auVar134._8_4_ = fVar250 * auVar122._8_4_;
  auVar134._12_4_ = fVar252 * auVar122._12_4_;
  auVar27._16_4_ = fVar254 * auVar122._16_4_;
  auVar27._0_16_ = auVar134;
  auVar27._20_4_ = fVar255 * auVar122._20_4_;
  auVar27._24_4_ = fVar256 * auVar122._24_4_;
  auVar27._28_4_ = auVar122._28_4_;
  auVar122 = vsubps_avx(auVar343,auVar123);
  auVar231._0_4_ = fVar230 * auVar122._0_4_;
  auVar231._4_4_ = fVar201 * auVar122._4_4_;
  auVar231._8_4_ = fVar250 * auVar122._8_4_;
  auVar231._12_4_ = fVar252 * auVar122._12_4_;
  auVar29._16_4_ = fVar254 * auVar122._16_4_;
  auVar29._0_16_ = auVar231;
  auVar29._20_4_ = fVar255 * auVar122._20_4_;
  auVar29._24_4_ = fVar256 * auVar122._24_4_;
  auVar29._28_4_ = auVar28._28_4_ + auVar26._28_4_;
  auVar122 = vsubps_avx(auVar354,auVar197);
  auVar94._0_4_ = fVar257 * auVar122._0_4_;
  auVar94._4_4_ = fVar269 * auVar122._4_4_;
  auVar94._8_4_ = fVar270 * auVar122._8_4_;
  auVar94._12_4_ = fVar271 * auVar122._12_4_;
  auVar26._16_4_ = fVar272 * auVar122._16_4_;
  auVar26._0_16_ = auVar94;
  auVar26._20_4_ = fVar273 * auVar122._20_4_;
  auVar26._24_4_ = fVar274 * auVar122._24_4_;
  auVar26._28_4_ = auVar122._28_4_;
  auVar122 = vsubps_avx(auVar368,auVar197);
  auVar168._0_4_ = fVar257 * auVar122._0_4_;
  auVar168._4_4_ = fVar269 * auVar122._4_4_;
  auVar168._8_4_ = fVar270 * auVar122._8_4_;
  auVar168._12_4_ = fVar271 * auVar122._12_4_;
  auVar35._16_4_ = fVar272 * auVar122._16_4_;
  auVar35._0_16_ = auVar168;
  auVar35._20_4_ = fVar273 * auVar122._20_4_;
  auVar35._24_4_ = fVar274 * auVar122._24_4_;
  auVar35._28_4_ = auVar122._28_4_;
  auVar174 = vpminsd_avx(auVar31._16_16_,auVar32._16_16_);
  auVar110 = vpminsd_avx(auVar276,auVar204);
  auVar318._16_16_ = auVar174;
  auVar318._0_16_ = auVar110;
  auVar174 = vpminsd_avx(auVar27._16_16_,auVar29._16_16_);
  auVar110 = vpminsd_avx(auVar134,auVar231);
  auVar355._16_16_ = auVar174;
  auVar355._0_16_ = auVar110;
  auVar122 = vmaxps_avx(auVar318,auVar355);
  auVar174 = vpminsd_avx(auVar26._16_16_,auVar35._16_16_);
  auVar110 = vpminsd_avx(auVar94,auVar168);
  auVar379._16_16_ = auVar174;
  auVar379._0_16_ = auVar110;
  uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar388._4_4_ = uVar3;
  auVar388._0_4_ = uVar3;
  auVar388._8_4_ = uVar3;
  auVar388._12_4_ = uVar3;
  auVar388._16_4_ = uVar3;
  auVar388._20_4_ = uVar3;
  auVar388._24_4_ = uVar3;
  auVar388._28_4_ = uVar3;
  auVar25 = vmaxps_avx(auVar379,auVar388);
  auVar122 = vmaxps_avx(auVar122,auVar25);
  local_178._4_4_ = auVar122._4_4_ * 0.99999964;
  local_178._0_4_ = auVar122._0_4_ * 0.99999964;
  local_178._8_4_ = auVar122._8_4_ * 0.99999964;
  local_178._12_4_ = auVar122._12_4_ * 0.99999964;
  local_178._16_4_ = auVar122._16_4_ * 0.99999964;
  local_178._20_4_ = auVar122._20_4_ * 0.99999964;
  local_178._24_4_ = auVar122._24_4_ * 0.99999964;
  local_178._28_4_ = auVar122._28_4_;
  auVar174 = vpmaxsd_avx(auVar31._16_16_,auVar32._16_16_);
  auVar110 = vpmaxsd_avx(auVar276,auVar204);
  auVar220._16_16_ = auVar174;
  auVar220._0_16_ = auVar110;
  auVar174 = vpmaxsd_avx(auVar27._16_16_,auVar29._16_16_);
  auVar110 = vpmaxsd_avx(auVar134,auVar231);
  auVar161._16_16_ = auVar174;
  auVar161._0_16_ = auVar110;
  auVar122 = vminps_avx(auVar220,auVar161);
  auVar174 = vpmaxsd_avx(auVar26._16_16_,auVar35._16_16_);
  auVar110 = vpmaxsd_avx(auVar94,auVar168);
  fVar202 = (ray->super_RayK<1>).tfar;
  auVar198._4_4_ = fVar202;
  auVar198._0_4_ = fVar202;
  auVar198._8_4_ = fVar202;
  auVar198._12_4_ = fVar202;
  auVar198._16_4_ = fVar202;
  auVar198._20_4_ = fVar202;
  auVar198._24_4_ = fVar202;
  auVar198._28_4_ = fVar202;
  auVar124._16_16_ = auVar174;
  auVar124._0_16_ = auVar110;
  auVar25 = vminps_avx(auVar124,auVar198);
  auVar122 = vminps_avx(auVar122,auVar25);
  auVar36._4_4_ = auVar122._4_4_ * 1.0000004;
  auVar36._0_4_ = auVar122._0_4_ * 1.0000004;
  auVar36._8_4_ = auVar122._8_4_ * 1.0000004;
  auVar36._12_4_ = auVar122._12_4_ * 1.0000004;
  auVar36._16_4_ = auVar122._16_4_ * 1.0000004;
  auVar36._20_4_ = auVar122._20_4_ * 1.0000004;
  auVar36._24_4_ = auVar122._24_4_ * 1.0000004;
  auVar36._28_4_ = auVar122._28_4_;
  auVar122 = vcmpps_avx(local_178,auVar36,2);
  auVar174 = vpshufd_avx(ZEXT116((byte)PVar18),0);
  auVar162._16_16_ = auVar174;
  auVar162._0_16_ = auVar174;
  auVar25 = vcvtdq2ps_avx(auVar162);
  auVar25 = vcmpps_avx(_DAT_01faff40,auVar25,1);
  auVar122 = vandps_avx(auVar122,auVar25);
  uVar84 = vmovmskps_avx(auVar122);
  if (uVar84 == 0) {
    return;
  }
  auVar125._16_16_ = mm_lookupmask_ps._240_16_;
  auVar125._0_16_ = mm_lookupmask_ps._240_16_;
  uVar84 = uVar84 & 0xff;
  local_158 = vblendps_avx(auVar125,ZEXT832(0) << 0x20,0x80);
  auVar174 = ZEXT416(0) << 0x20;
  do {
    lVar90 = 0;
    if ((ulong)uVar84 != 0) {
      for (; (uVar84 >> lVar90 & 1) == 0; lVar90 = lVar90 + 1) {
      }
    }
    local_418 = (ulong)*(uint *)(prim + 2);
    pGVar19 = (context->scene->geometries).items[local_418].ptr;
    fVar202 = (pGVar19->time_range).lower;
    fVar202 = pGVar19->fnumTimeSegments *
              (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar202) /
              ((pGVar19->time_range).upper - fVar202));
    auVar110 = vroundss_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),9);
    auVar110 = vminss_avx(auVar110,ZEXT416((uint)(pGVar19->fnumTimeSegments + -1.0)));
    auVar174 = vmaxss_avx(auVar174,auVar110);
    local_410 = (ulong)*(uint *)(prim + lVar90 * 4 + 6);
    uVar86 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                             (ulong)*(uint *)(prim + lVar90 * 4 + 6) *
                             pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar92 = (long)(int)auVar174._0_4_ * 0x38;
    lVar21 = *(long *)(_Var20 + lVar92);
    lVar22 = *(long *)(_Var20 + 0x10 + lVar92);
    pfVar2 = (float *)(lVar21 + lVar22 * uVar86);
    fVar230 = *pfVar2;
    fVar167 = pfVar2[1];
    fVar223 = pfVar2[2];
    fVar201 = pfVar2[3];
    lVar90 = uVar86 + 1;
    pfVar2 = (float *)(lVar21 + lVar22 * lVar90);
    fVar203 = *pfVar2;
    fVar224 = pfVar2[1];
    fVar250 = pfVar2[2];
    fVar226 = pfVar2[3];
    lVar1 = uVar86 + 2;
    pfVar2 = (float *)(lVar21 + lVar22 * lVar1);
    fVar225 = *pfVar2;
    fVar252 = pfVar2[1];
    fVar132 = pfVar2[2];
    fVar227 = pfVar2[3];
    lVar91 = uVar86 + 3;
    pfVar2 = (float *)(lVar21 + lVar22 * lVar91);
    fVar254 = *pfVar2;
    fVar228 = pfVar2[1];
    fVar255 = pfVar2[2];
    fVar229 = pfVar2[3];
    lVar21 = *(long *)&pGVar19[4].fnumTimeSegments;
    lVar22 = *(long *)(lVar21 + lVar92);
    lVar23 = *(long *)(lVar21 + 0x10 + lVar92);
    pfVar2 = (float *)(lVar22 + lVar23 * uVar86);
    fVar256 = *pfVar2;
    fVar257 = pfVar2[1];
    fVar269 = pfVar2[2];
    fVar270 = pfVar2[3];
    pfVar2 = (float *)(lVar22 + lVar23 * lVar90);
    fVar271 = *pfVar2;
    fVar272 = pfVar2[1];
    fVar273 = pfVar2[2];
    fVar274 = pfVar2[3];
    pfVar2 = (float *)(lVar22 + lVar23 * lVar1);
    fVar370 = *pfVar2;
    fVar320 = pfVar2[1];
    fVar371 = pfVar2[2];
    fVar321 = pfVar2[3];
    fVar202 = fVar202 - auVar174._0_4_;
    pfVar2 = (float *)(lVar22 + lVar23 * lVar91);
    fVar372 = *pfVar2;
    fVar249 = pfVar2[1];
    fVar251 = pfVar2[2];
    fVar253 = pfVar2[3];
    auVar95._0_4_ = fVar203 * 0.0 + fVar225 * 0.5 + fVar254 * 0.0;
    auVar95._4_4_ = fVar224 * 0.0 + fVar252 * 0.5 + fVar228 * 0.0;
    auVar95._8_4_ = fVar250 * 0.0 + fVar132 * 0.5 + fVar255 * 0.0;
    auVar95._12_4_ = fVar226 * 0.0 + fVar227 * 0.5 + fVar229 * 0.0;
    auVar169._0_4_ = fVar230 * 0.5;
    auVar169._4_4_ = fVar167 * 0.5;
    auVar169._8_4_ = fVar223 * 0.5;
    auVar169._12_4_ = fVar201 * 0.5;
    auVar142 = vsubps_avx(auVar95,auVar169);
    auVar96._0_4_ = fVar271 * 0.0 + fVar370 * 0.5 + fVar372 * 0.0;
    auVar96._4_4_ = fVar272 * 0.0 + fVar320 * 0.5 + fVar249 * 0.0;
    auVar96._8_4_ = fVar273 * 0.0 + fVar371 * 0.5 + fVar251 * 0.0;
    auVar96._12_4_ = fVar274 * 0.0 + fVar321 * 0.5 + fVar253 * 0.0;
    auVar382._0_4_ = fVar256 * 0.5;
    auVar382._4_4_ = fVar257 * 0.5;
    auVar382._8_4_ = fVar269 * 0.5;
    auVar382._12_4_ = fVar270 * 0.5;
    auVar154 = vsubps_avx(auVar96,auVar382);
    local_4d8._0_4_ = fVar230 * -0.0 + fVar225 * 0.0 + fVar254 * -0.0 + fVar203;
    local_4d8._4_4_ = fVar167 * -0.0 + fVar252 * 0.0 + fVar228 * -0.0 + fVar224;
    fStack_4d0 = fVar223 * -0.0 + fVar132 * 0.0 + fVar255 * -0.0 + fVar250;
    fStack_4cc = fVar201 * -0.0 + fVar227 * 0.0 + fVar229 * -0.0 + fVar226;
    local_428._0_4_ = fVar230 * -0.0 + fVar203 * 0.0 + fVar225 + fVar254 * -0.0;
    local_428._4_4_ = fVar167 * -0.0 + fVar224 * 0.0 + fVar252 + fVar228 * -0.0;
    fStack_420 = fVar223 * -0.0 + fVar250 * 0.0 + fVar132 + fVar255 * -0.0;
    fStack_41c = fVar201 * -0.0 + fVar226 * 0.0 + fVar227 + fVar229 * -0.0;
    auVar305._0_4_ = fVar225 * 0.0 + fVar254 * 0.5;
    auVar305._4_4_ = fVar252 * 0.0 + fVar228 * 0.5;
    auVar305._8_4_ = fVar132 * 0.0 + fVar255 * 0.5;
    auVar305._12_4_ = fVar227 * 0.0 + fVar229 * 0.5;
    auVar232._0_4_ = fVar203 * 0.5;
    auVar232._4_4_ = fVar224 * 0.5;
    auVar232._8_4_ = fVar250 * 0.5;
    auVar232._12_4_ = fVar226 * 0.5;
    auVar174 = vsubps_avx(auVar305,auVar232);
    auVar390._0_4_ = fVar256 * -0.0 + fVar370 * 0.0 + fVar372 * -0.0 + fVar271;
    auVar390._4_4_ = fVar257 * -0.0 + fVar320 * 0.0 + fVar249 * -0.0 + fVar272;
    auVar390._8_4_ = fVar269 * -0.0 + fVar371 * 0.0 + fVar251 * -0.0 + fVar273;
    auVar390._12_4_ = fVar270 * -0.0 + fVar321 * 0.0 + fVar253 * -0.0 + fVar274;
    auVar322._0_4_ = fVar230 * 0.0 + auVar174._0_4_;
    auVar322._4_4_ = fVar167 * 0.0 + auVar174._4_4_;
    auVar322._8_4_ = fVar223 * 0.0 + auVar174._8_4_;
    auVar322._12_4_ = fVar201 * 0.0 + auVar174._12_4_;
    auVar205._0_4_ = fVar256 * -0.0 + fVar271 * 0.0 + fVar370 + fVar372 * -0.0;
    auVar205._4_4_ = fVar257 * -0.0 + fVar272 * 0.0 + fVar320 + fVar249 * -0.0;
    auVar205._8_4_ = fVar269 * -0.0 + fVar273 * 0.0 + fVar371 + fVar251 * -0.0;
    auVar205._12_4_ = fVar270 * -0.0 + fVar274 * 0.0 + fVar321 + fVar253 * -0.0;
    auVar233._0_4_ = fVar370 * 0.0 + fVar372 * 0.5;
    auVar233._4_4_ = fVar320 * 0.0 + fVar249 * 0.5;
    auVar233._8_4_ = fVar371 * 0.0 + fVar251 * 0.5;
    auVar233._12_4_ = fVar321 * 0.0 + fVar253 * 0.5;
    auVar290._0_4_ = fVar271 * 0.5;
    auVar290._4_4_ = fVar272 * 0.5;
    auVar290._8_4_ = fVar273 * 0.5;
    auVar290._12_4_ = fVar274 * 0.5;
    auVar174 = vsubps_avx(auVar233,auVar290);
    auVar234._0_4_ = fVar256 * 0.0 + auVar174._0_4_;
    auVar234._4_4_ = fVar257 * 0.0 + auVar174._4_4_;
    auVar234._8_4_ = fVar269 * 0.0 + auVar174._8_4_;
    auVar234._12_4_ = fVar270 * 0.0 + auVar174._12_4_;
    auVar174 = vshufps_avx(auVar142,auVar142,0xc9);
    auVar110 = vshufps_avx(auVar390,auVar390,0xc9);
    fVar275 = auVar142._0_4_;
    auVar291._0_4_ = fVar275 * auVar110._0_4_;
    fVar286 = auVar142._4_4_;
    auVar291._4_4_ = fVar286 * auVar110._4_4_;
    fVar287 = auVar142._8_4_;
    auVar291._8_4_ = fVar287 * auVar110._8_4_;
    fVar288 = auVar142._12_4_;
    auVar291._12_4_ = fVar288 * auVar110._12_4_;
    auVar306._0_4_ = auVar390._0_4_ * auVar174._0_4_;
    auVar306._4_4_ = auVar390._4_4_ * auVar174._4_4_;
    auVar306._8_4_ = auVar390._8_4_ * auVar174._8_4_;
    auVar306._12_4_ = auVar390._12_4_ * auVar174._12_4_;
    auVar110 = vsubps_avx(auVar306,auVar291);
    auVar33 = vshufps_avx(auVar110,auVar110,0xc9);
    auVar110 = vshufps_avx(auVar154,auVar154,0xc9);
    auVar307._0_4_ = auVar110._0_4_ * fVar275;
    auVar307._4_4_ = auVar110._4_4_ * fVar286;
    auVar307._8_4_ = auVar110._8_4_ * fVar287;
    auVar307._12_4_ = auVar110._12_4_ * fVar288;
    auVar97._0_4_ = auVar174._0_4_ * auVar154._0_4_;
    auVar97._4_4_ = auVar174._4_4_ * auVar154._4_4_;
    auVar97._8_4_ = auVar174._8_4_ * auVar154._8_4_;
    auVar97._12_4_ = auVar174._12_4_ * auVar154._12_4_;
    auVar174 = vsubps_avx(auVar97,auVar307);
    auVar154 = vshufps_avx(auVar174,auVar174,0xc9);
    auVar174 = vshufps_avx(auVar322,auVar322,0xc9);
    auVar110 = vshufps_avx(auVar205,auVar205,0xc9);
    auVar308._0_4_ = auVar322._0_4_ * auVar110._0_4_;
    auVar308._4_4_ = auVar322._4_4_ * auVar110._4_4_;
    auVar308._8_4_ = auVar322._8_4_ * auVar110._8_4_;
    auVar308._12_4_ = auVar322._12_4_ * auVar110._12_4_;
    auVar206._0_4_ = auVar174._0_4_ * auVar205._0_4_;
    auVar206._4_4_ = auVar174._4_4_ * auVar205._4_4_;
    auVar206._8_4_ = auVar174._8_4_ * auVar205._8_4_;
    auVar206._12_4_ = auVar174._12_4_ * auVar205._12_4_;
    auVar110 = vsubps_avx(auVar206,auVar308);
    auVar34 = vshufps_avx(auVar110,auVar110,0xc9);
    auVar110 = vshufps_avx(auVar234,auVar234,0xc9);
    auVar309._0_4_ = auVar322._0_4_ * auVar110._0_4_;
    auVar309._4_4_ = auVar322._4_4_ * auVar110._4_4_;
    auVar309._8_4_ = auVar322._8_4_ * auVar110._8_4_;
    auVar309._12_4_ = auVar322._12_4_ * auVar110._12_4_;
    auVar235._0_4_ = auVar174._0_4_ * auVar234._0_4_;
    auVar235._4_4_ = auVar174._4_4_ * auVar234._4_4_;
    auVar235._8_4_ = auVar174._8_4_ * auVar234._8_4_;
    auVar235._12_4_ = auVar174._12_4_ * auVar234._12_4_;
    auVar181 = vsubps_avx(auVar235,auVar309);
    auVar174 = vdpps_avx(auVar33,auVar33,0x7f);
    fVar167 = auVar174._0_4_;
    auVar289 = ZEXT416((uint)fVar167);
    auVar110 = vrsqrtss_avx(auVar289,auVar289);
    fVar230 = auVar110._0_4_;
    auVar110 = vdpps_avx(auVar33,auVar154,0x7f);
    auVar119 = ZEXT416((uint)(fVar230 * 1.5 - fVar167 * 0.5 * fVar230 * fVar230 * fVar230));
    auVar119 = vshufps_avx(auVar119,auVar119,0);
    fVar271 = auVar119._0_4_ * auVar33._0_4_;
    fVar272 = auVar119._4_4_ * auVar33._4_4_;
    fVar273 = auVar119._8_4_ * auVar33._8_4_;
    fVar274 = auVar119._12_4_ * auVar33._12_4_;
    auVar174 = vshufps_avx(auVar174,auVar174,0);
    auVar98._0_4_ = auVar174._0_4_ * auVar154._0_4_;
    auVar98._4_4_ = auVar174._4_4_ * auVar154._4_4_;
    auVar98._8_4_ = auVar174._8_4_ * auVar154._8_4_;
    auVar98._12_4_ = auVar174._12_4_ * auVar154._12_4_;
    auVar174 = vshufps_avx(auVar110,auVar110,0);
    auVar292._0_4_ = auVar174._0_4_ * auVar33._0_4_;
    auVar292._4_4_ = auVar174._4_4_ * auVar33._4_4_;
    auVar292._8_4_ = auVar174._8_4_ * auVar33._8_4_;
    auVar292._12_4_ = auVar174._12_4_ * auVar33._12_4_;
    auVar143 = vsubps_avx(auVar98,auVar292);
    auVar174 = vrcpss_avx(auVar289,auVar289);
    auVar174 = ZEXT416((uint)((2.0 - fVar167 * auVar174._0_4_) * auVar174._0_4_));
    auVar33 = vshufps_avx(auVar174,auVar174,0);
    auVar174 = vdpps_avx(auVar34,auVar34,0x7f);
    fVar370 = auVar174._0_4_;
    auVar154 = ZEXT416((uint)fVar370);
    auVar110 = vrsqrtss_avx(auVar154,auVar154);
    fVar256 = auVar110._0_4_;
    lVar22 = *(long *)(_Var20 + 0x38 + lVar92);
    lVar23 = *(long *)(_Var20 + 0x48 + lVar92);
    pfVar2 = (float *)(lVar22 + lVar23 * uVar86);
    fVar230 = *pfVar2;
    fVar167 = pfVar2[1];
    fVar223 = pfVar2[2];
    fVar201 = pfVar2[3];
    pfVar2 = (float *)(lVar22 + lVar23 * lVar90);
    fVar203 = *pfVar2;
    fVar224 = pfVar2[1];
    fVar250 = pfVar2[2];
    fVar226 = pfVar2[3];
    pfVar2 = (float *)(lVar22 + lVar23 * lVar1);
    fVar225 = *pfVar2;
    fVar252 = pfVar2[1];
    fVar132 = pfVar2[2];
    fVar227 = pfVar2[3];
    auVar110 = vshufps_avx(auVar181,auVar181,0xc9);
    auVar174 = vshufps_avx(auVar174,auVar174,0);
    auVar383._0_4_ = auVar174._0_4_ * auVar110._0_4_;
    auVar383._4_4_ = auVar174._4_4_ * auVar110._4_4_;
    auVar383._8_4_ = auVar174._8_4_ * auVar110._8_4_;
    auVar383._12_4_ = auVar174._12_4_ * auVar110._12_4_;
    auVar174 = vdpps_avx(auVar34,auVar110,0x7f);
    auVar174 = vshufps_avx(auVar174,auVar174,0);
    auVar99._0_4_ = auVar174._0_4_ * auVar34._0_4_;
    auVar99._4_4_ = auVar174._4_4_ * auVar34._4_4_;
    auVar99._8_4_ = auVar174._8_4_ * auVar34._8_4_;
    auVar99._12_4_ = auVar174._12_4_ * auVar34._12_4_;
    auVar181 = vsubps_avx(auVar383,auVar99);
    pfVar2 = (float *)(lVar22 + lVar23 * lVar91);
    fVar254 = *pfVar2;
    fVar228 = pfVar2[1];
    fVar255 = pfVar2[2];
    fVar229 = pfVar2[3];
    lVar22 = *(long *)(lVar21 + 0x38 + lVar92);
    lVar21 = *(long *)(lVar21 + 0x48 + lVar92);
    auVar174 = ZEXT416((uint)(fVar256 * 1.5 - fVar256 * fVar256 * fVar256 * fVar370 * 0.5));
    auVar110 = vshufps_avx(auVar174,auVar174,0);
    fVar256 = auVar34._0_4_ * auVar110._0_4_;
    fVar257 = auVar34._4_4_ * auVar110._4_4_;
    fVar269 = auVar34._8_4_ * auVar110._8_4_;
    fVar270 = auVar34._12_4_ * auVar110._12_4_;
    auVar174 = vrcpss_avx(auVar154,auVar154);
    auVar174 = ZEXT416((uint)(auVar174._0_4_ * (2.0 - fVar370 * auVar174._0_4_)));
    auVar174 = vshufps_avx(auVar174,auVar174,0);
    auVar154 = vshufps_avx(_local_4d8,_local_4d8,0xff);
    auVar358._0_4_ = auVar154._0_4_ * fVar271;
    auVar358._4_4_ = auVar154._4_4_ * fVar272;
    auVar358._8_4_ = auVar154._8_4_ * fVar273;
    auVar358._12_4_ = auVar154._12_4_ * fVar274;
    auVar34 = vshufps_avx(auVar142,auVar142,0xff);
    auVar289 = vsubps_avx(_local_4d8,auVar358);
    auVar293._0_4_ =
         auVar34._0_4_ * fVar271 + auVar154._0_4_ * auVar119._0_4_ * auVar143._0_4_ * auVar33._0_4_;
    auVar293._4_4_ =
         auVar34._4_4_ * fVar272 + auVar154._4_4_ * auVar119._4_4_ * auVar143._4_4_ * auVar33._4_4_;
    auVar293._8_4_ =
         auVar34._8_4_ * fVar273 + auVar154._8_4_ * auVar119._8_4_ * auVar143._8_4_ * auVar33._8_4_;
    auVar293._12_4_ =
         auVar34._12_4_ * fVar274 +
         auVar154._12_4_ * auVar119._12_4_ * auVar143._12_4_ * auVar33._12_4_;
    auVar143 = vsubps_avx(auVar142,auVar293);
    local_4d8._0_4_ = auVar358._0_4_ + (float)local_4d8._0_4_;
    local_4d8._4_4_ = auVar358._4_4_ + (float)local_4d8._4_4_;
    fStack_4d0 = auVar358._8_4_ + fStack_4d0;
    fStack_4cc = auVar358._12_4_ + fStack_4cc;
    auVar33 = vshufps_avx(_local_428,_local_428,0xff);
    auVar170._0_4_ = auVar33._0_4_ * fVar256;
    auVar170._4_4_ = auVar33._4_4_ * fVar257;
    auVar170._8_4_ = auVar33._8_4_ * fVar269;
    auVar170._12_4_ = auVar33._12_4_ * fVar270;
    auVar154 = vshufps_avx(auVar322,auVar322,0xff);
    auVar6 = vsubps_avx(_local_428,auVar170);
    auVar100._0_4_ =
         auVar154._0_4_ * fVar256 + auVar33._0_4_ * auVar110._0_4_ * auVar174._0_4_ * auVar181._0_4_
    ;
    auVar100._4_4_ =
         auVar154._4_4_ * fVar257 + auVar33._4_4_ * auVar110._4_4_ * auVar174._4_4_ * auVar181._4_4_
    ;
    auVar100._8_4_ =
         auVar154._8_4_ * fVar269 + auVar33._8_4_ * auVar110._8_4_ * auVar174._8_4_ * auVar181._8_4_
    ;
    auVar100._12_4_ =
         auVar154._12_4_ * fVar270 +
         auVar33._12_4_ * auVar110._12_4_ * auVar174._12_4_ * auVar181._12_4_;
    auVar362 = vsubps_avx(auVar322,auVar100);
    local_428._0_4_ = (float)local_428._0_4_ + auVar170._0_4_;
    local_428._4_4_ = (float)local_428._4_4_ + auVar170._4_4_;
    fStack_420 = fStack_420 + auVar170._8_4_;
    fStack_41c = fStack_41c + auVar170._12_4_;
    auVar101._0_4_ = fVar203 * 0.0 + fVar225 * 0.5 + fVar254 * 0.0;
    auVar101._4_4_ = fVar224 * 0.0 + fVar252 * 0.5 + fVar228 * 0.0;
    auVar101._8_4_ = fVar250 * 0.0 + fVar132 * 0.5 + fVar255 * 0.0;
    auVar101._12_4_ = fVar226 * 0.0 + fVar227 * 0.5 + fVar229 * 0.0;
    auVar135._0_4_ = fVar230 * 0.5;
    auVar135._4_4_ = fVar167 * 0.5;
    auVar135._8_4_ = fVar223 * 0.5;
    auVar135._12_4_ = fVar201 * 0.5;
    auVar392 = vsubps_avx(auVar101,auVar135);
    pfVar2 = (float *)(lVar22 + lVar1 * lVar21);
    fVar256 = *pfVar2;
    fVar257 = pfVar2[1];
    fVar269 = pfVar2[2];
    fVar270 = pfVar2[3];
    auVar174 = *(undefined1 (*) [16])(lVar22 + lVar21 * lVar91);
    fVar372 = auVar174._0_4_;
    fVar249 = auVar174._4_4_;
    fVar251 = auVar174._8_4_;
    fVar253 = auVar174._12_4_;
    pfVar2 = (float *)(lVar22 + lVar90 * lVar21);
    fVar271 = *pfVar2;
    fVar272 = pfVar2[1];
    fVar273 = pfVar2[2];
    fVar274 = pfVar2[3];
    auVar277._0_4_ = fVar271 * 0.0 + fVar372 * 0.0 + fVar256 * 0.5;
    auVar277._4_4_ = fVar272 * 0.0 + fVar249 * 0.0 + fVar257 * 0.5;
    auVar277._8_4_ = fVar273 * 0.0 + fVar251 * 0.0 + fVar269 * 0.5;
    auVar277._12_4_ = fVar274 * 0.0 + fVar253 * 0.0 + fVar270 * 0.5;
    pfVar2 = (float *)(lVar22 + uVar86 * lVar21);
    fVar370 = *pfVar2;
    fVar320 = pfVar2[1];
    fVar371 = pfVar2[2];
    fVar321 = pfVar2[3];
    auVar310._0_4_ = fVar370 * 0.5;
    auVar310._4_4_ = fVar320 * 0.5;
    auVar310._8_4_ = fVar371 * 0.5;
    auVar310._12_4_ = fVar321 * 0.5;
    auVar110 = vsubps_avx(auVar277,auVar310);
    auVar311._0_4_ = fVar230 * -0.0 + fVar203 + fVar225 * 0.0 + fVar254 * -0.0;
    auVar311._4_4_ = fVar167 * -0.0 + fVar224 + fVar252 * 0.0 + fVar228 * -0.0;
    auVar311._8_4_ = fVar223 * -0.0 + fVar250 + fVar132 * 0.0 + fVar255 * -0.0;
    auVar311._12_4_ = fVar201 * -0.0 + fVar226 + fVar227 * 0.0 + fVar229 * -0.0;
    auVar294._0_4_ = fVar230 * -0.0 + fVar203 * 0.0 + fVar225 + fVar254 * -0.0;
    auVar294._4_4_ = fVar167 * -0.0 + fVar224 * 0.0 + fVar252 + fVar228 * -0.0;
    auVar294._8_4_ = fVar223 * -0.0 + fVar250 * 0.0 + fVar132 + fVar255 * -0.0;
    auVar294._12_4_ = fVar201 * -0.0 + fVar226 * 0.0 + fVar227 + fVar229 * -0.0;
    auVar332._0_4_ = fVar225 * 0.0 + fVar254 * 0.5;
    auVar332._4_4_ = fVar252 * 0.0 + fVar228 * 0.5;
    auVar332._8_4_ = fVar132 * 0.0 + fVar255 * 0.5;
    auVar332._12_4_ = fVar227 * 0.0 + fVar229 * 0.5;
    auVar359._0_4_ = fVar203 * 0.5;
    auVar359._4_4_ = fVar224 * 0.5;
    auVar359._8_4_ = fVar250 * 0.5;
    auVar359._12_4_ = fVar226 * 0.5;
    auVar174 = vsubps_avx(auVar332,auVar359);
    auVar346._0_4_ = fVar230 * 0.0 + auVar174._0_4_;
    auVar346._4_4_ = fVar167 * 0.0 + auVar174._4_4_;
    auVar346._8_4_ = fVar223 * 0.0 + auVar174._8_4_;
    auVar346._12_4_ = fVar201 * 0.0 + auVar174._12_4_;
    auVar333._0_4_ = fVar370 * -0.0 + fVar271 + fVar372 * -0.0 + fVar256 * 0.0;
    auVar333._4_4_ = fVar320 * -0.0 + fVar272 + fVar249 * -0.0 + fVar257 * 0.0;
    auVar333._8_4_ = fVar371 * -0.0 + fVar273 + fVar251 * -0.0 + fVar269 * 0.0;
    auVar333._12_4_ = fVar321 * -0.0 + fVar274 + fVar253 * -0.0 + fVar270 * 0.0;
    auVar136._0_4_ = fVar370 * -0.0 + fVar372 * -0.0 + fVar256 + fVar271 * 0.0;
    auVar136._4_4_ = fVar320 * -0.0 + fVar249 * -0.0 + fVar257 + fVar272 * 0.0;
    auVar136._8_4_ = fVar371 * -0.0 + fVar251 * -0.0 + fVar269 + fVar273 * 0.0;
    auVar136._12_4_ = fVar321 * -0.0 + fVar253 * -0.0 + fVar270 + fVar274 * 0.0;
    auVar171._0_4_ = fVar256 * 0.0 + fVar372 * 0.5;
    auVar171._4_4_ = fVar257 * 0.0 + fVar249 * 0.5;
    auVar171._8_4_ = fVar269 * 0.0 + fVar251 * 0.5;
    auVar171._12_4_ = fVar270 * 0.0 + fVar253 * 0.5;
    auVar207._0_4_ = fVar271 * 0.5;
    auVar207._4_4_ = fVar272 * 0.5;
    auVar207._8_4_ = fVar273 * 0.5;
    auVar207._12_4_ = fVar274 * 0.5;
    auVar174 = vsubps_avx(auVar171,auVar207);
    auVar102._0_4_ = fVar370 * 0.0 + auVar174._0_4_;
    auVar102._4_4_ = fVar320 * 0.0 + auVar174._4_4_;
    auVar102._8_4_ = fVar371 * 0.0 + auVar174._8_4_;
    auVar102._12_4_ = fVar321 * 0.0 + auVar174._12_4_;
    auVar174 = vshufps_avx(auVar333,auVar333,0xc9);
    fVar225 = auVar392._0_4_;
    auVar172._0_4_ = fVar225 * auVar174._0_4_;
    fVar252 = auVar392._4_4_;
    auVar172._4_4_ = fVar252 * auVar174._4_4_;
    fVar132 = auVar392._8_4_;
    auVar172._8_4_ = fVar132 * auVar174._8_4_;
    fVar227 = auVar392._12_4_;
    auVar172._12_4_ = fVar227 * auVar174._12_4_;
    auVar174 = vshufps_avx(auVar392,auVar392,0xc9);
    auVar334._0_4_ = auVar333._0_4_ * auVar174._0_4_;
    auVar334._4_4_ = auVar333._4_4_ * auVar174._4_4_;
    auVar334._8_4_ = auVar333._8_4_ * auVar174._8_4_;
    auVar334._12_4_ = auVar333._12_4_ * auVar174._12_4_;
    auVar33 = vsubps_avx(auVar334,auVar172);
    auVar208._0_4_ = auVar174._0_4_ * auVar110._0_4_;
    auVar208._4_4_ = auVar174._4_4_ * auVar110._4_4_;
    auVar208._8_4_ = auVar174._8_4_ * auVar110._8_4_;
    auVar208._12_4_ = auVar174._12_4_ * auVar110._12_4_;
    auVar174 = vshufps_avx(auVar110,auVar110,0xc9);
    auVar278._0_4_ = fVar225 * auVar174._0_4_;
    auVar278._4_4_ = fVar252 * auVar174._4_4_;
    auVar278._8_4_ = fVar132 * auVar174._8_4_;
    auVar278._12_4_ = fVar227 * auVar174._12_4_;
    auVar154 = vsubps_avx(auVar208,auVar278);
    auVar174 = vshufps_avx(auVar136,auVar136,0xc9);
    auVar279._0_4_ = auVar346._0_4_ * auVar174._0_4_;
    auVar279._4_4_ = auVar346._4_4_ * auVar174._4_4_;
    auVar279._8_4_ = auVar346._8_4_ * auVar174._8_4_;
    auVar279._12_4_ = auVar346._12_4_ * auVar174._12_4_;
    auVar174 = vshufps_avx(auVar346,auVar346,0xc9);
    auVar137._0_4_ = auVar174._0_4_ * auVar136._0_4_;
    auVar137._4_4_ = auVar174._4_4_ * auVar136._4_4_;
    auVar137._8_4_ = auVar174._8_4_ * auVar136._8_4_;
    auVar137._12_4_ = auVar174._12_4_ * auVar136._12_4_;
    auVar34 = vsubps_avx(auVar137,auVar279);
    auVar33 = vshufps_avx(auVar33,auVar33,0xc9);
    auVar173._0_4_ = auVar174._0_4_ * auVar102._0_4_;
    auVar173._4_4_ = auVar174._4_4_ * auVar102._4_4_;
    auVar173._8_4_ = auVar174._8_4_ * auVar102._8_4_;
    auVar173._12_4_ = auVar174._12_4_ * auVar102._12_4_;
    auVar174 = vdpps_avx(auVar33,auVar33,0x7f);
    auVar110 = vshufps_avx(auVar102,auVar102,0xc9);
    auVar103._0_4_ = auVar346._0_4_ * auVar110._0_4_;
    auVar103._4_4_ = auVar346._4_4_ * auVar110._4_4_;
    auVar103._8_4_ = auVar346._8_4_ * auVar110._8_4_;
    auVar103._12_4_ = auVar346._12_4_ * auVar110._12_4_;
    auVar142 = vsubps_avx(auVar173,auVar103);
    fVar230 = auVar174._0_4_;
    auVar119 = ZEXT416((uint)fVar230);
    auVar110 = vrsqrtss_avx(auVar119,auVar119);
    fVar167 = auVar110._0_4_;
    auVar154 = vshufps_avx(auVar154,auVar154,0xc9);
    auVar110 = vdpps_avx(auVar33,auVar154,0x7f);
    auVar174 = vshufps_avx(auVar174,auVar174,0);
    auVar209._0_4_ = auVar174._0_4_ * auVar154._0_4_;
    auVar209._4_4_ = auVar174._4_4_ * auVar154._4_4_;
    auVar209._8_4_ = auVar174._8_4_ * auVar154._8_4_;
    auVar209._12_4_ = auVar174._12_4_ * auVar154._12_4_;
    auVar174 = vshufps_avx(auVar110,auVar110,0);
    auVar360._0_4_ = auVar174._0_4_ * auVar33._0_4_;
    auVar360._4_4_ = auVar174._4_4_ * auVar33._4_4_;
    auVar360._8_4_ = auVar174._8_4_ * auVar33._8_4_;
    auVar360._12_4_ = auVar174._12_4_ * auVar33._12_4_;
    auVar7 = vsubps_avx(auVar209,auVar360);
    auVar174 = vrcpss_avx(auVar119,auVar119);
    auVar174 = ZEXT416((uint)(auVar174._0_4_ * (2.0 - fVar230 * auVar174._0_4_)));
    auVar154 = vshufps_avx(auVar174,auVar174,0);
    auVar34 = vshufps_avx(auVar34,auVar34,0xc9);
    auVar110 = vdpps_avx(auVar34,auVar34,0x7f);
    auVar174 = ZEXT416((uint)(fVar167 * 1.5 - fVar230 * 0.5 * fVar167 * fVar167 * fVar167));
    auVar119 = vshufps_avx(auVar174,auVar174,0);
    fVar230 = auVar33._0_4_ * auVar119._0_4_;
    fVar167 = auVar33._4_4_ * auVar119._4_4_;
    fVar223 = auVar33._8_4_ * auVar119._8_4_;
    fVar201 = auVar33._12_4_ * auVar119._12_4_;
    auVar174 = vblendps_avx(auVar110,_DAT_01f7aa10,0xe);
    auVar33 = vrsqrtss_avx(auVar174,auVar174);
    fVar203 = auVar33._0_4_;
    auVar142 = vshufps_avx(auVar142,auVar142,0xc9);
    auVar33 = vdpps_avx(auVar34,auVar142,0x7f);
    auVar181 = vshufps_avx(auVar110,auVar110,0);
    auVar104._0_4_ = auVar181._0_4_ * auVar142._0_4_;
    auVar104._4_4_ = auVar181._4_4_ * auVar142._4_4_;
    auVar104._8_4_ = auVar181._8_4_ * auVar142._8_4_;
    auVar104._12_4_ = auVar181._12_4_ * auVar142._12_4_;
    auVar33 = vshufps_avx(auVar33,auVar33,0);
    auVar361._0_4_ = auVar33._0_4_ * auVar34._0_4_;
    auVar361._4_4_ = auVar33._4_4_ * auVar34._4_4_;
    auVar361._8_4_ = auVar33._8_4_ * auVar34._8_4_;
    auVar361._12_4_ = auVar33._12_4_ * auVar34._12_4_;
    auVar142 = vsubps_avx(auVar104,auVar361);
    auVar174 = vrcpss_avx(auVar174,auVar174);
    auVar174 = ZEXT416((uint)(auVar174._0_4_ * (2.0 - auVar110._0_4_ * auVar174._0_4_)));
    auVar174 = vshufps_avx(auVar174,auVar174,0);
    auVar110 = ZEXT416((uint)(fVar203 * 1.5 - auVar110._0_4_ * 0.5 * fVar203 * fVar203 * fVar203));
    auVar110 = vshufps_avx(auVar110,auVar110,0);
    fVar203 = auVar34._0_4_ * auVar110._0_4_;
    fVar224 = auVar34._4_4_ * auVar110._4_4_;
    fVar250 = auVar34._8_4_ * auVar110._8_4_;
    fVar226 = auVar34._12_4_ * auVar110._12_4_;
    auVar33 = vshufps_avx(auVar392,auVar392,0xff);
    auVar34 = vshufps_avx(auVar311,auVar311,0xff);
    auVar138._0_4_ = auVar34._0_4_ * fVar230;
    auVar138._4_4_ = auVar34._4_4_ * fVar167;
    auVar138._8_4_ = auVar34._8_4_ * fVar223;
    auVar138._12_4_ = auVar34._12_4_ * fVar201;
    auVar175._0_4_ =
         auVar33._0_4_ * fVar230 + auVar119._0_4_ * auVar7._0_4_ * auVar154._0_4_ * auVar34._0_4_;
    auVar175._4_4_ =
         auVar33._4_4_ * fVar167 + auVar119._4_4_ * auVar7._4_4_ * auVar154._4_4_ * auVar34._4_4_;
    auVar175._8_4_ =
         auVar33._8_4_ * fVar223 + auVar119._8_4_ * auVar7._8_4_ * auVar154._8_4_ * auVar34._8_4_;
    auVar175._12_4_ =
         auVar33._12_4_ * fVar201 +
         auVar119._12_4_ * auVar7._12_4_ * auVar154._12_4_ * auVar34._12_4_;
    auVar34 = vsubps_avx(auVar311,auVar138);
    auVar119 = vsubps_avx(auVar392,auVar175);
    auVar33 = vshufps_avx(auVar346,auVar346,0xff);
    auVar154 = vshufps_avx(auVar294,auVar294,0xff);
    auVar210._0_4_ = auVar154._0_4_ * fVar203;
    auVar210._4_4_ = auVar154._4_4_ * fVar224;
    auVar210._8_4_ = auVar154._8_4_ * fVar250;
    auVar210._12_4_ = auVar154._12_4_ * fVar226;
    auVar176._0_4_ =
         auVar33._0_4_ * fVar203 + auVar154._0_4_ * auVar110._0_4_ * auVar142._0_4_ * auVar174._0_4_
    ;
    auVar176._4_4_ =
         auVar33._4_4_ * fVar224 + auVar154._4_4_ * auVar110._4_4_ * auVar142._4_4_ * auVar174._4_4_
    ;
    auVar176._8_4_ =
         auVar33._8_4_ * fVar250 + auVar154._8_4_ * auVar110._8_4_ * auVar142._8_4_ * auVar174._8_4_
    ;
    auVar176._12_4_ =
         auVar33._12_4_ * fVar226 +
         auVar154._12_4_ * auVar110._12_4_ * auVar142._12_4_ * auVar174._12_4_;
    auVar33 = vsubps_avx(auVar294,auVar210);
    local_4c8._4_4_ = auVar294._4_4_ + auVar210._4_4_;
    local_4c8._0_4_ = auVar294._0_4_ + auVar210._0_4_;
    fStack_4c0 = auVar294._8_4_ + auVar210._8_4_;
    fStack_4bc = auVar294._12_4_ + auVar210._12_4_;
    auVar154 = vsubps_avx(auVar346,auVar176);
    local_448._0_4_ = auVar143._0_4_;
    local_448._4_4_ = auVar143._4_4_;
    fStack_440 = auVar143._8_4_;
    fStack_43c = auVar143._12_4_;
    local_398._0_4_ = auVar289._0_4_;
    local_398._4_4_ = auVar289._4_4_;
    fStack_390 = auVar289._8_4_;
    fStack_38c = auVar289._12_4_;
    auVar174 = vshufps_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),0);
    auVar110 = vshufps_avx(ZEXT416((uint)(1.0 - fVar202)),ZEXT416((uint)(1.0 - fVar202)),0);
    fVar201 = auVar174._0_4_;
    fVar203 = auVar174._4_4_;
    fVar224 = auVar174._8_4_;
    fVar250 = auVar174._12_4_;
    fVar202 = auVar110._0_4_;
    fVar230 = auVar110._4_4_;
    fVar167 = auVar110._8_4_;
    fVar223 = auVar110._12_4_;
    local_348._0_4_ = fVar202 * (float)local_398._0_4_ + fVar201 * auVar34._0_4_;
    local_348._4_4_ = fVar230 * (float)local_398._4_4_ + fVar203 * auVar34._4_4_;
    fStack_340 = fVar167 * fStack_390 + fVar224 * auVar34._8_4_;
    fStack_33c = fVar223 * fStack_38c + fVar250 * auVar34._12_4_;
    local_3c8 = fVar202 * ((float)local_398._0_4_ + (float)local_448._0_4_ * 0.33333334) +
                fVar201 * (auVar34._0_4_ + auVar119._0_4_ * 0.33333334);
    fStack_3c4 = fVar230 * ((float)local_398._4_4_ + (float)local_448._4_4_ * 0.33333334) +
                 fVar203 * (auVar34._4_4_ + auVar119._4_4_ * 0.33333334);
    fStack_3c0 = fVar167 * (fStack_390 + fStack_440 * 0.33333334) +
                 fVar224 * (auVar34._8_4_ + auVar119._8_4_ * 0.33333334);
    fStack_3bc = fVar223 * (fStack_38c + fStack_43c * 0.33333334) +
                 fVar250 * (auVar34._12_4_ + auVar119._12_4_ * 0.33333334);
    local_408._0_4_ = auVar362._0_4_;
    local_408._4_4_ = auVar362._4_4_;
    fStack_400 = auVar362._8_4_;
    fStack_3fc = auVar362._12_4_;
    auVar177._0_4_ = (float)local_408._0_4_ * 0.33333334;
    auVar177._4_4_ = (float)local_408._4_4_ * 0.33333334;
    auVar177._8_4_ = fStack_400 * 0.33333334;
    auVar177._12_4_ = fStack_3fc * 0.33333334;
    auVar174 = vsubps_avx(auVar6,auVar177);
    auVar280._0_4_ = (auVar322._0_4_ + auVar100._0_4_) * 0.33333334;
    auVar280._4_4_ = (auVar322._4_4_ + auVar100._4_4_) * 0.33333334;
    auVar280._8_4_ = (auVar322._8_4_ + auVar100._8_4_) * 0.33333334;
    auVar280._12_4_ = (auVar322._12_4_ + auVar100._12_4_) * 0.33333334;
    auVar110 = vsubps_avx(_local_428,auVar280);
    auVar211._0_4_ = auVar154._0_4_ * 0.33333334;
    auVar211._4_4_ = auVar154._4_4_ * 0.33333334;
    auVar211._8_4_ = auVar154._8_4_ * 0.33333334;
    auVar211._12_4_ = auVar154._12_4_ * 0.33333334;
    auVar154 = vsubps_avx(auVar33,auVar211);
    auVar335._0_4_ = (auVar346._0_4_ + auVar176._0_4_) * 0.33333334;
    auVar335._4_4_ = (auVar346._4_4_ + auVar176._4_4_) * 0.33333334;
    auVar335._8_4_ = (auVar346._8_4_ + auVar176._8_4_) * 0.33333334;
    auVar335._12_4_ = (auVar346._12_4_ + auVar176._12_4_) * 0.33333334;
    auVar34 = vsubps_avx(_local_4c8,auVar335);
    local_358._0_4_ = fVar201 * auVar154._0_4_ + auVar174._0_4_ * fVar202;
    local_358._4_4_ = fVar203 * auVar154._4_4_ + auVar174._4_4_ * fVar230;
    fStack_350 = fVar224 * auVar154._8_4_ + auVar174._8_4_ * fVar167;
    fStack_34c = fVar250 * auVar154._12_4_ + auVar174._12_4_ * fVar223;
    local_3d8 = fVar201 * auVar33._0_4_ + fVar202 * auVar6._0_4_;
    fStack_3d4 = fVar203 * auVar33._4_4_ + fVar230 * auVar6._4_4_;
    fStack_3d0 = fVar224 * auVar33._8_4_ + fVar167 * auVar6._8_4_;
    fStack_3cc = fVar250 * auVar33._12_4_ + fVar223 * auVar6._12_4_;
    local_368._0_4_ = (float)local_4d8._0_4_ * fVar202 + fVar201 * (auVar311._0_4_ + auVar138._0_4_)
    ;
    local_368._4_4_ = (float)local_4d8._4_4_ * fVar230 + fVar203 * (auVar311._4_4_ + auVar138._4_4_)
    ;
    fStack_360 = fStack_4d0 * fVar167 + fVar224 * (auVar311._8_4_ + auVar138._8_4_);
    fStack_35c = fStack_4cc * fVar223 + fVar250 * (auVar311._12_4_ + auVar138._12_4_);
    local_378._0_4_ =
         fVar202 * ((float)local_4d8._0_4_ + (fVar275 + auVar293._0_4_) * 0.33333334) +
         fVar201 * (auVar311._0_4_ + auVar138._0_4_ + (fVar225 + auVar175._0_4_) * 0.33333334);
    local_378._4_4_ =
         fVar230 * ((float)local_4d8._4_4_ + (fVar286 + auVar293._4_4_) * 0.33333334) +
         fVar203 * (auVar311._4_4_ + auVar138._4_4_ + (fVar252 + auVar175._4_4_) * 0.33333334);
    fStack_370 = fVar167 * (fStack_4d0 + (fVar287 + auVar293._8_4_) * 0.33333334) +
                 fVar224 * (auVar311._8_4_ + auVar138._8_4_ +
                           (fVar132 + auVar175._8_4_) * 0.33333334);
    fStack_36c = fVar223 * (fStack_4cc + (fVar288 + auVar293._12_4_) * 0.33333334) +
                 fVar250 * (auVar311._12_4_ + auVar138._12_4_ +
                           (fVar227 + auVar175._12_4_) * 0.33333334);
    local_3e8 = fVar202 * auVar110._0_4_ + fVar201 * auVar34._0_4_;
    fStack_3e4 = fVar230 * auVar110._4_4_ + fVar203 * auVar34._4_4_;
    fStack_3e0 = fVar167 * auVar110._8_4_ + fVar224 * auVar34._8_4_;
    fStack_3dc = fVar223 * auVar110._12_4_ + fVar250 * auVar34._12_4_;
    local_2a8._0_4_ = (float)local_428._0_4_ * fVar202 + fVar201 * (auVar294._0_4_ + auVar210._0_4_)
    ;
    local_2a8._4_4_ = (float)local_428._4_4_ * fVar230 + fVar203 * (auVar294._4_4_ + auVar210._4_4_)
    ;
    fStack_2a0 = fStack_420 * fVar167 + fVar224 * (auVar294._8_4_ + auVar210._8_4_);
    fStack_29c = fStack_41c * fVar223 + fVar250 * (auVar294._12_4_ + auVar210._12_4_);
    aVar5 = (ray->super_RayK<1>).org.field_0;
    auVar33 = vsubps_avx(_local_348,(undefined1  [16])aVar5);
    auVar110 = vmovsldup_avx(auVar33);
    auVar174 = vmovshdup_avx(auVar33);
    auVar33 = vshufps_avx(auVar33,auVar33,0xaa);
    fVar202 = (pre->ray_space).vx.field_0.m128[0];
    fVar230 = (pre->ray_space).vx.field_0.m128[1];
    fVar167 = (pre->ray_space).vx.field_0.m128[2];
    fVar223 = (pre->ray_space).vx.field_0.m128[3];
    fVar201 = (pre->ray_space).vy.field_0.m128[0];
    fVar203 = (pre->ray_space).vy.field_0.m128[1];
    fVar224 = (pre->ray_space).vy.field_0.m128[2];
    fVar250 = (pre->ray_space).vy.field_0.m128[3];
    fVar226 = (pre->ray_space).vz.field_0.m128[0];
    fVar225 = (pre->ray_space).vz.field_0.m128[1];
    fVar252 = (pre->ray_space).vz.field_0.m128[2];
    fVar132 = (pre->ray_space).vz.field_0.m128[3];
    local_498._4_4_ = fVar230 * auVar110._4_4_ + fVar203 * auVar174._4_4_ + fVar225 * auVar33._4_4_;
    local_498._0_4_ = fVar202 * auVar110._0_4_ + fVar201 * auVar174._0_4_ + fVar226 * auVar33._0_4_;
    fStack_490 = fVar167 * auVar110._8_4_ + fVar224 * auVar174._8_4_ + fVar252 * auVar33._8_4_;
    fStack_48c = fVar223 * auVar110._12_4_ + fVar250 * auVar174._12_4_ + fVar132 * auVar33._12_4_;
    auVar81._4_4_ = fStack_3c4;
    auVar81._0_4_ = local_3c8;
    auVar81._8_4_ = fStack_3c0;
    auVar81._12_4_ = fStack_3bc;
    auVar33 = vsubps_avx(auVar81,(undefined1  [16])aVar5);
    auVar110 = vmovsldup_avx(auVar33);
    auVar174 = vmovshdup_avx(auVar33);
    auVar33 = vshufps_avx(auVar33,auVar33,0xaa);
    fVar227 = fVar202 * auVar110._0_4_ + fVar201 * auVar174._0_4_ + fVar226 * auVar33._0_4_;
    fVar254 = fVar230 * auVar110._4_4_ + fVar203 * auVar174._4_4_ + fVar225 * auVar33._4_4_;
    local_4d8._4_4_ = fVar254;
    local_4d8._0_4_ = fVar227;
    fStack_4d0 = fVar167 * auVar110._8_4_ + fVar224 * auVar174._8_4_ + fVar252 * auVar33._8_4_;
    fStack_4cc = fVar223 * auVar110._12_4_ + fVar250 * auVar174._12_4_ + fVar132 * auVar33._12_4_;
    auVar110 = vsubps_avx(_local_358,(undefined1  [16])aVar5);
    auVar33 = vshufps_avx(auVar110,auVar110,0xaa);
    auVar174 = vmovshdup_avx(auVar110);
    auVar110 = vmovsldup_avx(auVar110);
    auVar139._0_8_ =
         CONCAT44(fVar230 * auVar110._4_4_ + auVar174._4_4_ * fVar203 + fVar225 * auVar33._4_4_,
                  fVar202 * auVar110._0_4_ + auVar174._0_4_ * fVar201 + fVar226 * auVar33._0_4_);
    auVar139._8_4_ = fVar167 * auVar110._8_4_ + auVar174._8_4_ * fVar224 + fVar252 * auVar33._8_4_;
    auVar139._12_4_ =
         fVar223 * auVar110._12_4_ + auVar174._12_4_ * fVar250 + fVar132 * auVar33._12_4_;
    auVar78._4_4_ = fStack_3d4;
    auVar78._0_4_ = local_3d8;
    auVar78._8_4_ = fStack_3d0;
    auVar78._12_4_ = fStack_3cc;
    auVar110 = vsubps_avx(auVar78,(undefined1  [16])aVar5);
    auVar33 = vshufps_avx(auVar110,auVar110,0xaa);
    auVar174 = vmovshdup_avx(auVar110);
    auVar110 = vmovsldup_avx(auVar110);
    auVar295._0_8_ =
         CONCAT44(auVar174._4_4_ * fVar203 + auVar33._4_4_ * fVar225 + fVar230 * auVar110._4_4_,
                  auVar174._0_4_ * fVar201 + auVar33._0_4_ * fVar226 + fVar202 * auVar110._0_4_);
    auVar295._8_4_ = auVar174._8_4_ * fVar224 + auVar33._8_4_ * fVar252 + fVar167 * auVar110._8_4_;
    auVar295._12_4_ =
         auVar174._12_4_ * fVar250 + auVar33._12_4_ * fVar132 + fVar223 * auVar110._12_4_;
    auVar110 = vsubps_avx(_local_368,(undefined1  [16])aVar5);
    auVar33 = vshufps_avx(auVar110,auVar110,0xaa);
    auVar174 = vmovshdup_avx(auVar110);
    auVar110 = vmovsldup_avx(auVar110);
    auVar391._0_8_ =
         CONCAT44(auVar110._4_4_ * fVar230 + auVar174._4_4_ * fVar203 + auVar33._4_4_ * fVar225,
                  auVar110._0_4_ * fVar202 + auVar174._0_4_ * fVar201 + auVar33._0_4_ * fVar226);
    auVar391._8_4_ = auVar110._8_4_ * fVar167 + auVar174._8_4_ * fVar224 + auVar33._8_4_ * fVar252;
    auVar391._12_4_ =
         auVar110._12_4_ * fVar223 + auVar174._12_4_ * fVar250 + auVar33._12_4_ * fVar132;
    auVar110 = vsubps_avx(_local_378,(undefined1  [16])aVar5);
    auVar33 = vshufps_avx(auVar110,auVar110,0xaa);
    auVar174 = vmovshdup_avx(auVar110);
    auVar110 = vmovsldup_avx(auVar110);
    auVar212._0_8_ =
         CONCAT44(auVar110._4_4_ * fVar230 + auVar174._4_4_ * fVar203 + auVar33._4_4_ * fVar225,
                  auVar110._0_4_ * fVar202 + auVar174._0_4_ * fVar201 + auVar33._0_4_ * fVar226);
    auVar212._8_4_ = auVar110._8_4_ * fVar167 + auVar174._8_4_ * fVar224 + auVar33._8_4_ * fVar252;
    auVar212._12_4_ =
         auVar110._12_4_ * fVar223 + auVar174._12_4_ * fVar250 + auVar33._12_4_ * fVar132;
    auVar75._4_4_ = fStack_3e4;
    auVar75._0_4_ = local_3e8;
    auVar75._8_4_ = fStack_3e0;
    auVar75._12_4_ = fStack_3dc;
    auVar110 = vsubps_avx(auVar75,(undefined1  [16])aVar5);
    auVar33 = vshufps_avx(auVar110,auVar110,0xaa);
    auVar174 = vmovshdup_avx(auVar110);
    auVar110 = vmovsldup_avx(auVar110);
    auVar336._0_8_ =
         CONCAT44(auVar110._4_4_ * fVar230 + auVar174._4_4_ * fVar203 + auVar33._4_4_ * fVar225,
                  auVar110._0_4_ * fVar202 + auVar174._0_4_ * fVar201 + auVar33._0_4_ * fVar226);
    auVar336._8_4_ = auVar110._8_4_ * fVar167 + auVar174._8_4_ * fVar224 + auVar33._8_4_ * fVar252;
    auVar336._12_4_ =
         auVar110._12_4_ * fVar223 + auVar174._12_4_ * fVar250 + auVar33._12_4_ * fVar132;
    auVar110 = vsubps_avx(_local_2a8,(undefined1  [16])aVar5);
    auVar33 = vshufps_avx(auVar110,auVar110,0xaa);
    auVar174 = vmovshdup_avx(auVar110);
    auVar110 = vmovsldup_avx(auVar110);
    auVar105._0_8_ =
         CONCAT44(fVar230 * auVar110._4_4_ + auVar174._4_4_ * fVar203 + auVar33._4_4_ * fVar225,
                  fVar202 * auVar110._0_4_ + auVar174._0_4_ * fVar201 + auVar33._0_4_ * fVar226);
    auVar105._8_4_ = fVar167 * auVar110._8_4_ + auVar174._8_4_ * fVar224 + auVar33._8_4_ * fVar252;
    auVar105._12_4_ =
         fVar223 * auVar110._12_4_ + auVar174._12_4_ * fVar250 + auVar33._12_4_ * fVar132;
    auVar154 = vmovlhps_avx(_local_498,auVar391);
    auVar34 = vmovlhps_avx(_local_4d8,auVar212);
    _local_4a8 = vmovlhps_avx(auVar139,auVar336);
    _local_428 = vmovlhps_avx(auVar295,auVar105);
    auVar174 = vminps_avx(auVar154,auVar34);
    auVar110 = vminps_avx(_local_4a8,_local_428);
    auVar33 = vminps_avx(auVar174,auVar110);
    auVar174 = vmaxps_avx(auVar154,auVar34);
    auVar110 = vmaxps_avx(_local_4a8,_local_428);
    auVar174 = vmaxps_avx(auVar174,auVar110);
    auVar110 = vshufpd_avx(auVar33,auVar33,3);
    auVar33 = vminps_avx(auVar33,auVar110);
    auVar110 = vshufpd_avx(auVar174,auVar174,3);
    auVar110 = vmaxps_avx(auVar174,auVar110);
    auVar281._8_4_ = 0x7fffffff;
    auVar281._0_8_ = 0x7fffffff7fffffff;
    auVar281._12_4_ = 0x7fffffff;
    auVar174 = vandps_avx(auVar33,auVar281);
    auVar110 = vandps_avx(auVar110,auVar281);
    auVar174 = vmaxps_avx(auVar174,auVar110);
    auVar110 = vmovshdup_avx(auVar174);
    auVar174 = vmaxss_avx(auVar110,auVar174);
    auVar93 = (undefined1  [8])((ulong)uVar84 + 0xff);
    fVar202 = auVar174._0_4_ * 9.536743e-07;
    local_318._8_8_ = local_498;
    local_318._0_8_ = local_498;
    auVar285 = ZEXT1664(local_318);
    local_458._8_8_ = auVar139._0_8_;
    local_458._0_8_ = auVar139._0_8_;
    auVar380 = ZEXT1664(local_458);
    local_468._8_8_ = auVar295._0_8_;
    local_468._0_8_ = auVar295._0_8_;
    auVar331 = ZEXT1664(local_468);
    register0x00001348 = auVar391._0_8_;
    local_328 = auVar391._0_8_;
    auVar268 = ZEXT1664(_local_328);
    register0x000012c8 = auVar212._0_8_;
    local_338 = auVar212._0_8_;
    auVar222 = ZEXT1664(_local_338);
    local_478._8_8_ = auVar336._0_8_;
    local_478._0_8_ = auVar336._0_8_;
    auVar345 = ZEXT1664(local_478);
    local_488._8_8_ = auVar105._0_8_;
    local_488._0_8_ = auVar105._0_8_;
    auVar357 = ZEXT1664(local_488);
    local_2e8 = ZEXT416((uint)fVar202);
    auVar174 = vshufps_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),0);
    local_1b8._16_16_ = auVar174;
    local_1b8._0_16_ = auVar174;
    auVar106._0_8_ = auVar174._0_8_ ^ 0x8000000080000000;
    auVar106._8_4_ = auVar174._8_4_ ^ 0x80000000;
    auVar106._12_4_ = auVar174._12_4_ ^ 0x80000000;
    local_1d8._16_16_ = auVar106;
    local_1d8._0_16_ = auVar106;
    uVar85 = 0;
    _local_498 = auVar154;
    _local_1e8 = vsubps_avx(auVar34,auVar154);
    _local_1f8 = vsubps_avx(_local_4a8,auVar34);
    _local_208 = vsubps_avx(_local_428,_local_4a8);
    _local_228 = vsubps_avx(_local_368,_local_348);
    auVar82._4_4_ = fStack_3c4;
    auVar82._0_4_ = local_3c8;
    auVar82._8_4_ = fStack_3c0;
    auVar82._12_4_ = fStack_3bc;
    _local_238 = vsubps_avx(_local_378,auVar82);
    auVar76._4_4_ = fStack_3e4;
    auVar76._0_4_ = local_3e8;
    auVar76._8_4_ = fStack_3e0;
    auVar76._12_4_ = fStack_3dc;
    _local_248 = vsubps_avx(auVar76,_local_358);
    auVar79._4_4_ = fStack_3d4;
    auVar79._0_4_ = local_3d8;
    auVar79._8_4_ = fStack_3d0;
    auVar79._12_4_ = fStack_3cc;
    _local_258 = vsubps_avx(_local_2a8,auVar79);
    auVar369 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar395 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_011c2bd9:
    auVar392 = auVar395._0_16_;
    local_218 = auVar392;
    auVar362 = auVar369._0_16_;
    auVar174 = vshufps_avx(auVar362,auVar362,0x50);
    auVar384._8_4_ = 0x3f800000;
    auVar384._0_8_ = 0x3f8000003f800000;
    auVar384._12_4_ = 0x3f800000;
    auVar389._16_4_ = 0x3f800000;
    auVar389._0_16_ = auVar384;
    auVar389._20_4_ = 0x3f800000;
    auVar389._24_4_ = 0x3f800000;
    auVar389._28_4_ = 0x3f800000;
    auVar110 = vsubps_avx(auVar384,auVar174);
    fVar202 = auVar174._0_4_;
    fVar230 = auVar174._4_4_;
    fVar167 = auVar174._8_4_;
    fVar223 = auVar174._12_4_;
    fVar201 = auVar110._0_4_;
    fVar203 = auVar110._4_4_;
    fVar224 = auVar110._8_4_;
    fVar250 = auVar110._12_4_;
    auVar213._0_4_ = auVar268._0_4_ * fVar202 + fVar201 * auVar285._0_4_;
    auVar213._4_4_ = auVar268._4_4_ * fVar230 + fVar203 * auVar285._4_4_;
    auVar213._8_4_ = auVar268._8_4_ * fVar167 + fVar224 * auVar285._8_4_;
    auVar213._12_4_ = auVar268._12_4_ * fVar223 + fVar250 * auVar285._12_4_;
    auVar178._0_4_ = auVar222._0_4_ * fVar202 + fVar201 * fVar227;
    auVar178._4_4_ = auVar222._4_4_ * fVar230 + fVar203 * fVar254;
    auVar178._8_4_ = auVar222._8_4_ * fVar167 + fVar224 * fVar227;
    auVar178._12_4_ = auVar222._12_4_ * fVar223 + fVar250 * fVar254;
    auVar296._0_4_ = auVar345._0_4_ * fVar202 + auVar380._0_4_ * fVar201;
    auVar296._4_4_ = auVar345._4_4_ * fVar230 + auVar380._4_4_ * fVar203;
    auVar296._8_4_ = auVar345._8_4_ * fVar167 + auVar380._8_4_ * fVar224;
    auVar296._12_4_ = auVar345._12_4_ * fVar223 + auVar380._12_4_ * fVar250;
    auVar236._0_4_ = auVar357._0_4_ * fVar202 + auVar331._0_4_ * fVar201;
    auVar236._4_4_ = auVar357._4_4_ * fVar230 + auVar331._4_4_ * fVar203;
    auVar236._8_4_ = auVar357._8_4_ * fVar167 + auVar331._8_4_ * fVar224;
    auVar236._12_4_ = auVar357._12_4_ * fVar223 + auVar331._12_4_ * fVar250;
    auVar174 = vmovshdup_avx(auVar392);
    auVar110 = vshufps_avx(auVar392,auVar392,0);
    auVar329._16_16_ = auVar110;
    auVar329._0_16_ = auVar110;
    auVar33 = vshufps_avx(auVar392,auVar392,0x55);
    auVar126._16_16_ = auVar33;
    auVar126._0_16_ = auVar33;
    auVar122 = vsubps_avx(auVar126,auVar329);
    auVar33 = vshufps_avx(auVar213,auVar213,0);
    auVar154 = vshufps_avx(auVar213,auVar213,0x55);
    auVar119 = vshufps_avx(auVar178,auVar178,0);
    auVar142 = vshufps_avx(auVar178,auVar178,0x55);
    auVar181 = vshufps_avx(auVar296,auVar296,0);
    auVar143 = vshufps_avx(auVar296,auVar296,0x55);
    auVar289 = vshufps_avx(auVar236,auVar236,0);
    auVar6 = vshufps_avx(auVar236,auVar236,0x55);
    auVar174 = ZEXT416((uint)((auVar174._0_4_ - auVar395._0_4_) * 0.04761905));
    auVar174 = vshufps_avx(auVar174,auVar174,0);
    auVar344._0_4_ = auVar110._0_4_ + auVar122._0_4_ * 0.0;
    auVar344._4_4_ = auVar110._4_4_ + auVar122._4_4_ * 0.14285715;
    auVar344._8_4_ = auVar110._8_4_ + auVar122._8_4_ * 0.2857143;
    auVar344._12_4_ = auVar110._12_4_ + auVar122._12_4_ * 0.42857146;
    auVar344._16_4_ = auVar110._0_4_ + auVar122._16_4_ * 0.5714286;
    auVar344._20_4_ = auVar110._4_4_ + auVar122._20_4_ * 0.71428573;
    auVar344._24_4_ = auVar110._8_4_ + auVar122._24_4_ * 0.8571429;
    auVar344._28_4_ = auVar110._12_4_ + auVar122._28_4_;
    auVar25 = vsubps_avx(auVar389,auVar344);
    fVar202 = auVar119._0_4_;
    fVar167 = auVar119._4_4_;
    fVar201 = auVar119._8_4_;
    fVar224 = auVar119._12_4_;
    fVar249 = auVar25._0_4_;
    fVar251 = auVar25._4_4_;
    fVar253 = auVar25._8_4_;
    fVar275 = auVar25._12_4_;
    fVar286 = auVar25._16_4_;
    fVar287 = auVar25._20_4_;
    fVar288 = auVar25._24_4_;
    fVar272 = auVar142._0_4_;
    fVar274 = auVar142._4_4_;
    fVar320 = auVar142._8_4_;
    fVar321 = auVar142._12_4_;
    fVar381 = auVar154._12_4_ + 1.0;
    fVar257 = auVar181._0_4_;
    fVar269 = auVar181._4_4_;
    fVar270 = auVar181._8_4_;
    fVar271 = auVar181._12_4_;
    fVar226 = fVar257 * auVar344._0_4_ + fVar249 * fVar202;
    fVar225 = fVar269 * auVar344._4_4_ + fVar251 * fVar167;
    fVar252 = fVar270 * auVar344._8_4_ + fVar253 * fVar201;
    fVar132 = fVar271 * auVar344._12_4_ + fVar275 * fVar224;
    fVar228 = fVar257 * auVar344._16_4_ + fVar286 * fVar202;
    fVar255 = fVar269 * auVar344._20_4_ + fVar287 * fVar167;
    fVar229 = fVar270 * auVar344._24_4_ + fVar288 * fVar201;
    fVar230 = auVar143._0_4_;
    fVar223 = auVar143._4_4_;
    fVar203 = auVar143._8_4_;
    fVar250 = auVar143._12_4_;
    fVar273 = fVar272 * fVar249 + auVar344._0_4_ * fVar230;
    fVar370 = fVar274 * fVar251 + auVar344._4_4_ * fVar223;
    fVar371 = fVar320 * fVar253 + auVar344._8_4_ * fVar203;
    fVar372 = fVar321 * fVar275 + auVar344._12_4_ * fVar250;
    fVar373 = fVar272 * fVar286 + auVar344._16_4_ * fVar230;
    fVar374 = fVar274 * fVar287 + auVar344._20_4_ * fVar223;
    fVar375 = fVar320 * fVar288 + auVar344._24_4_ * fVar203;
    fVar376 = fVar321 + fVar224;
    auVar110 = vshufps_avx(auVar213,auVar213,0xaa);
    auVar119 = vshufps_avx(auVar213,auVar213,0xff);
    fVar256 = fVar271 + 0.0;
    auVar142 = vshufps_avx(auVar178,auVar178,0xaa);
    auVar181 = vshufps_avx(auVar178,auVar178,0xff);
    auVar247._0_4_ =
         fVar249 * (auVar344._0_4_ * fVar202 + fVar249 * auVar33._0_4_) + auVar344._0_4_ * fVar226;
    auVar247._4_4_ =
         fVar251 * (auVar344._4_4_ * fVar167 + fVar251 * auVar33._4_4_) + auVar344._4_4_ * fVar225;
    auVar247._8_4_ =
         fVar253 * (auVar344._8_4_ * fVar201 + fVar253 * auVar33._8_4_) + auVar344._8_4_ * fVar252;
    auVar247._12_4_ =
         fVar275 * (auVar344._12_4_ * fVar224 + fVar275 * auVar33._12_4_) +
         auVar344._12_4_ * fVar132;
    auVar247._16_4_ =
         fVar286 * (auVar344._16_4_ * fVar202 + fVar286 * auVar33._0_4_) + auVar344._16_4_ * fVar228
    ;
    auVar247._20_4_ =
         fVar287 * (auVar344._20_4_ * fVar167 + fVar287 * auVar33._4_4_) + auVar344._20_4_ * fVar255
    ;
    auVar247._24_4_ =
         fVar288 * (auVar344._24_4_ * fVar201 + fVar288 * auVar33._8_4_) + auVar344._24_4_ * fVar229
    ;
    auVar247._28_4_ = auVar33._12_4_ + 1.0 + fVar250;
    auVar266._0_4_ =
         fVar249 * (fVar272 * auVar344._0_4_ + auVar154._0_4_ * fVar249) + auVar344._0_4_ * fVar273;
    auVar266._4_4_ =
         fVar251 * (fVar274 * auVar344._4_4_ + auVar154._4_4_ * fVar251) + auVar344._4_4_ * fVar370;
    auVar266._8_4_ =
         fVar253 * (fVar320 * auVar344._8_4_ + auVar154._8_4_ * fVar253) + auVar344._8_4_ * fVar371;
    auVar266._12_4_ =
         fVar275 * (fVar321 * auVar344._12_4_ + auVar154._12_4_ * fVar275) +
         auVar344._12_4_ * fVar372;
    auVar266._16_4_ =
         fVar286 * (fVar272 * auVar344._16_4_ + auVar154._0_4_ * fVar286) +
         auVar344._16_4_ * fVar373;
    auVar266._20_4_ =
         fVar287 * (fVar274 * auVar344._20_4_ + auVar154._4_4_ * fVar287) +
         auVar344._20_4_ * fVar374;
    auVar266._24_4_ =
         fVar288 * (fVar320 * auVar344._24_4_ + auVar154._8_4_ * fVar288) +
         auVar344._24_4_ * fVar375;
    auVar266._28_4_ = auVar6._12_4_ + fVar250;
    auVar127._0_4_ =
         fVar249 * fVar226 + auVar344._0_4_ * (fVar257 * fVar249 + auVar289._0_4_ * auVar344._0_4_);
    auVar127._4_4_ =
         fVar251 * fVar225 + auVar344._4_4_ * (fVar269 * fVar251 + auVar289._4_4_ * auVar344._4_4_);
    auVar127._8_4_ =
         fVar253 * fVar252 + auVar344._8_4_ * (fVar270 * fVar253 + auVar289._8_4_ * auVar344._8_4_);
    auVar127._12_4_ =
         fVar275 * fVar132 +
         auVar344._12_4_ * (fVar271 * fVar275 + auVar289._12_4_ * auVar344._12_4_);
    auVar127._16_4_ =
         fVar286 * fVar228 +
         auVar344._16_4_ * (fVar257 * fVar286 + auVar289._0_4_ * auVar344._16_4_);
    auVar127._20_4_ =
         fVar287 * fVar255 +
         auVar344._20_4_ * (fVar269 * fVar287 + auVar289._4_4_ * auVar344._20_4_);
    auVar127._24_4_ =
         fVar288 * fVar229 +
         auVar344._24_4_ * (fVar270 * fVar288 + auVar289._8_4_ * auVar344._24_4_);
    auVar127._28_4_ = fVar224 + 1.0 + fVar256;
    auVar356._0_4_ =
         fVar249 * fVar273 + auVar344._0_4_ * (auVar6._0_4_ * auVar344._0_4_ + fVar249 * fVar230);
    auVar356._4_4_ =
         fVar251 * fVar370 + auVar344._4_4_ * (auVar6._4_4_ * auVar344._4_4_ + fVar251 * fVar223);
    auVar356._8_4_ =
         fVar253 * fVar371 + auVar344._8_4_ * (auVar6._8_4_ * auVar344._8_4_ + fVar253 * fVar203);
    auVar356._12_4_ =
         fVar275 * fVar372 + auVar344._12_4_ * (auVar6._12_4_ * auVar344._12_4_ + fVar275 * fVar250)
    ;
    auVar356._16_4_ =
         fVar286 * fVar373 + auVar344._16_4_ * (auVar6._0_4_ * auVar344._16_4_ + fVar286 * fVar230);
    auVar356._20_4_ =
         fVar287 * fVar374 + auVar344._20_4_ * (auVar6._4_4_ * auVar344._20_4_ + fVar287 * fVar223);
    auVar356._24_4_ =
         fVar288 * fVar375 + auVar344._24_4_ * (auVar6._8_4_ * auVar344._24_4_ + fVar288 * fVar203);
    auVar356._28_4_ = fVar256 + fVar250 + 0.0;
    local_98._0_4_ = fVar249 * auVar247._0_4_ + auVar344._0_4_ * auVar127._0_4_;
    local_98._4_4_ = fVar251 * auVar247._4_4_ + auVar344._4_4_ * auVar127._4_4_;
    local_98._8_4_ = fVar253 * auVar247._8_4_ + auVar344._8_4_ * auVar127._8_4_;
    local_98._12_4_ = fVar275 * auVar247._12_4_ + auVar344._12_4_ * auVar127._12_4_;
    local_98._16_4_ = fVar286 * auVar247._16_4_ + auVar344._16_4_ * auVar127._16_4_;
    local_98._20_4_ = fVar287 * auVar247._20_4_ + auVar344._20_4_ * auVar127._20_4_;
    local_98._24_4_ = fVar288 * auVar247._24_4_ + auVar344._24_4_ * auVar127._24_4_;
    local_98._28_4_ = fVar376 + fVar250 + 0.0;
    auVar221._0_4_ = fVar249 * auVar266._0_4_ + auVar344._0_4_ * auVar356._0_4_;
    auVar221._4_4_ = fVar251 * auVar266._4_4_ + auVar344._4_4_ * auVar356._4_4_;
    auVar221._8_4_ = fVar253 * auVar266._8_4_ + auVar344._8_4_ * auVar356._8_4_;
    auVar221._12_4_ = fVar275 * auVar266._12_4_ + auVar344._12_4_ * auVar356._12_4_;
    auVar221._16_4_ = fVar286 * auVar266._16_4_ + auVar344._16_4_ * auVar356._16_4_;
    auVar221._20_4_ = fVar287 * auVar266._20_4_ + auVar344._20_4_ * auVar356._20_4_;
    auVar221._24_4_ = fVar288 * auVar266._24_4_ + auVar344._24_4_ * auVar356._24_4_;
    auVar221._28_4_ = fVar376 + fVar256;
    auVar26 = vsubps_avx(auVar127,auVar247);
    auVar122 = vsubps_avx(auVar356,auVar266);
    local_3b8._0_4_ = auVar174._0_4_;
    local_3b8._4_4_ = auVar174._4_4_;
    fStack_3b0 = auVar174._8_4_;
    fStack_3ac = auVar174._12_4_;
    local_d8 = (float)local_3b8._0_4_ * auVar26._0_4_ * 3.0;
    fStack_d4 = (float)local_3b8._4_4_ * auVar26._4_4_ * 3.0;
    auVar37._4_4_ = fStack_d4;
    auVar37._0_4_ = local_d8;
    fStack_d0 = fStack_3b0 * auVar26._8_4_ * 3.0;
    auVar37._8_4_ = fStack_d0;
    fStack_cc = fStack_3ac * auVar26._12_4_ * 3.0;
    auVar37._12_4_ = fStack_cc;
    fStack_c8 = (float)local_3b8._0_4_ * auVar26._16_4_ * 3.0;
    auVar37._16_4_ = fStack_c8;
    fStack_c4 = (float)local_3b8._4_4_ * auVar26._20_4_ * 3.0;
    auVar37._20_4_ = fStack_c4;
    fStack_c0 = fStack_3b0 * auVar26._24_4_ * 3.0;
    auVar37._24_4_ = fStack_c0;
    auVar37._28_4_ = auVar26._28_4_;
    local_f8 = (float)local_3b8._0_4_ * auVar122._0_4_ * 3.0;
    fStack_f4 = (float)local_3b8._4_4_ * auVar122._4_4_ * 3.0;
    auVar38._4_4_ = fStack_f4;
    auVar38._0_4_ = local_f8;
    fStack_f0 = fStack_3b0 * auVar122._8_4_ * 3.0;
    auVar38._8_4_ = fStack_f0;
    fStack_ec = fStack_3ac * auVar122._12_4_ * 3.0;
    auVar38._12_4_ = fStack_ec;
    fStack_e8 = (float)local_3b8._0_4_ * auVar122._16_4_ * 3.0;
    auVar38._16_4_ = fStack_e8;
    fStack_e4 = (float)local_3b8._4_4_ * auVar122._20_4_ * 3.0;
    auVar38._20_4_ = fStack_e4;
    fStack_e0 = fStack_3b0 * auVar122._24_4_ * 3.0;
    auVar38._24_4_ = fStack_e0;
    auVar38._28_4_ = fVar376;
    auVar27 = vsubps_avx(local_98,auVar37);
    auVar122 = vperm2f128_avx(auVar27,auVar27,1);
    auVar122 = vshufps_avx(auVar122,auVar27,0x30);
    _local_408 = vshufps_avx(auVar27,auVar122,0x29);
    auVar27 = vsubps_avx(auVar221,auVar38);
    auVar122 = vperm2f128_avx(auVar27,auVar27,1);
    auVar122 = vshufps_avx(auVar122,auVar27,0x30);
    _local_398 = vshufps_avx(auVar27,auVar122,0x29);
    auVar161 = _local_398;
    fVar374 = auVar142._0_4_;
    fVar375 = auVar142._4_4_;
    fVar396 = auVar142._8_4_;
    fVar224 = auVar110._12_4_;
    fVar269 = auVar181._0_4_;
    fVar271 = auVar181._4_4_;
    fVar273 = auVar181._8_4_;
    fVar370 = auVar181._12_4_;
    auVar174 = vshufps_avx(auVar296,auVar296,0xaa);
    fVar202 = auVar174._0_4_;
    fVar167 = auVar174._4_4_;
    fVar201 = auVar174._8_4_;
    fVar250 = auVar174._12_4_;
    fVar252 = auVar344._0_4_ * fVar202 + fVar374 * fVar249;
    fVar132 = auVar344._4_4_ * fVar167 + fVar375 * fVar251;
    fVar228 = auVar344._8_4_ * fVar201 + fVar396 * fVar253;
    fVar255 = auVar344._12_4_ * fVar250 + auVar142._12_4_ * fVar275;
    fVar229 = auVar344._16_4_ * fVar202 + fVar374 * fVar286;
    fVar256 = auVar344._20_4_ * fVar167 + fVar375 * fVar287;
    fVar257 = auVar344._24_4_ * fVar201 + fVar396 * fVar288;
    auVar174 = vshufps_avx(auVar296,auVar296,0xff);
    fVar230 = auVar174._0_4_;
    fVar223 = auVar174._4_4_;
    fVar203 = auVar174._8_4_;
    fVar226 = auVar174._12_4_;
    fVar270 = auVar344._0_4_ * fVar230 + fVar269 * fVar249;
    fVar272 = auVar344._4_4_ * fVar223 + fVar271 * fVar251;
    fVar274 = auVar344._8_4_ * fVar203 + fVar273 * fVar253;
    fVar320 = auVar344._12_4_ * fVar226 + fVar370 * fVar275;
    fVar371 = auVar344._16_4_ * fVar230 + fVar269 * fVar286;
    fVar321 = auVar344._20_4_ * fVar223 + fVar271 * fVar287;
    fVar372 = auVar344._24_4_ * fVar203 + fVar273 * fVar288;
    auVar174 = vshufps_avx(auVar236,auVar236,0xaa);
    fVar373 = auVar174._12_4_ + fVar250;
    auVar33 = vshufps_avx(auVar236,auVar236,0xff);
    fVar225 = auVar33._12_4_;
    auVar128._0_4_ =
         fVar249 * (fVar374 * auVar344._0_4_ + fVar249 * auVar110._0_4_) + auVar344._0_4_ * fVar252;
    auVar128._4_4_ =
         fVar251 * (fVar375 * auVar344._4_4_ + fVar251 * auVar110._4_4_) + auVar344._4_4_ * fVar132;
    auVar128._8_4_ =
         fVar253 * (fVar396 * auVar344._8_4_ + fVar253 * auVar110._8_4_) + auVar344._8_4_ * fVar228;
    auVar128._12_4_ =
         fVar275 * (auVar142._12_4_ * auVar344._12_4_ + fVar275 * fVar224) +
         auVar344._12_4_ * fVar255;
    auVar128._16_4_ =
         fVar286 * (fVar374 * auVar344._16_4_ + fVar286 * auVar110._0_4_) +
         auVar344._16_4_ * fVar229;
    auVar128._20_4_ =
         fVar287 * (fVar375 * auVar344._20_4_ + fVar287 * auVar110._4_4_) +
         auVar344._20_4_ * fVar256;
    auVar128._24_4_ =
         fVar288 * (fVar396 * auVar344._24_4_ + fVar288 * auVar110._8_4_) +
         auVar344._24_4_ * fVar257;
    auVar128._28_4_ = local_398._28_4_ + fVar224 + fVar225;
    auVar163._0_4_ =
         fVar249 * (fVar269 * auVar344._0_4_ + auVar119._0_4_ * fVar249) + auVar344._0_4_ * fVar270;
    auVar163._4_4_ =
         fVar251 * (fVar271 * auVar344._4_4_ + auVar119._4_4_ * fVar251) + auVar344._4_4_ * fVar272;
    auVar163._8_4_ =
         fVar253 * (fVar273 * auVar344._8_4_ + auVar119._8_4_ * fVar253) + auVar344._8_4_ * fVar274;
    auVar163._12_4_ =
         fVar275 * (fVar370 * auVar344._12_4_ + auVar119._12_4_ * fVar275) +
         auVar344._12_4_ * fVar320;
    auVar163._16_4_ =
         fVar286 * (fVar269 * auVar344._16_4_ + auVar119._0_4_ * fVar286) +
         auVar344._16_4_ * fVar371;
    auVar163._20_4_ =
         fVar287 * (fVar271 * auVar344._20_4_ + auVar119._4_4_ * fVar287) +
         auVar344._20_4_ * fVar321;
    auVar163._24_4_ =
         fVar288 * (fVar273 * auVar344._24_4_ + auVar119._8_4_ * fVar288) +
         auVar344._24_4_ * fVar372;
    auVar163._28_4_ = fVar224 + auVar122._28_4_ + fVar225;
    auVar122 = vperm2f128_avx(local_98,local_98,1);
    auVar122 = vshufps_avx(auVar122,local_98,0x30);
    _local_308 = vshufps_avx(local_98,auVar122,0x29);
    auVar267._0_4_ =
         auVar344._0_4_ * (auVar174._0_4_ * auVar344._0_4_ + fVar249 * fVar202) + fVar249 * fVar252;
    auVar267._4_4_ =
         auVar344._4_4_ * (auVar174._4_4_ * auVar344._4_4_ + fVar251 * fVar167) + fVar251 * fVar132;
    auVar267._8_4_ =
         auVar344._8_4_ * (auVar174._8_4_ * auVar344._8_4_ + fVar253 * fVar201) + fVar253 * fVar228;
    auVar267._12_4_ =
         auVar344._12_4_ * (auVar174._12_4_ * auVar344._12_4_ + fVar275 * fVar250) +
         fVar275 * fVar255;
    auVar267._16_4_ =
         auVar344._16_4_ * (auVar174._0_4_ * auVar344._16_4_ + fVar286 * fVar202) +
         fVar286 * fVar229;
    auVar267._20_4_ =
         auVar344._20_4_ * (auVar174._4_4_ * auVar344._20_4_ + fVar287 * fVar167) +
         fVar287 * fVar256;
    auVar267._24_4_ =
         auVar344._24_4_ * (auVar174._8_4_ * auVar344._24_4_ + fVar288 * fVar201) +
         fVar288 * fVar257;
    auVar267._28_4_ = fVar373 + fVar381 + auVar266._28_4_;
    auVar319._0_4_ =
         fVar249 * fVar270 + auVar344._0_4_ * (auVar344._0_4_ * auVar33._0_4_ + fVar249 * fVar230);
    auVar319._4_4_ =
         fVar251 * fVar272 + auVar344._4_4_ * (auVar344._4_4_ * auVar33._4_4_ + fVar251 * fVar223);
    auVar319._8_4_ =
         fVar253 * fVar274 + auVar344._8_4_ * (auVar344._8_4_ * auVar33._8_4_ + fVar253 * fVar203);
    auVar319._12_4_ =
         fVar275 * fVar320 + auVar344._12_4_ * (auVar344._12_4_ * fVar225 + fVar275 * fVar226);
    auVar319._16_4_ =
         fVar286 * fVar371 + auVar344._16_4_ * (auVar344._16_4_ * auVar33._0_4_ + fVar286 * fVar230)
    ;
    auVar319._20_4_ =
         fVar287 * fVar321 + auVar344._20_4_ * (auVar344._20_4_ * auVar33._4_4_ + fVar287 * fVar223)
    ;
    auVar319._24_4_ =
         fVar288 * fVar372 + auVar344._24_4_ * (auVar344._24_4_ * auVar33._8_4_ + fVar288 * fVar203)
    ;
    auVar319._28_4_ = fVar381 + fVar370 + fVar225 + fVar226;
    auVar304._0_4_ = fVar249 * auVar128._0_4_ + auVar344._0_4_ * auVar267._0_4_;
    auVar304._4_4_ = fVar251 * auVar128._4_4_ + auVar344._4_4_ * auVar267._4_4_;
    auVar304._8_4_ = fVar253 * auVar128._8_4_ + auVar344._8_4_ * auVar267._8_4_;
    auVar304._12_4_ = fVar275 * auVar128._12_4_ + auVar344._12_4_ * auVar267._12_4_;
    auVar304._16_4_ = fVar286 * auVar128._16_4_ + auVar344._16_4_ * auVar267._16_4_;
    auVar304._20_4_ = fVar287 * auVar128._20_4_ + auVar344._20_4_ * auVar267._20_4_;
    auVar304._24_4_ = fVar288 * auVar128._24_4_ + auVar344._24_4_ * auVar267._24_4_;
    auVar304._28_4_ = fVar373 + fVar225 + fVar226;
    auVar330._0_4_ = fVar249 * auVar163._0_4_ + auVar344._0_4_ * auVar319._0_4_;
    auVar330._4_4_ = fVar251 * auVar163._4_4_ + auVar344._4_4_ * auVar319._4_4_;
    auVar330._8_4_ = fVar253 * auVar163._8_4_ + auVar344._8_4_ * auVar319._8_4_;
    auVar330._12_4_ = fVar275 * auVar163._12_4_ + auVar344._12_4_ * auVar319._12_4_;
    auVar330._16_4_ = fVar286 * auVar163._16_4_ + auVar344._16_4_ * auVar319._16_4_;
    auVar330._20_4_ = fVar287 * auVar163._20_4_ + auVar344._20_4_ * auVar319._20_4_;
    auVar330._24_4_ = fVar288 * auVar163._24_4_ + auVar344._24_4_ * auVar319._24_4_;
    auVar330._28_4_ = auVar25._28_4_ + auVar344._28_4_;
    auVar25 = vsubps_avx(auVar267,auVar128);
    auVar122 = vsubps_avx(auVar319,auVar163);
    local_118 = (float)local_3b8._0_4_ * auVar25._0_4_ * 3.0;
    fStack_114 = (float)local_3b8._4_4_ * auVar25._4_4_ * 3.0;
    auVar39._4_4_ = fStack_114;
    auVar39._0_4_ = local_118;
    fStack_110 = fStack_3b0 * auVar25._8_4_ * 3.0;
    auVar39._8_4_ = fStack_110;
    fStack_10c = fStack_3ac * auVar25._12_4_ * 3.0;
    auVar39._12_4_ = fStack_10c;
    fStack_108 = (float)local_3b8._0_4_ * auVar25._16_4_ * 3.0;
    auVar39._16_4_ = fStack_108;
    fStack_104 = (float)local_3b8._4_4_ * auVar25._20_4_ * 3.0;
    auVar39._20_4_ = fStack_104;
    fStack_100 = fStack_3b0 * auVar25._24_4_ * 3.0;
    auVar39._24_4_ = fStack_100;
    auVar39._28_4_ = auVar25._28_4_;
    local_138 = (float)local_3b8._0_4_ * auVar122._0_4_ * 3.0;
    fStack_134 = (float)local_3b8._4_4_ * auVar122._4_4_ * 3.0;
    auVar40._4_4_ = fStack_134;
    auVar40._0_4_ = local_138;
    fStack_130 = fStack_3b0 * auVar122._8_4_ * 3.0;
    auVar40._8_4_ = fStack_130;
    fStack_12c = fStack_3ac * auVar122._12_4_ * 3.0;
    auVar40._12_4_ = fStack_12c;
    fStack_128 = (float)local_3b8._0_4_ * auVar122._16_4_ * 3.0;
    auVar40._16_4_ = fStack_128;
    fStack_124 = (float)local_3b8._4_4_ * auVar122._20_4_ * 3.0;
    auVar40._20_4_ = fStack_124;
    fStack_120 = fStack_3b0 * auVar122._24_4_ * 3.0;
    auVar40._24_4_ = fStack_120;
    auVar40._28_4_ = auVar267._28_4_;
    auVar122 = vperm2f128_avx(auVar304,auVar304,1);
    auVar122 = vshufps_avx(auVar122,auVar304,0x30);
    auVar29 = vshufps_avx(auVar304,auVar122,0x29);
    auVar27 = vsubps_avx(auVar304,auVar39);
    auVar122 = vperm2f128_avx(auVar27,auVar27,1);
    auVar122 = vshufps_avx(auVar122,auVar27,0x30);
    _local_3b8 = vshufps_avx(auVar27,auVar122,0x29);
    auVar160 = _local_3b8;
    auVar27 = vsubps_avx(auVar330,auVar40);
    auVar122 = vperm2f128_avx(auVar27,auVar27,1);
    auVar122 = vshufps_avx(auVar122,auVar27,0x30);
    _local_448 = vshufps_avx(auVar27,auVar122,0x29);
    auVar27 = vsubps_avx(auVar304,local_98);
    auVar28 = vsubps_avx(auVar29,_local_308);
    fVar202 = auVar28._0_4_ + auVar27._0_4_;
    fVar230 = auVar28._4_4_ + auVar27._4_4_;
    fVar167 = auVar28._8_4_ + auVar27._8_4_;
    fVar223 = auVar28._12_4_ + auVar27._12_4_;
    fVar201 = auVar28._16_4_ + auVar27._16_4_;
    fVar203 = auVar28._20_4_ + auVar27._20_4_;
    fVar224 = auVar28._24_4_ + auVar27._24_4_;
    auVar122 = vperm2f128_avx(auVar221,auVar221,1);
    auVar122 = vshufps_avx(auVar122,auVar221,0x30);
    local_b8 = vshufps_avx(auVar221,auVar122,0x29);
    auVar122 = vperm2f128_avx(auVar330,auVar330,1);
    auVar122 = vshufps_avx(auVar122,auVar330,0x30);
    local_78 = vshufps_avx(auVar330,auVar122,0x29);
    auVar122 = vsubps_avx(auVar330,auVar221);
    auVar30 = vsubps_avx(local_78,local_b8);
    fVar250 = auVar30._0_4_ + auVar122._0_4_;
    fVar226 = auVar30._4_4_ + auVar122._4_4_;
    fVar225 = auVar30._8_4_ + auVar122._8_4_;
    fVar252 = auVar30._12_4_ + auVar122._12_4_;
    fVar132 = auVar30._16_4_ + auVar122._16_4_;
    fVar228 = auVar30._20_4_ + auVar122._20_4_;
    fVar255 = auVar30._24_4_ + auVar122._24_4_;
    auVar41._4_4_ = fVar230 * auVar221._4_4_;
    auVar41._0_4_ = fVar202 * auVar221._0_4_;
    auVar41._8_4_ = fVar167 * auVar221._8_4_;
    auVar41._12_4_ = fVar223 * auVar221._12_4_;
    auVar41._16_4_ = fVar201 * auVar221._16_4_;
    auVar41._20_4_ = fVar203 * auVar221._20_4_;
    auVar41._24_4_ = fVar224 * auVar221._24_4_;
    auVar41._28_4_ = auVar122._28_4_;
    auVar42._4_4_ = fVar226 * local_98._4_4_;
    auVar42._0_4_ = fVar250 * local_98._0_4_;
    auVar42._8_4_ = fVar225 * local_98._8_4_;
    auVar42._12_4_ = fVar252 * local_98._12_4_;
    auVar42._16_4_ = fVar132 * local_98._16_4_;
    auVar42._20_4_ = fVar228 * local_98._20_4_;
    auVar42._24_4_ = fVar255 * local_98._24_4_;
    auVar42._28_4_ = fVar373;
    auVar31 = vsubps_avx(auVar41,auVar42);
    local_d8 = local_98._0_4_ + local_d8;
    fStack_d4 = local_98._4_4_ + fStack_d4;
    fStack_d0 = local_98._8_4_ + fStack_d0;
    fStack_cc = local_98._12_4_ + fStack_cc;
    fStack_c8 = local_98._16_4_ + fStack_c8;
    fStack_c4 = local_98._20_4_ + fStack_c4;
    fStack_c0 = local_98._24_4_ + fStack_c0;
    fStack_bc = local_98._28_4_ + auVar26._28_4_;
    local_f8 = local_f8 + auVar221._0_4_;
    fStack_f4 = fStack_f4 + auVar221._4_4_;
    fStack_f0 = fStack_f0 + auVar221._8_4_;
    fStack_ec = fStack_ec + auVar221._12_4_;
    fStack_e8 = fStack_e8 + auVar221._16_4_;
    fStack_e4 = fStack_e4 + auVar221._20_4_;
    fStack_e0 = fStack_e0 + auVar221._24_4_;
    fStack_dc = fVar376 + auVar221._28_4_;
    auVar43._4_4_ = fVar230 * fStack_f4;
    auVar43._0_4_ = fVar202 * local_f8;
    auVar43._8_4_ = fVar167 * fStack_f0;
    auVar43._12_4_ = fVar223 * fStack_ec;
    auVar43._16_4_ = fVar201 * fStack_e8;
    auVar43._20_4_ = fVar203 * fStack_e4;
    auVar43._24_4_ = fVar224 * fStack_e0;
    auVar43._28_4_ = fVar376;
    auVar44._4_4_ = fVar226 * fStack_d4;
    auVar44._0_4_ = fVar250 * local_d8;
    auVar44._8_4_ = fVar225 * fStack_d0;
    auVar44._12_4_ = fVar252 * fStack_cc;
    auVar44._16_4_ = fVar132 * fStack_c8;
    auVar44._20_4_ = fVar228 * fStack_c4;
    auVar44._24_4_ = fVar255 * fStack_c0;
    auVar44._28_4_ = fVar376 + auVar221._28_4_;
    auVar26 = vsubps_avx(auVar43,auVar44);
    auVar45._4_4_ = fVar230 * (float)local_398._4_4_;
    auVar45._0_4_ = fVar202 * (float)local_398._0_4_;
    auVar45._8_4_ = fVar167 * fStack_390;
    auVar45._12_4_ = fVar223 * fStack_38c;
    auVar45._16_4_ = fVar201 * fStack_388;
    auVar45._20_4_ = fVar203 * fStack_384;
    auVar45._24_4_ = fVar224 * fStack_380;
    auVar45._28_4_ = fVar376;
    auVar46._4_4_ = fVar226 * (float)local_408._4_4_;
    auVar46._0_4_ = fVar250 * (float)local_408._0_4_;
    auVar46._8_4_ = fVar225 * fStack_400;
    auVar46._12_4_ = fVar252 * fStack_3fc;
    auVar46._16_4_ = fVar132 * fStack_3f8;
    auVar46._20_4_ = fVar228 * fStack_3f4;
    auVar46._24_4_ = fVar255 * fStack_3f0;
    auVar46._28_4_ = local_98._28_4_;
    auVar32 = vsubps_avx(auVar45,auVar46);
    auVar47._4_4_ = local_b8._4_4_ * fVar230;
    auVar47._0_4_ = local_b8._0_4_ * fVar202;
    auVar47._8_4_ = local_b8._8_4_ * fVar167;
    auVar47._12_4_ = local_b8._12_4_ * fVar223;
    auVar47._16_4_ = local_b8._16_4_ * fVar201;
    auVar47._20_4_ = local_b8._20_4_ * fVar203;
    auVar47._24_4_ = local_b8._24_4_ * fVar224;
    auVar47._28_4_ = fVar376;
    auVar48._4_4_ = local_308._4_4_ * fVar226;
    auVar48._0_4_ = local_308._0_4_ * fVar250;
    auVar48._8_4_ = local_308._8_4_ * fVar225;
    auVar48._12_4_ = local_308._12_4_ * fVar252;
    auVar48._16_4_ = local_308._16_4_ * fVar132;
    auVar48._20_4_ = local_308._20_4_ * fVar228;
    auVar48._24_4_ = local_308._24_4_ * fVar255;
    auVar48._28_4_ = local_b8._28_4_;
    auVar35 = vsubps_avx(auVar47,auVar48);
    auVar49._4_4_ = auVar330._4_4_ * fVar230;
    auVar49._0_4_ = auVar330._0_4_ * fVar202;
    auVar49._8_4_ = auVar330._8_4_ * fVar167;
    auVar49._12_4_ = auVar330._12_4_ * fVar223;
    auVar49._16_4_ = auVar330._16_4_ * fVar201;
    auVar49._20_4_ = auVar330._20_4_ * fVar203;
    auVar49._24_4_ = auVar330._24_4_ * fVar224;
    auVar49._28_4_ = fVar376;
    auVar50._4_4_ = fVar226 * auVar304._4_4_;
    auVar50._0_4_ = fVar250 * auVar304._0_4_;
    auVar50._8_4_ = fVar225 * auVar304._8_4_;
    auVar50._12_4_ = fVar252 * auVar304._12_4_;
    auVar50._16_4_ = fVar132 * auVar304._16_4_;
    auVar50._20_4_ = fVar228 * auVar304._20_4_;
    auVar50._24_4_ = fVar255 * auVar304._24_4_;
    auVar50._28_4_ = fStack_bc;
    auVar36 = vsubps_avx(auVar49,auVar50);
    local_118 = auVar304._0_4_ + local_118;
    fStack_114 = auVar304._4_4_ + fStack_114;
    fStack_110 = auVar304._8_4_ + fStack_110;
    fStack_10c = auVar304._12_4_ + fStack_10c;
    fStack_108 = auVar304._16_4_ + fStack_108;
    fStack_104 = auVar304._20_4_ + fStack_104;
    fStack_100 = auVar304._24_4_ + fStack_100;
    fStack_fc = auVar304._28_4_ + auVar25._28_4_;
    local_138 = auVar330._0_4_ + local_138;
    fStack_134 = auVar330._4_4_ + fStack_134;
    fStack_130 = auVar330._8_4_ + fStack_130;
    fStack_12c = auVar330._12_4_ + fStack_12c;
    fStack_128 = auVar330._16_4_ + fStack_128;
    fStack_124 = auVar330._20_4_ + fStack_124;
    fStack_120 = auVar330._24_4_ + fStack_120;
    fStack_11c = auVar330._28_4_ + auVar267._28_4_;
    auVar51._4_4_ = fVar230 * fStack_134;
    auVar51._0_4_ = fVar202 * local_138;
    auVar51._8_4_ = fVar167 * fStack_130;
    auVar51._12_4_ = fVar223 * fStack_12c;
    auVar51._16_4_ = fVar201 * fStack_128;
    auVar51._20_4_ = fVar203 * fStack_124;
    auVar51._24_4_ = fVar224 * fStack_120;
    auVar51._28_4_ = auVar330._28_4_ + auVar267._28_4_;
    auVar52._4_4_ = fStack_114 * fVar226;
    auVar52._0_4_ = local_118 * fVar250;
    auVar52._8_4_ = fStack_110 * fVar225;
    auVar52._12_4_ = fStack_10c * fVar252;
    auVar52._16_4_ = fStack_108 * fVar132;
    auVar52._20_4_ = fStack_104 * fVar228;
    auVar52._24_4_ = fStack_100 * fVar255;
    auVar52._28_4_ = fStack_fc;
    auVar123 = vsubps_avx(auVar51,auVar52);
    auVar53._4_4_ = fVar230 * local_448._4_4_;
    auVar53._0_4_ = fVar202 * local_448._0_4_;
    auVar53._8_4_ = fVar167 * local_448._8_4_;
    auVar53._12_4_ = fVar223 * local_448._12_4_;
    auVar53._16_4_ = fVar201 * local_448._16_4_;
    auVar53._20_4_ = fVar203 * local_448._20_4_;
    auVar53._24_4_ = fVar224 * local_448._24_4_;
    auVar53._28_4_ = fStack_fc;
    auVar54._4_4_ = fVar226 * (float)local_3b8._4_4_;
    auVar54._0_4_ = fVar250 * (float)local_3b8._0_4_;
    auVar54._8_4_ = fVar225 * fStack_3b0;
    auVar54._12_4_ = fVar252 * fStack_3ac;
    auVar54._16_4_ = fVar132 * fStack_3a8;
    auVar54._20_4_ = fVar228 * fStack_3a4;
    auVar54._24_4_ = fVar255 * fStack_3a0;
    auVar54._28_4_ = local_448._28_4_;
    auVar124 = vsubps_avx(auVar53,auVar54);
    auVar55._4_4_ = fVar230 * local_78._4_4_;
    auVar55._0_4_ = fVar202 * local_78._0_4_;
    auVar55._8_4_ = fVar167 * local_78._8_4_;
    auVar55._12_4_ = fVar223 * local_78._12_4_;
    auVar55._16_4_ = fVar201 * local_78._16_4_;
    auVar55._20_4_ = fVar203 * local_78._20_4_;
    auVar55._24_4_ = fVar224 * local_78._24_4_;
    auVar55._28_4_ = auVar28._28_4_ + auVar27._28_4_;
    auVar56._4_4_ = auVar29._4_4_ * fVar226;
    auVar56._0_4_ = auVar29._0_4_ * fVar250;
    auVar56._8_4_ = auVar29._8_4_ * fVar225;
    auVar56._12_4_ = auVar29._12_4_ * fVar252;
    auVar56._16_4_ = auVar29._16_4_ * fVar132;
    auVar56._20_4_ = auVar29._20_4_ * fVar228;
    auVar56._24_4_ = auVar29._24_4_ * fVar255;
    auVar56._28_4_ = auVar30._28_4_ + auVar122._28_4_;
    auVar30 = vsubps_avx(auVar55,auVar56);
    auVar25 = vminps_avx(auVar31,auVar26);
    auVar122 = vmaxps_avx(auVar31,auVar26);
    auVar26 = vminps_avx(auVar32,auVar35);
    auVar26 = vminps_avx(auVar25,auVar26);
    auVar25 = vmaxps_avx(auVar32,auVar35);
    auVar122 = vmaxps_avx(auVar122,auVar25);
    auVar27 = vminps_avx(auVar36,auVar123);
    auVar25 = vmaxps_avx(auVar36,auVar123);
    auVar28 = vminps_avx(auVar124,auVar30);
    auVar28 = vminps_avx(auVar27,auVar28);
    auVar28 = vminps_avx(auVar26,auVar28);
    auVar26 = vmaxps_avx(auVar124,auVar30);
    auVar25 = vmaxps_avx(auVar25,auVar26);
    auVar25 = vmaxps_avx(auVar122,auVar25);
    auVar122 = vcmpps_avx(auVar28,local_1b8,2);
    auVar25 = vcmpps_avx(auVar25,local_1d8,5);
    auVar122 = vandps_avx(auVar25,auVar122);
    auVar25 = local_158 & auVar122;
    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0x7f,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0xbf,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0')
    {
      auVar25 = vsubps_avx(_local_308,local_98);
      auVar26 = vsubps_avx(auVar29,auVar304);
      fVar230 = auVar25._0_4_ + auVar26._0_4_;
      fVar167 = auVar25._4_4_ + auVar26._4_4_;
      fVar223 = auVar25._8_4_ + auVar26._8_4_;
      fVar201 = auVar25._12_4_ + auVar26._12_4_;
      fVar203 = auVar25._16_4_ + auVar26._16_4_;
      fVar224 = auVar25._20_4_ + auVar26._20_4_;
      fVar250 = auVar25._24_4_ + auVar26._24_4_;
      auVar28 = vsubps_avx(local_b8,auVar221);
      auVar30 = vsubps_avx(local_78,auVar330);
      fVar226 = auVar28._0_4_ + auVar30._0_4_;
      fVar225 = auVar28._4_4_ + auVar30._4_4_;
      fVar252 = auVar28._8_4_ + auVar30._8_4_;
      fVar132 = auVar28._12_4_ + auVar30._12_4_;
      fVar228 = auVar28._16_4_ + auVar30._16_4_;
      fVar255 = auVar28._20_4_ + auVar30._20_4_;
      fVar229 = auVar28._24_4_ + auVar30._24_4_;
      fVar202 = auVar30._28_4_;
      auVar57._4_4_ = auVar221._4_4_ * fVar167;
      auVar57._0_4_ = auVar221._0_4_ * fVar230;
      auVar57._8_4_ = auVar221._8_4_ * fVar223;
      auVar57._12_4_ = auVar221._12_4_ * fVar201;
      auVar57._16_4_ = auVar221._16_4_ * fVar203;
      auVar57._20_4_ = auVar221._20_4_ * fVar224;
      auVar57._24_4_ = auVar221._24_4_ * fVar250;
      auVar57._28_4_ = auVar221._28_4_;
      auVar58._4_4_ = local_98._4_4_ * fVar225;
      auVar58._0_4_ = local_98._0_4_ * fVar226;
      auVar58._8_4_ = local_98._8_4_ * fVar252;
      auVar58._12_4_ = local_98._12_4_ * fVar132;
      auVar58._16_4_ = local_98._16_4_ * fVar228;
      auVar58._20_4_ = local_98._20_4_ * fVar255;
      auVar58._24_4_ = local_98._24_4_ * fVar229;
      auVar58._28_4_ = local_98._28_4_;
      auVar30 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = fVar167 * fStack_f4;
      auVar59._0_4_ = fVar230 * local_f8;
      auVar59._8_4_ = fVar223 * fStack_f0;
      auVar59._12_4_ = fVar201 * fStack_ec;
      auVar59._16_4_ = fVar203 * fStack_e8;
      auVar59._20_4_ = fVar224 * fStack_e4;
      auVar59._24_4_ = fVar250 * fStack_e0;
      auVar59._28_4_ = auVar221._28_4_;
      auVar60._4_4_ = fVar225 * fStack_d4;
      auVar60._0_4_ = fVar226 * local_d8;
      auVar60._8_4_ = fVar252 * fStack_d0;
      auVar60._12_4_ = fVar132 * fStack_cc;
      auVar60._16_4_ = fVar228 * fStack_c8;
      auVar60._20_4_ = fVar255 * fStack_c4;
      auVar60._24_4_ = fVar229 * fStack_c0;
      auVar60._28_4_ = fVar202;
      auVar31 = vsubps_avx(auVar59,auVar60);
      auVar61._4_4_ = fVar167 * (float)local_398._4_4_;
      auVar61._0_4_ = fVar230 * (float)local_398._0_4_;
      auVar61._8_4_ = fVar223 * fStack_390;
      auVar61._12_4_ = fVar201 * fStack_38c;
      auVar61._16_4_ = fVar203 * fStack_388;
      auVar61._20_4_ = fVar224 * fStack_384;
      auVar61._24_4_ = fVar250 * fStack_380;
      auVar61._28_4_ = fVar202;
      auVar62._4_4_ = fVar225 * (float)local_408._4_4_;
      auVar62._0_4_ = fVar226 * (float)local_408._0_4_;
      auVar62._8_4_ = fVar252 * fStack_400;
      auVar62._12_4_ = fVar132 * fStack_3fc;
      auVar62._16_4_ = fVar228 * fStack_3f8;
      auVar62._20_4_ = fVar255 * fStack_3f4;
      auVar62._24_4_ = fVar229 * fStack_3f0;
      auVar62._28_4_ = auVar27._28_4_;
      auVar32 = vsubps_avx(auVar61,auVar62);
      auVar63._4_4_ = local_b8._4_4_ * fVar167;
      auVar63._0_4_ = local_b8._0_4_ * fVar230;
      auVar63._8_4_ = local_b8._8_4_ * fVar223;
      auVar63._12_4_ = local_b8._12_4_ * fVar201;
      auVar63._16_4_ = local_b8._16_4_ * fVar203;
      auVar63._20_4_ = local_b8._20_4_ * fVar224;
      auVar63._24_4_ = local_b8._24_4_ * fVar250;
      auVar63._28_4_ = auVar27._28_4_;
      auVar64._4_4_ = local_308._4_4_ * fVar225;
      auVar64._0_4_ = local_308._0_4_ * fVar226;
      auVar64._8_4_ = local_308._8_4_ * fVar252;
      auVar64._12_4_ = local_308._12_4_ * fVar132;
      auVar64._16_4_ = local_308._16_4_ * fVar228;
      auVar64._20_4_ = local_308._20_4_ * fVar255;
      uVar3 = local_308._28_4_;
      auVar64._24_4_ = local_308._24_4_ * fVar229;
      auVar64._28_4_ = uVar3;
      auVar35 = vsubps_avx(auVar63,auVar64);
      auVar65._4_4_ = auVar330._4_4_ * fVar167;
      auVar65._0_4_ = auVar330._0_4_ * fVar230;
      auVar65._8_4_ = auVar330._8_4_ * fVar223;
      auVar65._12_4_ = auVar330._12_4_ * fVar201;
      auVar65._16_4_ = auVar330._16_4_ * fVar203;
      auVar65._20_4_ = auVar330._20_4_ * fVar224;
      auVar65._24_4_ = auVar330._24_4_ * fVar250;
      auVar65._28_4_ = uVar3;
      auVar66._4_4_ = auVar304._4_4_ * fVar225;
      auVar66._0_4_ = auVar304._0_4_ * fVar226;
      auVar66._8_4_ = auVar304._8_4_ * fVar252;
      auVar66._12_4_ = auVar304._12_4_ * fVar132;
      auVar66._16_4_ = auVar304._16_4_ * fVar228;
      auVar66._20_4_ = auVar304._20_4_ * fVar255;
      auVar66._24_4_ = auVar304._24_4_ * fVar229;
      auVar66._28_4_ = auVar304._28_4_;
      auVar36 = vsubps_avx(auVar65,auVar66);
      auVar67._4_4_ = fVar167 * fStack_134;
      auVar67._0_4_ = fVar230 * local_138;
      auVar67._8_4_ = fVar223 * fStack_130;
      auVar67._12_4_ = fVar201 * fStack_12c;
      auVar67._16_4_ = fVar203 * fStack_128;
      auVar67._20_4_ = fVar224 * fStack_124;
      auVar67._24_4_ = fVar250 * fStack_120;
      auVar67._28_4_ = uVar3;
      auVar68._4_4_ = fVar225 * fStack_114;
      auVar68._0_4_ = fVar226 * local_118;
      auVar68._8_4_ = fVar252 * fStack_110;
      auVar68._12_4_ = fVar132 * fStack_10c;
      auVar68._16_4_ = fVar228 * fStack_108;
      auVar68._20_4_ = fVar255 * fStack_104;
      auVar68._24_4_ = fVar229 * fStack_100;
      auVar68._28_4_ = auVar330._28_4_;
      auVar123 = vsubps_avx(auVar67,auVar68);
      auVar69._4_4_ = fVar167 * local_448._4_4_;
      auVar69._0_4_ = fVar230 * local_448._0_4_;
      auVar69._8_4_ = fVar223 * local_448._8_4_;
      auVar69._12_4_ = fVar201 * local_448._12_4_;
      auVar69._16_4_ = fVar203 * local_448._16_4_;
      auVar69._20_4_ = fVar224 * local_448._20_4_;
      auVar69._24_4_ = fVar250 * local_448._24_4_;
      auVar69._28_4_ = auVar330._28_4_;
      auVar70._4_4_ = (float)local_3b8._4_4_ * fVar225;
      auVar70._0_4_ = (float)local_3b8._0_4_ * fVar226;
      auVar70._8_4_ = fStack_3b0 * fVar252;
      auVar70._12_4_ = fStack_3ac * fVar132;
      auVar70._16_4_ = fStack_3a8 * fVar228;
      auVar70._20_4_ = fStack_3a4 * fVar255;
      auVar70._24_4_ = fStack_3a0 * fVar229;
      auVar70._28_4_ = local_b8._28_4_;
      auVar124 = vsubps_avx(auVar69,auVar70);
      auVar71._4_4_ = local_78._4_4_ * fVar167;
      auVar71._0_4_ = local_78._0_4_ * fVar230;
      auVar71._8_4_ = local_78._8_4_ * fVar223;
      auVar71._12_4_ = local_78._12_4_ * fVar201;
      auVar71._16_4_ = local_78._16_4_ * fVar203;
      auVar71._20_4_ = local_78._20_4_ * fVar224;
      auVar71._24_4_ = local_78._24_4_ * fVar250;
      auVar71._28_4_ = auVar25._28_4_ + auVar26._28_4_;
      auVar72._4_4_ = auVar29._4_4_ * fVar225;
      auVar72._0_4_ = auVar29._0_4_ * fVar226;
      auVar72._8_4_ = auVar29._8_4_ * fVar252;
      auVar72._12_4_ = auVar29._12_4_ * fVar132;
      auVar72._16_4_ = auVar29._16_4_ * fVar228;
      auVar72._20_4_ = auVar29._20_4_ * fVar255;
      auVar72._24_4_ = auVar29._24_4_ * fVar229;
      auVar72._28_4_ = auVar28._28_4_ + fVar202;
      auVar162 = vsubps_avx(auVar71,auVar72);
      auVar26 = vminps_avx(auVar30,auVar31);
      auVar25 = vmaxps_avx(auVar30,auVar31);
      auVar27 = vminps_avx(auVar32,auVar35);
      auVar27 = vminps_avx(auVar26,auVar27);
      auVar26 = vmaxps_avx(auVar32,auVar35);
      auVar25 = vmaxps_avx(auVar25,auVar26);
      auVar28 = vminps_avx(auVar36,auVar123);
      auVar26 = vmaxps_avx(auVar36,auVar123);
      auVar29 = vminps_avx(auVar124,auVar162);
      auVar28 = vminps_avx(auVar28,auVar29);
      auVar28 = vminps_avx(auVar27,auVar28);
      auVar27 = vmaxps_avx(auVar124,auVar162);
      auVar26 = vmaxps_avx(auVar26,auVar27);
      auVar26 = vmaxps_avx(auVar25,auVar26);
      auVar25 = vcmpps_avx(auVar28,local_1b8,2);
      auVar26 = vcmpps_avx(auVar26,local_1d8,5);
      auVar25 = vandps_avx(auVar26,auVar25);
      auVar122 = vandps_avx(local_158,auVar122);
      auVar26 = auVar122 & auVar25;
      if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar26 >> 0x7f,0) != '\0') ||
            (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0xbf,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar26[0x1f] < '\0') {
        auVar122 = vandps_avx(auVar25,auVar122);
        uVar89 = vmovmskps_avx(auVar122);
        if (uVar89 != 0) {
          uVar87 = (ulong)uVar85;
          auStack_298[uVar87] = uVar89 & 0xff;
          uVar4 = vmovlps_avx(auVar392);
          *(undefined8 *)(afStack_198 + uVar87 * 2) = uVar4;
          uVar86 = vmovlps_avx(auVar362);
          auStack_58[uVar87] = uVar86;
          uVar85 = uVar85 + 1;
        }
      }
    }
    _local_3b8 = auVar160;
    _local_398 = auVar161;
    if (uVar85 != 0) {
      do {
        auVar357 = ZEXT1664(local_488);
        auVar345 = ZEXT1664(local_478);
        auVar331 = ZEXT1664(local_468);
        uVar87 = (ulong)(uVar85 - 1);
        uVar89 = auStack_298[uVar87];
        fVar202 = afStack_198[uVar87 * 2];
        fVar230 = afStack_198[uVar87 * 2 + 1];
        auVar363._8_8_ = 0;
        auVar363._0_8_ = auStack_58[uVar87];
        auVar369 = ZEXT1664(auVar363);
        uVar86 = 0;
        if (uVar89 != 0) {
          for (; (uVar89 >> uVar86 & 1) == 0; uVar86 = uVar86 + 1) {
          }
        }
        uVar89 = uVar89 - 1 & uVar89;
        auStack_298[uVar87] = uVar89;
        if (uVar89 == 0) {
          uVar85 = uVar85 - 1;
        }
        auVar285 = ZEXT1664(local_318);
        fVar223 = (float)(uVar86 + 1) * 0.14285715;
        fVar167 = (1.0 - (float)uVar86 * 0.14285715) * fVar202 +
                  fVar230 * (float)uVar86 * 0.14285715;
        fVar202 = (1.0 - fVar223) * fVar202 + fVar230 * fVar223;
        fVar230 = fVar202 - fVar167;
        auVar174 = ZEXT416((uint)fVar202);
        if (0.16666667 <= fVar230) {
          auVar174 = vinsertps_avx(ZEXT416((uint)fVar167),auVar174,0x10);
          auVar395 = ZEXT1664(auVar174);
          auVar380 = ZEXT1664(local_458);
          auVar268 = ZEXT1664(_local_328);
          auVar222 = ZEXT1664(_local_338);
          goto LAB_011c2bd9;
        }
        auVar110 = vshufps_avx(auVar363,auVar363,0x50);
        auVar140._8_4_ = 0x3f800000;
        auVar140._0_8_ = 0x3f8000003f800000;
        auVar140._12_4_ = 0x3f800000;
        auVar33 = vsubps_avx(auVar140,auVar110);
        fVar223 = auVar110._0_4_;
        fVar201 = auVar110._4_4_;
        fVar203 = auVar110._8_4_;
        fVar224 = auVar110._12_4_;
        fVar250 = auVar33._0_4_;
        fVar226 = auVar33._4_4_;
        fVar225 = auVar33._8_4_;
        fVar252 = auVar33._12_4_;
        auVar179._0_4_ = fVar223 * (float)local_328._0_4_ + fVar250 * local_318._0_4_;
        auVar179._4_4_ = fVar201 * (float)local_328._4_4_ + fVar226 * local_318._4_4_;
        auVar179._8_4_ = fVar203 * fStack_320 + fVar225 * local_318._8_4_;
        auVar179._12_4_ = fVar224 * fStack_31c + fVar252 * local_318._12_4_;
        auVar237._0_4_ = fVar223 * (float)local_338._0_4_ + fVar250 * fVar227;
        auVar237._4_4_ = fVar201 * (float)local_338._4_4_ + fVar226 * fVar254;
        auVar237._8_4_ = fVar203 * fStack_330 + fVar225 * fVar227;
        auVar237._12_4_ = fVar224 * fStack_32c + fVar252 * fVar254;
        auVar259._0_4_ = local_478._0_4_ * fVar223 + local_458._0_4_ * fVar250;
        auVar259._4_4_ = local_478._4_4_ * fVar201 + local_458._4_4_ * fVar226;
        auVar259._8_4_ = local_478._8_4_ * fVar203 + local_458._8_4_ * fVar225;
        auVar259._12_4_ = local_478._12_4_ * fVar224 + local_458._12_4_ * fVar252;
        auVar107._0_4_ = local_488._0_4_ * fVar223 + local_468._0_4_ * fVar250;
        auVar107._4_4_ = local_488._4_4_ * fVar201 + local_468._4_4_ * fVar226;
        auVar107._8_4_ = local_488._8_4_ * fVar203 + local_468._8_4_ * fVar225;
        auVar107._12_4_ = local_488._12_4_ * fVar224 + local_468._12_4_ * fVar252;
        auVar164._16_16_ = auVar179;
        auVar164._0_16_ = auVar179;
        auVar199._16_16_ = auVar237;
        auVar199._0_16_ = auVar237;
        auVar248._16_16_ = auVar259;
        auVar248._0_16_ = auVar259;
        _local_408 = ZEXT432((uint)fVar167);
        _local_398 = auVar174;
        auVar122 = ZEXT2032(CONCAT416(fVar202,ZEXT416((uint)fVar167)));
        auVar122 = vshufps_avx(auVar122,auVar122,0);
        auVar25 = vsubps_avx(auVar199,auVar164);
        fVar223 = auVar122._0_4_;
        fVar201 = auVar122._4_4_;
        fVar203 = auVar122._8_4_;
        fVar224 = auVar122._12_4_;
        fVar250 = auVar122._16_4_;
        fVar226 = auVar122._20_4_;
        fVar225 = auVar122._24_4_;
        auVar165._0_4_ = auVar179._0_4_ + auVar25._0_4_ * fVar223;
        auVar165._4_4_ = auVar179._4_4_ + auVar25._4_4_ * fVar201;
        auVar165._8_4_ = auVar179._8_4_ + auVar25._8_4_ * fVar203;
        auVar165._12_4_ = auVar179._12_4_ + auVar25._12_4_ * fVar224;
        auVar165._16_4_ = auVar179._0_4_ + auVar25._16_4_ * fVar250;
        auVar165._20_4_ = auVar179._4_4_ + auVar25._20_4_ * fVar226;
        auVar165._24_4_ = auVar179._8_4_ + auVar25._24_4_ * fVar225;
        auVar165._28_4_ = auVar179._12_4_ + auVar25._28_4_;
        auVar122 = vsubps_avx(auVar248,auVar199);
        auVar200._0_4_ = auVar237._0_4_ + auVar122._0_4_ * fVar223;
        auVar200._4_4_ = auVar237._4_4_ + auVar122._4_4_ * fVar201;
        auVar200._8_4_ = auVar237._8_4_ + auVar122._8_4_ * fVar203;
        auVar200._12_4_ = auVar237._12_4_ + auVar122._12_4_ * fVar224;
        auVar200._16_4_ = auVar237._0_4_ + auVar122._16_4_ * fVar250;
        auVar200._20_4_ = auVar237._4_4_ + auVar122._20_4_ * fVar226;
        auVar200._24_4_ = auVar237._8_4_ + auVar122._24_4_ * fVar225;
        auVar200._28_4_ = auVar237._12_4_ + auVar122._28_4_;
        auVar110 = vsubps_avx(auVar107,auVar259);
        auVar129._0_4_ = auVar259._0_4_ + auVar110._0_4_ * fVar223;
        auVar129._4_4_ = auVar259._4_4_ + auVar110._4_4_ * fVar201;
        auVar129._8_4_ = auVar259._8_4_ + auVar110._8_4_ * fVar203;
        auVar129._12_4_ = auVar259._12_4_ + auVar110._12_4_ * fVar224;
        auVar129._16_4_ = auVar259._0_4_ + auVar110._0_4_ * fVar250;
        auVar129._20_4_ = auVar259._4_4_ + auVar110._4_4_ * fVar226;
        auVar129._24_4_ = auVar259._8_4_ + auVar110._8_4_ * fVar225;
        auVar129._28_4_ = auVar259._12_4_ + auVar110._12_4_;
        auVar122 = vsubps_avx(auVar200,auVar165);
        auVar166._0_4_ = auVar165._0_4_ + fVar223 * auVar122._0_4_;
        auVar166._4_4_ = auVar165._4_4_ + fVar201 * auVar122._4_4_;
        auVar166._8_4_ = auVar165._8_4_ + fVar203 * auVar122._8_4_;
        auVar166._12_4_ = auVar165._12_4_ + fVar224 * auVar122._12_4_;
        auVar166._16_4_ = auVar165._16_4_ + fVar250 * auVar122._16_4_;
        auVar166._20_4_ = auVar165._20_4_ + fVar226 * auVar122._20_4_;
        auVar166._24_4_ = auVar165._24_4_ + fVar225 * auVar122._24_4_;
        auVar166._28_4_ = auVar165._28_4_ + auVar122._28_4_;
        auVar122 = vsubps_avx(auVar129,auVar200);
        auVar130._0_4_ = auVar200._0_4_ + fVar223 * auVar122._0_4_;
        auVar130._4_4_ = auVar200._4_4_ + fVar201 * auVar122._4_4_;
        auVar130._8_4_ = auVar200._8_4_ + fVar203 * auVar122._8_4_;
        auVar130._12_4_ = auVar200._12_4_ + fVar224 * auVar122._12_4_;
        auVar130._16_4_ = auVar200._16_4_ + fVar250 * auVar122._16_4_;
        auVar130._20_4_ = auVar200._20_4_ + fVar226 * auVar122._20_4_;
        auVar130._24_4_ = auVar200._24_4_ + fVar225 * auVar122._24_4_;
        auVar130._28_4_ = auVar200._28_4_ + auVar122._28_4_;
        auVar122 = vsubps_avx(auVar130,auVar166);
        auVar282._0_4_ = auVar166._0_4_ + fVar223 * auVar122._0_4_;
        auVar282._4_4_ = auVar166._4_4_ + fVar201 * auVar122._4_4_;
        auVar282._8_4_ = auVar166._8_4_ + fVar203 * auVar122._8_4_;
        auVar282._12_4_ = auVar166._12_4_ + fVar224 * auVar122._12_4_;
        auVar284._16_4_ = auVar166._16_4_ + fVar250 * auVar122._16_4_;
        auVar284._0_16_ = auVar282;
        auVar284._20_4_ = auVar166._20_4_ + fVar226 * auVar122._20_4_;
        auVar284._24_4_ = auVar166._24_4_ + fVar225 * auVar122._24_4_;
        auVar284._28_4_ = auVar166._28_4_ + auVar200._28_4_;
        auVar289 = auVar284._16_16_;
        auVar142 = vshufps_avx(ZEXT416((uint)(fVar230 * 0.33333334)),
                               ZEXT416((uint)(fVar230 * 0.33333334)),0);
        auVar238._0_4_ = auVar282._0_4_ + auVar142._0_4_ * auVar122._0_4_ * 3.0;
        auVar238._4_4_ = auVar282._4_4_ + auVar142._4_4_ * auVar122._4_4_ * 3.0;
        auVar238._8_4_ = auVar282._8_4_ + auVar142._8_4_ * auVar122._8_4_ * 3.0;
        auVar238._12_4_ = auVar282._12_4_ + auVar142._12_4_ * auVar122._12_4_ * 3.0;
        auVar154 = vshufpd_avx(auVar282,auVar282,3);
        auVar119 = vshufpd_avx(auVar289,auVar289,3);
        _local_308 = auVar154;
        auVar110 = vsubps_avx(auVar154,auVar282);
        _local_448 = auVar119;
        auVar33 = vsubps_avx(auVar119,auVar289);
        auVar108._0_4_ = auVar110._0_4_ + auVar33._0_4_;
        auVar108._4_4_ = auVar110._4_4_ + auVar33._4_4_;
        auVar108._8_4_ = auVar110._8_4_ + auVar33._8_4_;
        auVar108._12_4_ = auVar110._12_4_ + auVar33._12_4_;
        auVar110 = vmovshdup_avx(auVar282);
        auVar33 = vmovshdup_avx(auVar238);
        auVar181 = vshufps_avx(auVar108,auVar108,0);
        auVar143 = vshufps_avx(auVar108,auVar108,0x55);
        fVar223 = auVar143._0_4_;
        fVar201 = auVar143._4_4_;
        fVar203 = auVar143._8_4_;
        fVar224 = auVar143._12_4_;
        fVar250 = auVar181._0_4_;
        fVar226 = auVar181._4_4_;
        fVar225 = auVar181._8_4_;
        fVar252 = auVar181._12_4_;
        auVar109._0_4_ = fVar250 * auVar282._0_4_ + auVar110._0_4_ * fVar223;
        auVar109._4_4_ = fVar226 * auVar282._4_4_ + auVar110._4_4_ * fVar201;
        auVar109._8_4_ = fVar225 * auVar282._8_4_ + auVar110._8_4_ * fVar203;
        auVar109._12_4_ = fVar252 * auVar282._12_4_ + auVar110._12_4_ * fVar224;
        _local_3b8 = auVar238;
        auVar347._0_4_ = fVar250 * auVar238._0_4_ + auVar33._0_4_ * fVar223;
        auVar347._4_4_ = fVar226 * auVar238._4_4_ + auVar33._4_4_ * fVar201;
        auVar347._8_4_ = fVar225 * auVar238._8_4_ + auVar33._8_4_ * fVar203;
        auVar347._12_4_ = fVar252 * auVar238._12_4_ + auVar33._12_4_ * fVar224;
        auVar33 = vshufps_avx(auVar109,auVar109,0xe8);
        auVar181 = vshufps_avx(auVar347,auVar347,0xe8);
        auVar110 = vcmpps_avx(auVar33,auVar181,1);
        uVar89 = vextractps_avx(auVar110,0);
        auVar143 = auVar347;
        if ((uVar89 & 1) == 0) {
          auVar143 = auVar109;
        }
        auVar141._0_4_ = auVar142._0_4_ * auVar122._16_4_ * 3.0;
        auVar141._4_4_ = auVar142._4_4_ * auVar122._20_4_ * 3.0;
        auVar141._8_4_ = auVar142._8_4_ * auVar122._24_4_ * 3.0;
        auVar141._12_4_ = auVar142._12_4_ * 0.0;
        auVar362 = vsubps_avx(auVar289,auVar141);
        auVar142 = vmovshdup_avx(auVar362);
        auVar289 = vmovshdup_avx(auVar289);
        fVar132 = auVar362._0_4_;
        fVar228 = auVar362._4_4_;
        auVar260._0_4_ = fVar132 * fVar250 + auVar142._0_4_ * fVar223;
        auVar260._4_4_ = fVar228 * fVar226 + auVar142._4_4_ * fVar201;
        auVar260._8_4_ = auVar362._8_4_ * fVar225 + auVar142._8_4_ * fVar203;
        auVar260._12_4_ = auVar362._12_4_ * fVar252 + auVar142._12_4_ * fVar224;
        auVar393._0_4_ = fVar250 * auVar284._16_4_ + auVar289._0_4_ * fVar223;
        auVar393._4_4_ = fVar226 * auVar284._20_4_ + auVar289._4_4_ * fVar201;
        auVar393._8_4_ = fVar225 * auVar284._24_4_ + auVar289._8_4_ * fVar203;
        auVar393._12_4_ = fVar252 * auVar284._28_4_ + auVar289._12_4_ * fVar224;
        auVar289 = vshufps_avx(auVar260,auVar260,0xe8);
        auVar6 = vshufps_avx(auVar393,auVar393,0xe8);
        auVar142 = vcmpps_avx(auVar289,auVar6,1);
        uVar89 = vextractps_avx(auVar142,0);
        auVar392 = auVar393;
        if ((uVar89 & 1) == 0) {
          auVar392 = auVar260;
        }
        auVar143 = vmaxss_avx(auVar392,auVar143);
        auVar33 = vminps_avx(auVar33,auVar181);
        auVar181 = vminps_avx(auVar289,auVar6);
        auVar181 = vminps_avx(auVar33,auVar181);
        auVar110 = vshufps_avx(auVar110,auVar110,0x55);
        auVar110 = vblendps_avx(auVar110,auVar142,2);
        auVar142 = vpslld_avx(auVar110,0x1f);
        auVar110 = vshufpd_avx(auVar347,auVar347,1);
        auVar110 = vinsertps_avx(auVar110,auVar393,0x9c);
        auVar33 = vshufpd_avx(auVar109,auVar109,1);
        auVar33 = vinsertps_avx(auVar33,auVar260,0x9c);
        auVar110 = vblendvps_avx(auVar33,auVar110,auVar142);
        auVar33 = vmovshdup_avx(auVar110);
        auVar110 = vmaxss_avx(auVar33,auVar110);
        fVar203 = auVar181._0_4_;
        auVar33 = vmovshdup_avx(auVar181);
        fVar201 = auVar110._0_4_;
        fVar224 = auVar33._0_4_;
        fVar223 = auVar143._0_4_;
        if ((0.0001 <= fVar203) || (fVar201 <= -0.0001)) {
          if ((fVar224 < 0.0001 && -0.0001 < fVar223) || (fVar203 < 0.0001 && -0.0001 < fVar223))
          goto LAB_011c35e6;
          auVar142 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar110,1);
          auVar33 = vcmpps_avx(auVar33,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar33 = vandps_avx(auVar33,auVar142);
          if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) goto LAB_011c35e6;
        }
        else {
LAB_011c35e6:
          auVar142 = vcmpps_avx(auVar181,_DAT_01f7aa10,1);
          auVar33 = vcmpss_avx(auVar143,ZEXT416(0) << 0x20,1);
          auVar180._8_4_ = 0x3f800000;
          auVar180._0_8_ = 0x3f8000003f800000;
          auVar180._12_4_ = 0x3f800000;
          auVar239._8_4_ = 0xbf800000;
          auVar239._0_8_ = 0xbf800000bf800000;
          auVar239._12_4_ = 0xbf800000;
          auVar33 = vblendvps_avx(auVar180,auVar239,auVar33);
          auVar142 = vblendvps_avx(auVar180,auVar239,auVar142);
          auVar181 = vcmpss_avx(auVar142,auVar33,4);
          auVar181 = vpshufd_avx(ZEXT416(auVar181._0_4_ & 1),0x50);
          auVar181 = vpslld_avx(auVar181,0x1f);
          auVar181 = vpsrad_avx(auVar181,0x1f);
          auVar181 = vpandn_avx(auVar181,_DAT_01fafeb0);
          auVar143 = vmovshdup_avx(auVar142);
          fVar250 = auVar143._0_4_;
          if ((auVar142._0_4_ != fVar250) || (NAN(auVar142._0_4_) || NAN(fVar250))) {
            if ((fVar224 != fVar203) || (NAN(fVar224) || NAN(fVar203))) {
              fVar203 = -fVar203 / (fVar224 - fVar203);
              auVar142 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar203) * 0.0 + fVar203)));
            }
            else {
              auVar142 = ZEXT816(0x3f80000000000000);
              if ((fVar203 != 0.0) || (NAN(fVar203))) {
                auVar142 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar289 = vcmpps_avx(auVar181,auVar142,1);
            auVar143 = vblendps_avx(auVar181,auVar142,2);
            auVar142 = vblendps_avx(auVar142,auVar181,2);
            auVar181 = vblendvps_avx(auVar142,auVar143,auVar289);
          }
          auVar110 = vcmpss_avx(auVar110,ZEXT416(0) << 0x20,1);
          auVar182._8_4_ = 0x3f800000;
          auVar182._0_8_ = 0x3f8000003f800000;
          auVar182._12_4_ = 0x3f800000;
          auVar240._8_4_ = 0xbf800000;
          auVar240._0_8_ = 0xbf800000bf800000;
          auVar240._12_4_ = 0xbf800000;
          auVar110 = vblendvps_avx(auVar182,auVar240,auVar110);
          fVar203 = auVar110._0_4_;
          if ((auVar33._0_4_ != fVar203) || (NAN(auVar33._0_4_) || NAN(fVar203))) {
            if ((fVar201 != fVar223) || (NAN(fVar201) || NAN(fVar223))) {
              fVar223 = -fVar223 / (fVar201 - fVar223);
              auVar110 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar223) * 0.0 + fVar223)));
            }
            else {
              auVar110 = ZEXT816(0x3f80000000000000);
              if ((fVar223 != 0.0) || (NAN(fVar223))) {
                auVar110 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar142 = vcmpps_avx(auVar181,auVar110,1);
            auVar33 = vblendps_avx(auVar181,auVar110,2);
            auVar110 = vblendps_avx(auVar110,auVar181,2);
            auVar181 = vblendvps_avx(auVar110,auVar33,auVar142);
          }
          if ((fVar250 != fVar203) || (NAN(fVar250) || NAN(fVar203))) {
            auVar111._8_4_ = 0x3f800000;
            auVar111._0_8_ = 0x3f8000003f800000;
            auVar111._12_4_ = 0x3f800000;
            auVar110 = vcmpps_avx(auVar181,auVar111,1);
            auVar33 = vinsertps_avx(auVar181,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar183._4_12_ = auVar181._4_12_;
            auVar183._0_4_ = 0x3f800000;
            auVar181 = vblendvps_avx(auVar183,auVar33,auVar110);
          }
          auVar110 = vcmpps_avx(auVar181,_DAT_01f7b6f0,1);
          auVar74._12_4_ = 0;
          auVar74._0_12_ = auVar181._4_12_;
          auVar33 = vinsertps_avx(auVar181,ZEXT416(0x3f800000),0x10);
          auVar110 = vblendvps_avx(auVar33,auVar74 << 0x20,auVar110);
          auVar33 = vmovshdup_avx(auVar110);
          if (auVar110._0_4_ <= auVar33._0_4_) {
            auVar112._0_4_ = auVar110._0_4_ + -0.1;
            auVar112._4_4_ = auVar110._4_4_ + 0.1;
            auVar112._8_4_ = auVar110._8_4_ + 0.0;
            auVar112._12_4_ = auVar110._12_4_ + 0.0;
            auVar142 = vshufpd_avx(auVar238,auVar238,3);
            register0x00001388 = 0x3f80000000000000;
            local_3b8 = 0x3f80000000000000;
            auVar110 = vcmpps_avx(auVar112,_local_3b8,1);
            auVar73._12_4_ = 0;
            auVar73._0_12_ = auVar112._4_12_;
            auVar33 = vinsertps_avx(auVar112,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar110 = vblendvps_avx(auVar33,auVar73 << 0x20,auVar110);
            auVar33 = vshufpd_avx(auVar362,auVar362,3);
            auVar181 = vshufps_avx(auVar110,auVar110,0x50);
            auVar385._8_4_ = 0x3f800000;
            auVar385._0_8_ = 0x3f8000003f800000;
            auVar385._12_4_ = 0x3f800000;
            auVar143 = vsubps_avx(auVar385,auVar181);
            local_308._0_4_ = auVar154._0_4_;
            local_308._4_4_ = auVar154._4_4_;
            fStack_300 = auVar154._8_4_;
            fStack_2fc = auVar154._12_4_;
            fVar223 = auVar181._0_4_;
            fVar201 = auVar181._4_4_;
            fVar203 = auVar181._8_4_;
            fVar224 = auVar181._12_4_;
            local_448._0_4_ = auVar119._0_4_;
            local_448._4_4_ = auVar119._4_4_;
            fStack_440 = auVar119._8_4_;
            fStack_43c = auVar119._12_4_;
            fVar250 = auVar143._0_4_;
            fVar226 = auVar143._4_4_;
            fVar225 = auVar143._8_4_;
            fVar252 = auVar143._12_4_;
            auVar113._0_4_ = fVar223 * (float)local_308._0_4_ + fVar250 * auVar282._0_4_;
            auVar113._4_4_ = fVar201 * (float)local_308._4_4_ + fVar226 * auVar282._4_4_;
            auVar113._8_4_ = fVar203 * fStack_300 + fVar225 * auVar282._0_4_;
            auVar113._12_4_ = fVar224 * fStack_2fc + fVar252 * auVar282._4_4_;
            auVar261._0_4_ = auVar142._0_4_ * fVar223 + fVar250 * auVar238._0_4_;
            auVar261._4_4_ = auVar142._4_4_ * fVar201 + fVar226 * auVar238._4_4_;
            auVar261._8_4_ = auVar142._8_4_ * fVar203 + fVar225 * auVar238._0_4_;
            auVar261._12_4_ = auVar142._12_4_ * fVar224 + fVar252 * auVar238._4_4_;
            auVar297._0_4_ = auVar33._0_4_ * fVar223 + fVar250 * fVar132;
            auVar297._4_4_ = auVar33._4_4_ * fVar201 + fVar226 * fVar228;
            auVar297._8_4_ = auVar33._8_4_ * fVar203 + fVar225 * fVar132;
            auVar297._12_4_ = auVar33._12_4_ * fVar224 + fVar252 * fVar228;
            auVar337._0_4_ = fVar223 * (float)local_448._0_4_ + fVar250 * auVar284._16_4_;
            auVar337._4_4_ = fVar201 * (float)local_448._4_4_ + fVar226 * auVar284._20_4_;
            auVar337._8_4_ = fVar203 * fStack_440 + fVar225 * auVar284._16_4_;
            auVar337._12_4_ = fVar224 * fStack_43c + fVar252 * auVar284._20_4_;
            auVar119 = vsubps_avx(auVar385,auVar110);
            auVar33 = vmovshdup_avx(auVar363);
            auVar154 = vmovsldup_avx(auVar363);
            auVar394._0_4_ = auVar119._0_4_ * auVar154._0_4_ + auVar110._0_4_ * auVar33._0_4_;
            auVar394._4_4_ = auVar119._4_4_ * auVar154._4_4_ + auVar110._4_4_ * auVar33._4_4_;
            auVar394._8_4_ = auVar119._8_4_ * auVar154._8_4_ + auVar110._8_4_ * auVar33._8_4_;
            auVar394._12_4_ = auVar119._12_4_ * auVar154._12_4_ + auVar110._12_4_ * auVar33._12_4_;
            _local_448 = vmovshdup_avx(auVar394);
            auVar110 = vsubps_avx(auVar261,auVar113);
            auVar184._0_4_ = auVar110._0_4_ * 3.0;
            auVar184._4_4_ = auVar110._4_4_ * 3.0;
            auVar184._8_4_ = auVar110._8_4_ * 3.0;
            auVar184._12_4_ = auVar110._12_4_ * 3.0;
            auVar110 = vsubps_avx(auVar297,auVar261);
            auVar214._0_4_ = auVar110._0_4_ * 3.0;
            auVar214._4_4_ = auVar110._4_4_ * 3.0;
            auVar214._8_4_ = auVar110._8_4_ * 3.0;
            auVar214._12_4_ = auVar110._12_4_ * 3.0;
            auVar110 = vsubps_avx(auVar337,auVar297);
            auVar312._0_4_ = auVar110._0_4_ * 3.0;
            auVar312._4_4_ = auVar110._4_4_ * 3.0;
            auVar312._8_4_ = auVar110._8_4_ * 3.0;
            auVar312._12_4_ = auVar110._12_4_ * 3.0;
            auVar33 = vminps_avx(auVar214,auVar312);
            auVar110 = vmaxps_avx(auVar214,auVar312);
            auVar33 = vminps_avx(auVar184,auVar33);
            auVar110 = vmaxps_avx(auVar184,auVar110);
            auVar154 = vshufpd_avx(auVar33,auVar33,3);
            auVar119 = vshufpd_avx(auVar110,auVar110,3);
            auVar33 = vminps_avx(auVar33,auVar154);
            auVar110 = vmaxps_avx(auVar110,auVar119);
            auVar154 = vshufps_avx(ZEXT416((uint)(1.0 / fVar230)),ZEXT416((uint)(1.0 / fVar230)),0);
            auVar313._0_4_ = auVar154._0_4_ * auVar33._0_4_;
            auVar313._4_4_ = auVar154._4_4_ * auVar33._4_4_;
            auVar313._8_4_ = auVar154._8_4_ * auVar33._8_4_;
            auVar313._12_4_ = auVar154._12_4_ * auVar33._12_4_;
            auVar323._0_4_ = auVar154._0_4_ * auVar110._0_4_;
            auVar323._4_4_ = auVar154._4_4_ * auVar110._4_4_;
            auVar323._8_4_ = auVar154._8_4_ * auVar110._8_4_;
            auVar323._12_4_ = auVar154._12_4_ * auVar110._12_4_;
            auVar143 = ZEXT416((uint)(1.0 / (local_448._0_4_ - auVar394._0_4_)));
            auVar110 = vshufpd_avx(auVar113,auVar113,3);
            auVar33 = vshufpd_avx(auVar261,auVar261,3);
            auVar154 = vshufpd_avx(auVar297,auVar297,3);
            auVar119 = vshufpd_avx(auVar337,auVar337,3);
            auVar110 = vsubps_avx(auVar110,auVar113);
            auVar142 = vsubps_avx(auVar33,auVar261);
            auVar181 = vsubps_avx(auVar154,auVar297);
            auVar119 = vsubps_avx(auVar119,auVar337);
            auVar33 = vminps_avx(auVar110,auVar142);
            auVar110 = vmaxps_avx(auVar110,auVar142);
            auVar154 = vminps_avx(auVar181,auVar119);
            auVar154 = vminps_avx(auVar33,auVar154);
            auVar33 = vmaxps_avx(auVar181,auVar119);
            auVar110 = vmaxps_avx(auVar110,auVar33);
            auVar33 = vshufps_avx(auVar143,auVar143,0);
            auVar377._0_4_ = auVar33._0_4_ * auVar154._0_4_;
            auVar377._4_4_ = auVar33._4_4_ * auVar154._4_4_;
            auVar377._8_4_ = auVar33._8_4_ * auVar154._8_4_;
            auVar377._12_4_ = auVar33._12_4_ * auVar154._12_4_;
            auVar386._0_4_ = auVar33._0_4_ * auVar110._0_4_;
            auVar386._4_4_ = auVar33._4_4_ * auVar110._4_4_;
            auVar386._8_4_ = auVar33._8_4_ * auVar110._8_4_;
            auVar386._12_4_ = auVar33._12_4_ * auVar110._12_4_;
            auVar110 = vmovsldup_avx(auVar394);
            auVar338._4_12_ = auVar110._4_12_;
            auVar338._0_4_ = fVar167;
            auVar348._4_12_ = auVar394._4_12_;
            auVar348._0_4_ = fVar202;
            auVar215._0_4_ = (fVar167 + fVar202) * 0.5;
            auVar215._4_4_ = (auVar110._4_4_ + auVar394._4_4_) * 0.5;
            auVar215._8_4_ = (auVar110._8_4_ + auVar394._8_4_) * 0.5;
            auVar215._12_4_ = (auVar110._12_4_ + auVar394._12_4_) * 0.5;
            auVar110 = vshufps_avx(auVar215,auVar215,0);
            fVar223 = auVar110._0_4_;
            fVar201 = auVar110._4_4_;
            fVar203 = auVar110._8_4_;
            fVar224 = auVar110._12_4_;
            auVar144._0_4_ = fVar223 * (float)local_1e8._0_4_ + (float)local_498._0_4_;
            auVar144._4_4_ = fVar201 * (float)local_1e8._4_4_ + (float)local_498._4_4_;
            auVar144._8_4_ = fVar203 * fStack_1e0 + fStack_490;
            auVar144._12_4_ = fVar224 * fStack_1dc + fStack_48c;
            local_4d8._0_4_ = auVar34._0_4_;
            local_4d8._4_4_ = auVar34._4_4_;
            fStack_4d0 = auVar34._8_4_;
            fStack_4cc = auVar34._12_4_;
            auVar185._0_4_ = fVar223 * (float)local_1f8._0_4_ + (float)local_4d8._0_4_;
            auVar185._4_4_ = fVar201 * (float)local_1f8._4_4_ + (float)local_4d8._4_4_;
            auVar185._8_4_ = fVar203 * fStack_1f0 + fStack_4d0;
            auVar185._12_4_ = fVar224 * fStack_1ec + fStack_4cc;
            auVar262._0_4_ = fVar223 * (float)local_208._0_4_ + (float)local_4a8._0_4_;
            auVar262._4_4_ = fVar201 * (float)local_208._4_4_ + (float)local_4a8._4_4_;
            auVar262._8_4_ = fVar203 * fStack_200 + fStack_4a0;
            auVar262._12_4_ = fVar224 * fStack_1fc + fStack_49c;
            auVar110 = vsubps_avx(auVar185,auVar144);
            auVar145._0_4_ = auVar144._0_4_ + fVar223 * auVar110._0_4_;
            auVar145._4_4_ = auVar144._4_4_ + fVar201 * auVar110._4_4_;
            auVar145._8_4_ = auVar144._8_4_ + fVar203 * auVar110._8_4_;
            auVar145._12_4_ = auVar144._12_4_ + fVar224 * auVar110._12_4_;
            auVar110 = vsubps_avx(auVar262,auVar185);
            auVar186._0_4_ = auVar185._0_4_ + fVar223 * auVar110._0_4_;
            auVar186._4_4_ = auVar185._4_4_ + fVar201 * auVar110._4_4_;
            auVar186._8_4_ = auVar185._8_4_ + fVar203 * auVar110._8_4_;
            auVar186._12_4_ = auVar185._12_4_ + fVar224 * auVar110._12_4_;
            auVar110 = vsubps_avx(auVar186,auVar145);
            fVar223 = auVar145._0_4_ + fVar223 * auVar110._0_4_;
            fVar201 = auVar145._4_4_ + fVar201 * auVar110._4_4_;
            auVar114._0_8_ = CONCAT44(fVar201,fVar223);
            auVar114._8_4_ = auVar145._8_4_ + fVar203 * auVar110._8_4_;
            auVar114._12_4_ = auVar145._12_4_ + fVar224 * auVar110._12_4_;
            fVar203 = auVar110._0_4_ * 3.0;
            fVar224 = auVar110._4_4_ * 3.0;
            auVar146._0_8_ = CONCAT44(fVar224,fVar203);
            auVar146._8_4_ = auVar110._8_4_ * 3.0;
            auVar146._12_4_ = auVar110._12_4_ * 3.0;
            auVar187._8_8_ = auVar114._0_8_;
            auVar187._0_8_ = auVar114._0_8_;
            auVar110 = vshufpd_avx(auVar114,auVar114,3);
            auVar33 = vshufps_avx(auVar215,auVar215,0x55);
            auVar181 = vsubps_avx(auVar110,auVar187);
            auVar364._0_4_ = auVar181._0_4_ * auVar33._0_4_ + fVar223;
            auVar364._4_4_ = auVar181._4_4_ * auVar33._4_4_ + fVar201;
            auVar364._8_4_ = auVar181._8_4_ * auVar33._8_4_ + fVar223;
            auVar364._12_4_ = auVar181._12_4_ * auVar33._12_4_ + fVar201;
            auVar188._8_8_ = auVar146._0_8_;
            auVar188._0_8_ = auVar146._0_8_;
            auVar110 = vshufpd_avx(auVar146,auVar146,1);
            auVar110 = vsubps_avx(auVar110,auVar188);
            auVar147._0_4_ = auVar110._0_4_ * auVar33._0_4_ + fVar203;
            auVar147._4_4_ = auVar110._4_4_ * auVar33._4_4_ + fVar224;
            auVar147._8_4_ = auVar110._8_4_ * auVar33._8_4_ + fVar203;
            auVar147._12_4_ = auVar110._12_4_ * auVar33._12_4_ + fVar224;
            auVar33 = vmovshdup_avx(auVar147);
            auVar263._0_8_ = auVar33._0_8_ ^ 0x8000000080000000;
            auVar263._8_4_ = auVar33._8_4_ ^ 0x80000000;
            auVar263._12_4_ = auVar33._12_4_ ^ 0x80000000;
            auVar154 = vmovshdup_avx(auVar181);
            auVar110 = vunpcklps_avx(auVar154,auVar263);
            auVar119 = vshufps_avx(auVar110,auVar263,4);
            auVar115._0_8_ = auVar181._0_8_ ^ 0x8000000080000000;
            auVar115._8_4_ = -auVar181._8_4_;
            auVar115._12_4_ = -auVar181._12_4_;
            auVar110 = vmovlhps_avx(auVar115,auVar147);
            auVar142 = vshufps_avx(auVar110,auVar147,8);
            auVar110 = ZEXT416((uint)(auVar147._0_4_ * auVar154._0_4_ -
                                     auVar181._0_4_ * auVar33._0_4_));
            auVar33 = vshufps_avx(auVar110,auVar110,0);
            auVar110 = vdivps_avx(auVar119,auVar33);
            auVar33 = vdivps_avx(auVar142,auVar33);
            auVar142 = vinsertps_avx(auVar313,auVar377,0x1c);
            auVar181 = vinsertps_avx(auVar323,auVar386,0x1c);
            auVar143 = vinsertps_avx(auVar377,auVar313,0x4c);
            auVar289 = vinsertps_avx(auVar386,auVar323,0x4c);
            auVar154 = vmovsldup_avx(auVar110);
            auVar189._0_4_ = auVar154._0_4_ * auVar142._0_4_;
            auVar189._4_4_ = auVar154._4_4_ * auVar142._4_4_;
            auVar189._8_4_ = auVar154._8_4_ * auVar142._8_4_;
            auVar189._12_4_ = auVar154._12_4_ * auVar142._12_4_;
            auVar148._0_4_ = auVar181._0_4_ * auVar154._0_4_;
            auVar148._4_4_ = auVar181._4_4_ * auVar154._4_4_;
            auVar148._8_4_ = auVar181._8_4_ * auVar154._8_4_;
            auVar148._12_4_ = auVar181._12_4_ * auVar154._12_4_;
            auVar119 = vminps_avx(auVar189,auVar148);
            auVar154 = vmaxps_avx(auVar148,auVar189);
            auVar6 = vmovsldup_avx(auVar33);
            auVar387._0_4_ = auVar143._0_4_ * auVar6._0_4_;
            auVar387._4_4_ = auVar143._4_4_ * auVar6._4_4_;
            auVar387._8_4_ = auVar143._8_4_ * auVar6._8_4_;
            auVar387._12_4_ = auVar143._12_4_ * auVar6._12_4_;
            auVar190._0_4_ = auVar289._0_4_ * auVar6._0_4_;
            auVar190._4_4_ = auVar289._4_4_ * auVar6._4_4_;
            auVar190._8_4_ = auVar289._8_4_ * auVar6._8_4_;
            auVar190._12_4_ = auVar289._12_4_ * auVar6._12_4_;
            auVar6 = vminps_avx(auVar387,auVar190);
            auVar241._0_4_ = auVar119._0_4_ + auVar6._0_4_;
            auVar241._4_4_ = auVar119._4_4_ + auVar6._4_4_;
            auVar241._8_4_ = auVar119._8_4_ + auVar6._8_4_;
            auVar241._12_4_ = auVar119._12_4_ + auVar6._12_4_;
            auVar119 = vmaxps_avx(auVar190,auVar387);
            auVar6 = vsubps_avx(auVar338,auVar215);
            auVar362 = vsubps_avx(auVar348,auVar215);
            auVar149._0_4_ = auVar154._0_4_ + auVar119._0_4_;
            auVar149._4_4_ = auVar154._4_4_ + auVar119._4_4_;
            auVar149._8_4_ = auVar154._8_4_ + auVar119._8_4_;
            auVar149._12_4_ = auVar154._12_4_ + auVar119._12_4_;
            auVar191._8_8_ = 0x3f800000;
            auVar191._0_8_ = 0x3f800000;
            auVar154 = vsubps_avx(auVar191,auVar149);
            auVar119 = vsubps_avx(auVar191,auVar241);
            fVar225 = auVar6._0_4_;
            auVar242._0_4_ = fVar225 * auVar154._0_4_;
            fVar252 = auVar6._4_4_;
            auVar242._4_4_ = fVar252 * auVar154._4_4_;
            fVar132 = auVar6._8_4_;
            auVar242._8_4_ = fVar132 * auVar154._8_4_;
            fVar228 = auVar6._12_4_;
            auVar242._12_4_ = fVar228 * auVar154._12_4_;
            fVar203 = auVar362._0_4_;
            auVar150._0_4_ = fVar203 * auVar154._0_4_;
            fVar224 = auVar362._4_4_;
            auVar150._4_4_ = fVar224 * auVar154._4_4_;
            fVar250 = auVar362._8_4_;
            auVar150._8_4_ = fVar250 * auVar154._8_4_;
            fVar226 = auVar362._12_4_;
            auVar150._12_4_ = fVar226 * auVar154._12_4_;
            auVar349._0_4_ = fVar225 * auVar119._0_4_;
            auVar349._4_4_ = fVar252 * auVar119._4_4_;
            auVar349._8_4_ = fVar132 * auVar119._8_4_;
            auVar349._12_4_ = fVar228 * auVar119._12_4_;
            auVar192._0_4_ = fVar203 * auVar119._0_4_;
            auVar192._4_4_ = fVar224 * auVar119._4_4_;
            auVar192._8_4_ = fVar250 * auVar119._8_4_;
            auVar192._12_4_ = fVar226 * auVar119._12_4_;
            auVar154 = vminps_avx(auVar242,auVar349);
            auVar119 = vminps_avx(auVar150,auVar192);
            auVar6 = vminps_avx(auVar154,auVar119);
            auVar154 = vmaxps_avx(auVar349,auVar242);
            auVar119 = vmaxps_avx(auVar192,auVar150);
            auVar362 = vshufps_avx(auVar215,auVar215,0x54);
            auVar119 = vmaxps_avx(auVar119,auVar154);
            auVar392 = vshufps_avx(auVar364,auVar364,0);
            auVar7 = vshufps_avx(auVar364,auVar364,0x55);
            auVar154 = vhaddps_avx(auVar6,auVar6);
            auVar119 = vhaddps_avx(auVar119,auVar119);
            auVar216._0_4_ = auVar392._0_4_ * auVar110._0_4_ + auVar7._0_4_ * auVar33._0_4_;
            auVar216._4_4_ = auVar392._4_4_ * auVar110._4_4_ + auVar7._4_4_ * auVar33._4_4_;
            auVar216._8_4_ = auVar392._8_4_ * auVar110._8_4_ + auVar7._8_4_ * auVar33._8_4_;
            auVar216._12_4_ = auVar392._12_4_ * auVar110._12_4_ + auVar7._12_4_ * auVar33._12_4_;
            auVar6 = vsubps_avx(auVar362,auVar216);
            fVar223 = auVar6._0_4_ + auVar154._0_4_;
            fVar201 = auVar6._0_4_ + auVar119._0_4_;
            auVar154 = vmaxss_avx(ZEXT416((uint)fVar167),ZEXT416((uint)fVar223));
            auVar119 = vminss_avx(ZEXT416((uint)fVar201),ZEXT416((uint)fVar202));
            if (auVar154._0_4_ <= auVar119._0_4_) {
              auVar154 = vmovshdup_avx(auVar110);
              auVar116._0_4_ = auVar154._0_4_ * auVar142._0_4_;
              auVar116._4_4_ = auVar154._4_4_ * auVar142._4_4_;
              auVar116._8_4_ = auVar154._8_4_ * auVar142._8_4_;
              auVar116._12_4_ = auVar154._12_4_ * auVar142._12_4_;
              auVar151._0_4_ = auVar181._0_4_ * auVar154._0_4_;
              auVar151._4_4_ = auVar181._4_4_ * auVar154._4_4_;
              auVar151._8_4_ = auVar181._8_4_ * auVar154._8_4_;
              auVar151._12_4_ = auVar181._12_4_ * auVar154._12_4_;
              auVar119 = vminps_avx(auVar116,auVar151);
              auVar154 = vmaxps_avx(auVar151,auVar116);
              auVar142 = vmovshdup_avx(auVar33);
              auVar243._0_4_ = auVar143._0_4_ * auVar142._0_4_;
              auVar243._4_4_ = auVar143._4_4_ * auVar142._4_4_;
              auVar243._8_4_ = auVar143._8_4_ * auVar142._8_4_;
              auVar243._12_4_ = auVar143._12_4_ * auVar142._12_4_;
              auVar152._0_4_ = auVar289._0_4_ * auVar142._0_4_;
              auVar152._4_4_ = auVar289._4_4_ * auVar142._4_4_;
              auVar152._8_4_ = auVar289._8_4_ * auVar142._8_4_;
              auVar152._12_4_ = auVar289._12_4_ * auVar142._12_4_;
              auVar142 = vminps_avx(auVar243,auVar152);
              auVar193._0_4_ = auVar119._0_4_ + auVar142._0_4_;
              auVar193._4_4_ = auVar119._4_4_ + auVar142._4_4_;
              auVar193._8_4_ = auVar119._8_4_ + auVar142._8_4_;
              auVar193._12_4_ = auVar119._12_4_ + auVar142._12_4_;
              auVar119 = vmaxps_avx(auVar152,auVar243);
              auVar117._0_4_ = auVar154._0_4_ + auVar119._0_4_;
              auVar117._4_4_ = auVar154._4_4_ + auVar119._4_4_;
              auVar117._8_4_ = auVar154._8_4_ + auVar119._8_4_;
              auVar117._12_4_ = auVar154._12_4_ + auVar119._12_4_;
              auVar154 = vsubps_avx(_local_3b8,auVar117);
              auVar119 = vsubps_avx(_local_3b8,auVar193);
              auVar194._0_4_ = fVar225 * auVar154._0_4_;
              auVar194._4_4_ = fVar252 * auVar154._4_4_;
              auVar194._8_4_ = fVar132 * auVar154._8_4_;
              auVar194._12_4_ = fVar228 * auVar154._12_4_;
              auVar244._0_4_ = fVar225 * auVar119._0_4_;
              auVar244._4_4_ = fVar252 * auVar119._4_4_;
              auVar244._8_4_ = fVar132 * auVar119._8_4_;
              auVar244._12_4_ = fVar228 * auVar119._12_4_;
              auVar118._0_4_ = fVar203 * auVar154._0_4_;
              auVar118._4_4_ = fVar224 * auVar154._4_4_;
              auVar118._8_4_ = fVar250 * auVar154._8_4_;
              auVar118._12_4_ = fVar226 * auVar154._12_4_;
              auVar153._0_4_ = fVar203 * auVar119._0_4_;
              auVar153._4_4_ = fVar224 * auVar119._4_4_;
              auVar153._8_4_ = fVar250 * auVar119._8_4_;
              auVar153._12_4_ = fVar226 * auVar119._12_4_;
              auVar154 = vminps_avx(auVar194,auVar244);
              auVar119 = vminps_avx(auVar118,auVar153);
              auVar154 = vminps_avx(auVar154,auVar119);
              auVar119 = vmaxps_avx(auVar244,auVar194);
              auVar142 = vmaxps_avx(auVar153,auVar118);
              auVar154 = vhaddps_avx(auVar154,auVar154);
              auVar119 = vmaxps_avx(auVar142,auVar119);
              auVar119 = vhaddps_avx(auVar119,auVar119);
              auVar142 = vmovshdup_avx(auVar6);
              auVar181 = ZEXT416((uint)(auVar142._0_4_ + auVar154._0_4_));
              auVar154 = vmaxss_avx(auVar394,auVar181);
              auVar142 = ZEXT416((uint)(auVar142._0_4_ + auVar119._0_4_));
              auVar119 = vminss_avx(auVar142,_local_448);
              if (auVar154._0_4_ <= auVar119._0_4_) {
                bVar88 = 0;
                if ((fVar167 < fVar223) && (fVar201 < fVar202)) {
                  auVar154 = vcmpps_avx(auVar142,_local_448,1);
                  auVar119 = vcmpps_avx(auVar394,auVar181,1);
                  auVar154 = vandps_avx(auVar119,auVar154);
                  bVar88 = auVar154[0];
                }
                auVar369 = ZEXT1664(auVar394);
                if ((uVar85 < 4 && 0.001 <= fVar230) && (bVar88 & 1) == 0) goto LAB_011c426b;
                lVar90 = 200;
                do {
                  fVar230 = auVar6._0_4_;
                  fVar202 = 1.0 - fVar230;
                  auVar174 = ZEXT416((uint)(fVar202 * fVar202 * fVar202));
                  auVar174 = vshufps_avx(auVar174,auVar174,0);
                  auVar154 = ZEXT416((uint)(fVar230 * 3.0 * fVar202 * fVar202));
                  auVar154 = vshufps_avx(auVar154,auVar154,0);
                  auVar119 = ZEXT416((uint)(fVar202 * fVar230 * fVar230 * 3.0));
                  auVar119 = vshufps_avx(auVar119,auVar119,0);
                  auVar142 = ZEXT416((uint)(fVar230 * fVar230 * fVar230));
                  auVar142 = vshufps_avx(auVar142,auVar142,0);
                  fVar202 = auVar174._0_4_ * (float)local_498._0_4_ +
                            auVar154._0_4_ * (float)local_4d8._0_4_ +
                            auVar142._0_4_ * (float)local_428._0_4_ +
                            auVar119._0_4_ * (float)local_4a8._0_4_;
                  fVar230 = auVar174._4_4_ * (float)local_498._4_4_ +
                            auVar154._4_4_ * (float)local_4d8._4_4_ +
                            auVar142._4_4_ * (float)local_428._4_4_ +
                            auVar119._4_4_ * (float)local_4a8._4_4_;
                  auVar120._0_8_ = CONCAT44(fVar230,fVar202);
                  auVar120._8_4_ =
                       auVar174._8_4_ * fStack_490 +
                       auVar154._8_4_ * fStack_4d0 +
                       auVar142._8_4_ * fStack_420 + auVar119._8_4_ * fStack_4a0;
                  auVar120._12_4_ =
                       auVar174._12_4_ * fStack_48c +
                       auVar154._12_4_ * fStack_4cc +
                       auVar142._12_4_ * fStack_41c + auVar119._12_4_ * fStack_49c;
                  auVar155._8_8_ = auVar120._0_8_;
                  auVar155._0_8_ = auVar120._0_8_;
                  auVar154 = vshufpd_avx(auVar120,auVar120,1);
                  auVar174 = vmovshdup_avx(auVar6);
                  auVar154 = vsubps_avx(auVar154,auVar155);
                  auVar121._0_4_ = auVar174._0_4_ * auVar154._0_4_ + fVar202;
                  auVar121._4_4_ = auVar174._4_4_ * auVar154._4_4_ + fVar230;
                  auVar121._8_4_ = auVar174._8_4_ * auVar154._8_4_ + fVar202;
                  auVar121._12_4_ = auVar174._12_4_ * auVar154._12_4_ + fVar230;
                  auVar174 = vshufps_avx(auVar121,auVar121,0);
                  auVar154 = vshufps_avx(auVar121,auVar121,0x55);
                  auVar156._0_4_ = auVar110._0_4_ * auVar174._0_4_ + auVar33._0_4_ * auVar154._0_4_;
                  auVar156._4_4_ = auVar110._4_4_ * auVar174._4_4_ + auVar33._4_4_ * auVar154._4_4_;
                  auVar156._8_4_ = auVar110._8_4_ * auVar174._8_4_ + auVar33._8_4_ * auVar154._8_4_;
                  auVar156._12_4_ =
                       auVar110._12_4_ * auVar174._12_4_ + auVar33._12_4_ * auVar154._12_4_;
                  auVar6 = vsubps_avx(auVar6,auVar156);
                  auVar157._8_4_ = 0x7fffffff;
                  auVar157._0_8_ = 0x7fffffff7fffffff;
                  auVar157._12_4_ = 0x7fffffff;
                  auVar174 = vandps_avx(auVar121,auVar157);
                  auVar154 = vshufps_avx(auVar174,auVar174,0xf5);
                  auVar174 = vmaxss_avx(auVar154,auVar174);
                  if (auVar174._0_4_ < (float)local_2e8._0_4_) {
                    fVar202 = auVar6._0_4_;
                    if ((fVar202 < 0.0) || (1.0 < fVar202)) break;
                    auVar174 = vmovshdup_avx(auVar6);
                    fVar230 = auVar174._0_4_;
                    if ((fVar230 < 0.0) || (1.0 < fVar230)) break;
                    auVar174 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                             ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c
                                            );
                    auVar143 = vinsertps_avx(auVar174,ZEXT416((uint)(pre->ray_space).vz.field_0.m128
                                                                    [2]),0x28);
                    aVar5 = (ray->super_RayK<1>).org.field_0;
                    auVar174 = vsubps_avx(_local_348,(undefined1  [16])aVar5);
                    auVar174 = vdpps_avx(auVar174,auVar143,0x7f);
                    auVar83._4_4_ = fStack_3c4;
                    auVar83._0_4_ = local_3c8;
                    auVar83._8_4_ = fStack_3c0;
                    auVar83._12_4_ = fStack_3bc;
                    auVar110 = vsubps_avx(auVar83,(undefined1  [16])aVar5);
                    auVar110 = vdpps_avx(auVar110,auVar143,0x7f);
                    auVar33 = vsubps_avx(_local_358,(undefined1  [16])aVar5);
                    auVar33 = vdpps_avx(auVar33,auVar143,0x7f);
                    auVar80._4_4_ = fStack_3d4;
                    auVar80._0_4_ = local_3d8;
                    auVar80._8_4_ = fStack_3d0;
                    auVar80._12_4_ = fStack_3cc;
                    auVar154 = vsubps_avx(auVar80,(undefined1  [16])aVar5);
                    auVar154 = vdpps_avx(auVar154,auVar143,0x7f);
                    auVar119 = vsubps_avx(_local_368,(undefined1  [16])aVar5);
                    auVar119 = vdpps_avx(auVar119,auVar143,0x7f);
                    auVar142 = vsubps_avx(_local_378,(undefined1  [16])aVar5);
                    auVar142 = vdpps_avx(auVar142,auVar143,0x7f);
                    auVar77._4_4_ = fStack_3e4;
                    auVar77._0_4_ = local_3e8;
                    auVar77._8_4_ = fStack_3e0;
                    auVar77._12_4_ = fStack_3dc;
                    auVar181 = vsubps_avx(auVar77,(undefined1  [16])aVar5);
                    auVar181 = vdpps_avx(auVar181,auVar143,0x7f);
                    auVar289 = vsubps_avx(_local_2a8,(undefined1  [16])aVar5);
                    auVar143 = vdpps_avx(auVar289,auVar143,0x7f);
                    fVar224 = 1.0 - fVar230;
                    fVar250 = 1.0 - fVar202;
                    fVar167 = auVar6._4_4_;
                    fVar223 = auVar6._8_4_;
                    fVar201 = auVar6._12_4_;
                    fVar203 = fVar250 * fVar202 * fVar202 * 3.0;
                    auVar264._0_4_ = fVar202 * fVar202 * fVar202;
                    auVar264._4_4_ = fVar167 * fVar167 * fVar167;
                    auVar264._8_4_ = fVar223 * fVar223 * fVar223;
                    auVar264._12_4_ = fVar201 * fVar201 * fVar201;
                    fVar167 = fVar202 * 3.0 * fVar250 * fVar250;
                    fVar223 = fVar250 * fVar250 * fVar250;
                    fVar202 = (fVar224 * auVar174._0_4_ + auVar119._0_4_ * fVar230) * fVar223 +
                              fVar167 * (auVar142._0_4_ * fVar230 + fVar224 * auVar110._0_4_) +
                              fVar203 * (auVar181._0_4_ * fVar230 + fVar224 * auVar33._0_4_) +
                              auVar264._0_4_ * (fVar224 * auVar154._0_4_ + fVar230 * auVar143._0_4_)
                    ;
                    if (((fVar202 < (ray->super_RayK<1>).org.field_0.m128[3]) ||
                        (fVar230 = (ray->super_RayK<1>).tfar, fVar230 < fVar202)) ||
                       (pGVar19 = (context->scene->geometries).items[local_418].ptr,
                       (pGVar19->mask & (ray->super_RayK<1>).mask) == 0)) break;
                    auVar174 = vshufps_avx(auVar6,auVar6,0x55);
                    auVar314._8_4_ = 0x3f800000;
                    auVar314._0_8_ = 0x3f8000003f800000;
                    auVar314._12_4_ = 0x3f800000;
                    auVar110 = vsubps_avx(auVar314,auVar174);
                    fVar201 = auVar174._0_4_;
                    fVar224 = auVar174._4_4_;
                    fVar226 = auVar174._8_4_;
                    fVar225 = auVar174._12_4_;
                    fVar252 = auVar110._0_4_;
                    fVar132 = auVar110._4_4_;
                    fVar228 = auVar110._8_4_;
                    fVar255 = auVar110._12_4_;
                    auVar324._0_4_ =
                         fVar201 * (float)local_368._0_4_ + fVar252 * (float)local_348._0_4_;
                    auVar324._4_4_ =
                         fVar224 * (float)local_368._4_4_ + fVar132 * (float)local_348._4_4_;
                    auVar324._8_4_ = fVar226 * fStack_360 + fVar228 * fStack_340;
                    auVar324._12_4_ = fVar225 * fStack_35c + fVar255 * fStack_33c;
                    auVar339._0_4_ = fVar201 * (float)local_378._0_4_ + fVar252 * local_3c8;
                    auVar339._4_4_ = fVar224 * (float)local_378._4_4_ + fVar132 * fStack_3c4;
                    auVar339._8_4_ = fVar226 * fStack_370 + fVar228 * fStack_3c0;
                    auVar339._12_4_ = fVar225 * fStack_36c + fVar255 * fStack_3bc;
                    auVar350._0_4_ = fVar201 * local_3e8 + fVar252 * (float)local_358._0_4_;
                    auVar350._4_4_ = fVar224 * fStack_3e4 + fVar132 * (float)local_358._4_4_;
                    auVar350._8_4_ = fVar226 * fStack_3e0 + fVar228 * fStack_350;
                    auVar350._12_4_ = fVar225 * fStack_3dc + fVar255 * fStack_34c;
                    auVar298._0_4_ = fVar252 * local_3d8 + fVar201 * (float)local_2a8._0_4_;
                    auVar298._4_4_ = fVar132 * fStack_3d4 + fVar224 * (float)local_2a8._4_4_;
                    auVar298._8_4_ = fVar228 * fStack_3d0 + fVar226 * fStack_2a0;
                    auVar298._12_4_ = fVar255 * fStack_3cc + fVar225 * fStack_29c;
                    auVar154 = vsubps_avx(auVar339,auVar324);
                    auVar119 = vsubps_avx(auVar350,auVar339);
                    auVar142 = vsubps_avx(auVar298,auVar350);
                    auVar174 = vshufps_avx(auVar6,auVar6,0);
                    fVar225 = auVar174._0_4_;
                    fVar252 = auVar174._4_4_;
                    fVar132 = auVar174._8_4_;
                    fVar228 = auVar174._12_4_;
                    auVar174 = vshufps_avx(ZEXT416((uint)fVar250),ZEXT416((uint)fVar250),0);
                    fVar201 = auVar174._0_4_;
                    fVar224 = auVar174._4_4_;
                    fVar250 = auVar174._8_4_;
                    fVar226 = auVar174._12_4_;
                    auVar174 = vshufps_avx(auVar264,auVar264,0);
                    auVar110 = vshufps_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),0);
                    auVar33 = vshufps_avx(ZEXT416((uint)fVar167),ZEXT416((uint)fVar167),0);
                    auVar245._0_4_ =
                         ((auVar154._0_4_ * fVar201 + fVar225 * auVar119._0_4_) * fVar201 +
                         fVar225 * (auVar119._0_4_ * fVar201 + fVar225 * auVar142._0_4_)) * 3.0;
                    auVar245._4_4_ =
                         ((auVar154._4_4_ * fVar224 + fVar252 * auVar119._4_4_) * fVar224 +
                         fVar252 * (auVar119._4_4_ * fVar224 + fVar252 * auVar142._4_4_)) * 3.0;
                    auVar245._8_4_ =
                         ((auVar154._8_4_ * fVar250 + fVar132 * auVar119._8_4_) * fVar250 +
                         fVar132 * (auVar119._8_4_ * fVar250 + fVar132 * auVar142._8_4_)) * 3.0;
                    auVar245._12_4_ =
                         ((auVar154._12_4_ * fVar226 + fVar228 * auVar119._12_4_) * fVar226 +
                         fVar228 * (auVar119._12_4_ * fVar226 + fVar228 * auVar142._12_4_)) * 3.0;
                    auVar154 = vshufps_avx(ZEXT416((uint)fVar223),ZEXT416((uint)fVar223),0);
                    auVar158._0_4_ =
                         auVar154._0_4_ * (float)local_228._0_4_ +
                         auVar33._0_4_ * (float)local_238._0_4_ +
                         auVar174._0_4_ * (float)local_258._0_4_ +
                         auVar110._0_4_ * (float)local_248._0_4_;
                    auVar158._4_4_ =
                         auVar154._4_4_ * (float)local_228._4_4_ +
                         auVar33._4_4_ * (float)local_238._4_4_ +
                         auVar174._4_4_ * (float)local_258._4_4_ +
                         auVar110._4_4_ * (float)local_248._4_4_;
                    auVar158._8_4_ =
                         auVar154._8_4_ * fStack_220 +
                         auVar33._8_4_ * fStack_230 +
                         auVar174._8_4_ * fStack_250 + auVar110._8_4_ * fStack_240;
                    auVar158._12_4_ =
                         auVar154._12_4_ * fStack_21c +
                         auVar33._12_4_ * fStack_22c +
                         auVar174._12_4_ * fStack_24c + auVar110._12_4_ * fStack_23c;
                    auVar174 = vshufps_avx(auVar245,auVar245,0xc9);
                    auVar195._0_4_ = auVar158._0_4_ * auVar174._0_4_;
                    auVar195._4_4_ = auVar158._4_4_ * auVar174._4_4_;
                    auVar195._8_4_ = auVar158._8_4_ * auVar174._8_4_;
                    auVar195._12_4_ = auVar158._12_4_ * auVar174._12_4_;
                    auVar174 = vshufps_avx(auVar158,auVar158,0xc9);
                    auVar159._0_4_ = auVar245._0_4_ * auVar174._0_4_;
                    auVar159._4_4_ = auVar245._4_4_ * auVar174._4_4_;
                    auVar159._8_4_ = auVar245._8_4_ * auVar174._8_4_;
                    auVar159._12_4_ = auVar245._12_4_ * auVar174._12_4_;
                    auVar174 = vsubps_avx(auVar159,auVar195);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      (ray->super_RayK<1>).tfar = fVar202;
                      auVar110 = vshufps_avx(auVar174,auVar174,0xe9);
                      uVar4 = vmovlps_avx(auVar110);
                      *(undefined8 *)&(ray->Ng).field_0 = uVar4;
                      (ray->Ng).field_0.field_0.z = auVar174._0_4_;
                      uVar4 = vmovlps_avx(auVar6);
                      ray->u = (float)(int)uVar4;
                      ray->v = (float)(int)((ulong)uVar4 >> 0x20);
                      ray->primID = (uint)local_410;
                      ray->geomID = (uint)local_418;
                      ray->instID[0] = context->user->instID[0];
                      ray->instPrimID[0] = context->user->instPrimID[0];
                      break;
                    }
                    auVar110 = vshufps_avx(auVar174,auVar174,0xe9);
                    local_288 = vmovlps_avx(auVar110);
                    local_280 = auVar174._0_4_;
                    local_27c = vmovlps_avx(auVar6);
                    local_274 = (uint)local_410;
                    local_270 = (uint)local_418;
                    local_26c = context->user->instID[0];
                    local_268 = context->user->instPrimID[0];
                    (ray->super_RayK<1>).tfar = fVar202;
                    local_4ac = -1;
                    local_2d8.valid = &local_4ac;
                    local_2d8.geometryUserPtr = pGVar19->userPtr;
                    local_2d8.context = context->user;
                    local_2d8.ray = (RTCRayN *)ray;
                    local_2d8.hit = (RTCHitN *)&local_288;
                    local_2d8.N = 1;
                    if (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_011c4130:
                      p_Var24 = context->args->filter;
                      if (((p_Var24 == (RTCFilterFunctionN)0x0) ||
                          (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                            RTC_RAY_QUERY_FLAG_INCOHERENT &&
                           (((pGVar19->field_8).field_0x2 & 0x40) == 0)))) ||
                         ((*p_Var24)(&local_2d8), *local_2d8.valid != 0)) {
                        (((Vec3f *)((long)local_2d8.ray + 0x30))->field_0).components[0] =
                             *(float *)local_2d8.hit;
                        (((Vec3f *)((long)local_2d8.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_2d8.hit + 4);
                        (((Vec3f *)((long)local_2d8.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_2d8.hit + 8);
                        *(float *)((long)local_2d8.ray + 0x3c) = *(float *)(local_2d8.hit + 0xc);
                        *(float *)((long)local_2d8.ray + 0x40) = *(float *)(local_2d8.hit + 0x10);
                        *(float *)((long)local_2d8.ray + 0x44) = *(float *)(local_2d8.hit + 0x14);
                        *(float *)((long)local_2d8.ray + 0x48) = *(float *)(local_2d8.hit + 0x18);
                        *(float *)((long)local_2d8.ray + 0x4c) = *(float *)(local_2d8.hit + 0x1c);
                        *(float *)((long)local_2d8.ray + 0x50) = *(float *)(local_2d8.hit + 0x20);
                        break;
                      }
                    }
                    else {
                      _local_408 = ZEXT832((ulong)auVar93);
                      (*pGVar19->intersectionFilterN)(&local_2d8);
                      auVar93 = local_408;
                      if (*local_2d8.valid != 0) goto LAB_011c4130;
                    }
                    (ray->super_RayK<1>).tfar = fVar230;
                    break;
                  }
                  lVar90 = lVar90 + -1;
                } while (lVar90 != 0);
              }
            }
          }
        }
        if (uVar85 == 0) break;
      } while( true );
    }
    fVar202 = (ray->super_RayK<1>).tfar;
    auVar131._4_4_ = fVar202;
    auVar131._0_4_ = fVar202;
    auVar131._8_4_ = fVar202;
    auVar131._12_4_ = fVar202;
    auVar131._16_4_ = fVar202;
    auVar131._20_4_ = fVar202;
    auVar131._24_4_ = fVar202;
    auVar131._28_4_ = fVar202;
    auVar122 = vcmpps_avx(local_178,auVar131,2);
    uVar85 = vmovmskps_avx(auVar122);
    uVar84 = uVar84 & SUB84(auVar93,0) & uVar85;
    auVar174 = ZEXT816(0) << 0x40;
    if (uVar84 == 0) {
      return;
    }
  } while( true );
LAB_011c426b:
  auVar174 = vinsertps_avx(ZEXT416((uint)fVar167),auVar174,0x10);
  auVar395 = ZEXT1664(auVar174);
  auVar285 = ZEXT1664(local_318);
  auVar380 = ZEXT1664(local_458);
  auVar331 = ZEXT1664(local_468);
  auVar268 = ZEXT1664(_local_328);
  auVar222 = ZEXT1664(_local_338);
  auVar345 = ZEXT1664(local_478);
  auVar357 = ZEXT1664(local_488);
  goto LAB_011c2bd9;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }